

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  Primitive PVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  bool bVar80;
  undefined1 auVar81 [12];
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  uint uVar97;
  ulong uVar98;
  ulong uVar99;
  long lVar100;
  long lVar101;
  uint uVar102;
  ulong uVar103;
  bool bVar104;
  float fVar105;
  float fVar131;
  float fVar133;
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar122 [32];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar140;
  float fVar174;
  float fVar176;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar178;
  undefined1 auVar145 [16];
  float fVar141;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar180;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 bi_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar212;
  float fVar213;
  vint4 ai_1;
  undefined1 auVar200 [16];
  float fVar214;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [28];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  float fVar216;
  float fVar234;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar217 [16];
  float fVar238;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar228 [32];
  float fVar235;
  float fVar237;
  float fVar239;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [64];
  float fVar243;
  float fVar260;
  float fVar261;
  undefined1 auVar244 [16];
  float fVar262;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar264;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar263;
  undefined1 auVar259 [64];
  float fVar265;
  float fVar277;
  float fVar280;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar289;
  float fVar290;
  float fVar293;
  float fVar294;
  float fVar297;
  float fVar298;
  float fVar300;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  float fVar283;
  float fVar287;
  float fVar291;
  float fVar295;
  float fVar299;
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  float fVar288;
  float fVar292;
  float fVar296;
  undefined1 auVar276 [64];
  float fVar301;
  float fVar309;
  float fVar310;
  vint4 ai;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar311;
  undefined1 auVar307 [32];
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar308 [64];
  float fVar315;
  float fVar326;
  float fVar328;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  float fVar316;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar346;
  float fVar347;
  undefined1 auVar343 [32];
  float fVar345;
  undefined1 auVar344 [64];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar354;
  float fVar361;
  float fVar362;
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  float fVar368;
  float fVar369;
  float fVar375;
  float fVar377;
  undefined1 auVar370 [16];
  float fVar378;
  float fVar382;
  undefined1 auVar371 [32];
  float fVar376;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar374 [64];
  float fVar383;
  float fVar387;
  float fVar389;
  undefined1 auVar385 [16];
  float fVar384;
  float fVar388;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  undefined1 auVar386 [32];
  undefined1 auVar399 [16];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [16];
  undefined1 auVar404 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_acc;
  ulong local_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  ulong local_a68;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined8 local_8f0;
  float local_8e8;
  float local_8e4;
  undefined4 local_8e0;
  uint local_8dc;
  uint local_8d8;
  uint local_8d4;
  uint local_8d0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined8 local_790;
  undefined8 uStack_788;
  undefined1 local_780 [16];
  Primitive *local_770;
  ulong local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0 [4];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar353 [64];
  undefined1 auVar360 [64];
  
  PVar13 = prim[1];
  uVar103 = (ulong)(byte)PVar13;
  lVar101 = uVar103 * 0x25;
  fVar141 = *(float *)(prim + lVar101 + 0x12);
  auVar149 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar101 + 6));
  auVar142._0_4_ = fVar141 * auVar149._0_4_;
  auVar142._4_4_ = fVar141 * auVar149._4_4_;
  auVar142._8_4_ = fVar141 * auVar149._8_4_;
  auVar142._12_4_ = fVar141 * auVar149._12_4_;
  auVar302._0_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar302._4_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar302._8_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar302._12_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 5 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar146 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 6)));
  auVar146 = vcvtdq2ps_avx(auVar146);
  auVar111 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 6)));
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar103 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar154 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 6)));
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vshufps_avx(auVar302,auVar302,0);
  auVar31 = vshufps_avx(auVar302,auVar302,0x55);
  auVar32 = vshufps_avx(auVar302,auVar302,0xaa);
  fVar141 = auVar32._0_4_;
  fVar175 = auVar32._4_4_;
  fVar177 = auVar32._8_4_;
  fVar180 = auVar32._12_4_;
  fVar215 = auVar31._0_4_;
  fVar234 = auVar31._4_4_;
  fVar236 = auVar31._8_4_;
  fVar238 = auVar31._12_4_;
  fVar199 = auVar30._0_4_;
  fVar212 = auVar30._4_4_;
  fVar213 = auVar30._8_4_;
  fVar214 = auVar30._12_4_;
  auVar370._0_4_ = fVar199 * auVar149._0_4_ + fVar215 * auVar112._0_4_ + fVar141 * auVar146._0_4_;
  auVar370._4_4_ = fVar212 * auVar149._4_4_ + fVar234 * auVar112._4_4_ + fVar175 * auVar146._4_4_;
  auVar370._8_4_ = fVar213 * auVar149._8_4_ + fVar236 * auVar112._8_4_ + fVar177 * auVar146._8_4_;
  auVar370._12_4_ =
       fVar214 * auVar149._12_4_ + fVar238 * auVar112._12_4_ + fVar180 * auVar146._12_4_;
  auVar385._0_4_ = fVar199 * auVar111._0_4_ + fVar215 * auVar117._0_4_ + auVar27._0_4_ * fVar141;
  auVar385._4_4_ = fVar212 * auVar111._4_4_ + fVar234 * auVar117._4_4_ + auVar27._4_4_ * fVar175;
  auVar385._8_4_ = fVar213 * auVar111._8_4_ + fVar236 * auVar117._8_4_ + auVar27._8_4_ * fVar177;
  auVar385._12_4_ = fVar214 * auVar111._12_4_ + fVar238 * auVar117._12_4_ + auVar27._12_4_ * fVar180
  ;
  auVar303._0_4_ = fVar199 * auVar154._0_4_ + fVar215 * auVar28._0_4_ + auVar29._0_4_ * fVar141;
  auVar303._4_4_ = fVar212 * auVar154._4_4_ + fVar234 * auVar28._4_4_ + auVar29._4_4_ * fVar175;
  auVar303._8_4_ = fVar213 * auVar154._8_4_ + fVar236 * auVar28._8_4_ + auVar29._8_4_ * fVar177;
  auVar303._12_4_ = fVar214 * auVar154._12_4_ + fVar238 * auVar28._12_4_ + auVar29._12_4_ * fVar180;
  auVar30 = vshufps_avx(auVar142,auVar142,0);
  auVar31 = vshufps_avx(auVar142,auVar142,0x55);
  auVar32 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar141 = auVar32._0_4_;
  fVar175 = auVar32._4_4_;
  fVar177 = auVar32._8_4_;
  fVar180 = auVar32._12_4_;
  fVar215 = auVar31._0_4_;
  fVar234 = auVar31._4_4_;
  fVar236 = auVar31._8_4_;
  fVar238 = auVar31._12_4_;
  fVar199 = auVar30._0_4_;
  fVar212 = auVar30._4_4_;
  fVar213 = auVar30._8_4_;
  fVar214 = auVar30._12_4_;
  auVar143._0_4_ = fVar199 * auVar149._0_4_ + fVar215 * auVar112._0_4_ + fVar141 * auVar146._0_4_;
  auVar143._4_4_ = fVar212 * auVar149._4_4_ + fVar234 * auVar112._4_4_ + fVar175 * auVar146._4_4_;
  auVar143._8_4_ = fVar213 * auVar149._8_4_ + fVar236 * auVar112._8_4_ + fVar177 * auVar146._8_4_;
  auVar143._12_4_ =
       fVar214 * auVar149._12_4_ + fVar238 * auVar112._12_4_ + fVar180 * auVar146._12_4_;
  auVar106._0_4_ = fVar199 * auVar111._0_4_ + auVar27._0_4_ * fVar141 + fVar215 * auVar117._0_4_;
  auVar106._4_4_ = fVar212 * auVar111._4_4_ + auVar27._4_4_ * fVar175 + fVar234 * auVar117._4_4_;
  auVar106._8_4_ = fVar213 * auVar111._8_4_ + auVar27._8_4_ * fVar177 + fVar236 * auVar117._8_4_;
  auVar106._12_4_ = fVar214 * auVar111._12_4_ + auVar27._12_4_ * fVar180 + fVar238 * auVar117._12_4_
  ;
  auVar317._8_4_ = 0x7fffffff;
  auVar317._0_8_ = 0x7fffffff7fffffff;
  auVar317._12_4_ = 0x7fffffff;
  auVar149 = vandps_avx(auVar370,auVar317);
  auVar217._8_4_ = 0x219392ef;
  auVar217._0_8_ = 0x219392ef219392ef;
  auVar217._12_4_ = 0x219392ef;
  auVar149 = vcmpps_avx(auVar149,auVar217,1);
  auVar112 = vblendvps_avx(auVar370,auVar217,auVar149);
  auVar149 = vandps_avx(auVar385,auVar317);
  auVar149 = vcmpps_avx(auVar149,auVar217,1);
  auVar146 = vblendvps_avx(auVar385,auVar217,auVar149);
  auVar149 = vandps_avx(auVar317,auVar303);
  auVar149 = vcmpps_avx(auVar149,auVar217,1);
  auVar149 = vblendvps_avx(auVar303,auVar217,auVar149);
  auVar181._0_4_ = fVar199 * auVar154._0_4_ + fVar215 * auVar28._0_4_ + auVar29._0_4_ * fVar141;
  auVar181._4_4_ = fVar212 * auVar154._4_4_ + fVar234 * auVar28._4_4_ + auVar29._4_4_ * fVar175;
  auVar181._8_4_ = fVar213 * auVar154._8_4_ + fVar236 * auVar28._8_4_ + auVar29._8_4_ * fVar177;
  auVar181._12_4_ = fVar214 * auVar154._12_4_ + fVar238 * auVar28._12_4_ + auVar29._12_4_ * fVar180;
  auVar111 = vrcpps_avx(auVar112);
  fVar199 = auVar111._0_4_;
  auVar200._0_4_ = fVar199 * auVar112._0_4_;
  fVar212 = auVar111._4_4_;
  auVar200._4_4_ = fVar212 * auVar112._4_4_;
  fVar213 = auVar111._8_4_;
  auVar200._8_4_ = fVar213 * auVar112._8_4_;
  fVar214 = auVar111._12_4_;
  auVar200._12_4_ = fVar214 * auVar112._12_4_;
  auVar266._8_4_ = 0x3f800000;
  auVar266._0_8_ = &DAT_3f8000003f800000;
  auVar266._12_4_ = 0x3f800000;
  auVar112 = vsubps_avx(auVar266,auVar200);
  fVar199 = fVar199 + fVar199 * auVar112._0_4_;
  fVar212 = fVar212 + fVar212 * auVar112._4_4_;
  fVar213 = fVar213 + fVar213 * auVar112._8_4_;
  fVar214 = fVar214 + fVar214 * auVar112._12_4_;
  auVar112 = vrcpps_avx(auVar146);
  fVar215 = auVar112._0_4_;
  auVar244._0_4_ = fVar215 * auVar146._0_4_;
  fVar234 = auVar112._4_4_;
  auVar244._4_4_ = fVar234 * auVar146._4_4_;
  fVar236 = auVar112._8_4_;
  auVar244._8_4_ = fVar236 * auVar146._8_4_;
  fVar238 = auVar112._12_4_;
  auVar244._12_4_ = fVar238 * auVar146._12_4_;
  auVar112 = vsubps_avx(auVar266,auVar244);
  fVar215 = fVar215 + fVar215 * auVar112._0_4_;
  fVar234 = fVar234 + fVar234 * auVar112._4_4_;
  fVar236 = fVar236 + fVar236 * auVar112._8_4_;
  fVar238 = fVar238 + fVar238 * auVar112._12_4_;
  auVar112 = vrcpps_avx(auVar149);
  fVar243 = auVar112._0_4_;
  auVar304._0_4_ = fVar243 * auVar149._0_4_;
  fVar260 = auVar112._4_4_;
  auVar304._4_4_ = fVar260 * auVar149._4_4_;
  fVar261 = auVar112._8_4_;
  auVar304._8_4_ = fVar261 * auVar149._8_4_;
  fVar262 = auVar112._12_4_;
  auVar304._12_4_ = fVar262 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar266,auVar304);
  fVar243 = fVar243 + fVar243 * auVar149._0_4_;
  fVar260 = fVar260 + fVar260 * auVar149._4_4_;
  fVar261 = fVar261 + fVar261 * auVar149._8_4_;
  fVar262 = fVar262 + fVar262 * auVar149._12_4_;
  auVar149 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar101 + 0x16)) * *(float *)(prim + lVar101 + 0x1a)))
  ;
  auVar146 = vshufps_avx(auVar149,auVar149,0);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar103 * 7 + 6);
  auVar149 = vpmovsxwd_avx(auVar149);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar112 = vpmovsxwd_avx(auVar112);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vsubps_avx(auVar112,auVar149);
  fVar141 = auVar146._0_4_;
  fVar175 = auVar146._4_4_;
  fVar177 = auVar146._8_4_;
  fVar180 = auVar146._12_4_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *(ulong *)(prim + uVar103 * 9 + 6);
  auVar112 = vpmovsxwd_avx(auVar146);
  auVar305._0_4_ = auVar111._0_4_ * fVar141 + auVar149._0_4_;
  auVar305._4_4_ = auVar111._4_4_ * fVar175 + auVar149._4_4_;
  auVar305._8_4_ = auVar111._8_4_ * fVar177 + auVar149._8_4_;
  auVar305._12_4_ = auVar111._12_4_ * fVar180 + auVar149._12_4_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar146 = vpmovsxwd_avx(auVar111);
  auVar149 = vcvtdq2ps_avx(auVar112);
  auVar112 = vcvtdq2ps_avx(auVar146);
  auVar112 = vsubps_avx(auVar112,auVar149);
  auVar318._0_4_ = auVar112._0_4_ * fVar141 + auVar149._0_4_;
  auVar318._4_4_ = auVar112._4_4_ * fVar175 + auVar149._4_4_;
  auVar318._8_4_ = auVar112._8_4_ * fVar177 + auVar149._8_4_;
  auVar318._12_4_ = auVar112._12_4_ * fVar180 + auVar149._12_4_;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar149 = vpmovsxwd_avx(auVar117);
  uVar98 = (ulong)(uint)((int)(uVar103 * 5) << 2);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar103 * 2 + uVar98 + 6);
  auVar112 = vpmovsxwd_avx(auVar27);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar149);
  auVar340._0_4_ = auVar112._0_4_ * fVar141 + auVar149._0_4_;
  auVar340._4_4_ = auVar112._4_4_ * fVar175 + auVar149._4_4_;
  auVar340._8_4_ = auVar112._8_4_ * fVar177 + auVar149._8_4_;
  auVar340._12_4_ = auVar112._12_4_ * fVar180 + auVar149._12_4_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar98 + 6);
  auVar149 = vpmovsxwd_avx(auVar154);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 6);
  auVar112 = vpmovsxwd_avx(auVar28);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar146 = vsubps_avx(auVar112,auVar149);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 6);
  auVar112 = vpmovsxwd_avx(auVar29);
  auVar348._0_4_ = auVar146._0_4_ * fVar141 + auVar149._0_4_;
  auVar348._4_4_ = auVar146._4_4_ * fVar175 + auVar149._4_4_;
  auVar348._8_4_ = auVar146._8_4_ * fVar177 + auVar149._8_4_;
  auVar348._12_4_ = auVar146._12_4_ * fVar180 + auVar149._12_4_;
  auVar353 = ZEXT1664(auVar348);
  auVar149 = vcvtdq2ps_avx(auVar112);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar103 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar112 = vpmovsxwd_avx(auVar30);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar149);
  auVar355._0_4_ = auVar112._0_4_ * fVar141 + auVar149._0_4_;
  auVar355._4_4_ = auVar112._4_4_ * fVar175 + auVar149._4_4_;
  auVar355._8_4_ = auVar112._8_4_ * fVar177 + auVar149._8_4_;
  auVar355._12_4_ = auVar112._12_4_ * fVar180 + auVar149._12_4_;
  auVar360 = ZEXT1664(auVar355);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar103) + 6);
  auVar149 = vpmovsxwd_avx(auVar31);
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar374 = ZEXT1664(auVar149);
  local_770 = prim;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 6);
  auVar112 = vpmovsxwd_avx(auVar32);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar112 = vsubps_avx(auVar112,auVar149);
  auVar267._0_4_ = auVar149._0_4_ + auVar112._0_4_ * fVar141;
  auVar267._4_4_ = auVar149._4_4_ + auVar112._4_4_ * fVar175;
  auVar267._8_4_ = auVar149._8_4_ + auVar112._8_4_ * fVar177;
  auVar267._12_4_ = auVar149._12_4_ + auVar112._12_4_ * fVar180;
  auVar149 = vsubps_avx(auVar305,auVar143);
  auVar306._0_4_ = fVar199 * auVar149._0_4_;
  auVar306._4_4_ = fVar212 * auVar149._4_4_;
  auVar306._8_4_ = fVar213 * auVar149._8_4_;
  auVar306._12_4_ = fVar214 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar318,auVar143);
  auVar144._0_4_ = fVar199 * auVar149._0_4_;
  auVar144._4_4_ = fVar212 * auVar149._4_4_;
  auVar144._8_4_ = fVar213 * auVar149._8_4_;
  auVar144._12_4_ = fVar214 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar340,auVar106);
  auVar201._0_4_ = fVar215 * auVar149._0_4_;
  auVar201._4_4_ = fVar234 * auVar149._4_4_;
  auVar201._8_4_ = fVar236 * auVar149._8_4_;
  auVar201._12_4_ = fVar238 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar348,auVar106);
  auVar107._0_4_ = fVar215 * auVar149._0_4_;
  auVar107._4_4_ = fVar234 * auVar149._4_4_;
  auVar107._8_4_ = fVar236 * auVar149._8_4_;
  auVar107._12_4_ = fVar238 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar355,auVar181);
  auVar218._0_4_ = fVar243 * auVar149._0_4_;
  auVar218._4_4_ = fVar260 * auVar149._4_4_;
  auVar218._8_4_ = fVar261 * auVar149._8_4_;
  auVar218._12_4_ = fVar262 * auVar149._12_4_;
  auVar149 = vsubps_avx(auVar267,auVar181);
  auVar182._0_4_ = fVar243 * auVar149._0_4_;
  auVar182._4_4_ = fVar260 * auVar149._4_4_;
  auVar182._8_4_ = fVar261 * auVar149._8_4_;
  auVar182._12_4_ = fVar262 * auVar149._12_4_;
  auVar149 = vpminsd_avx(auVar306,auVar144);
  auVar112 = vpminsd_avx(auVar201,auVar107);
  auVar149 = vmaxps_avx(auVar149,auVar112);
  auVar112 = vpminsd_avx(auVar218,auVar182);
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar319._4_4_ = uVar8;
  auVar319._0_4_ = uVar8;
  auVar319._8_4_ = uVar8;
  auVar319._12_4_ = uVar8;
  auVar112 = vmaxps_avx(auVar112,auVar319);
  auVar149 = vmaxps_avx(auVar149,auVar112);
  local_490._0_4_ = auVar149._0_4_ * 0.99999964;
  local_490._4_4_ = auVar149._4_4_ * 0.99999964;
  local_490._8_4_ = auVar149._8_4_ * 0.99999964;
  local_490._12_4_ = auVar149._12_4_ * 0.99999964;
  auVar149 = vpmaxsd_avx(auVar306,auVar144);
  auVar112 = vpmaxsd_avx(auVar201,auVar107);
  auVar149 = vminps_avx(auVar149,auVar112);
  auVar112 = vpmaxsd_avx(auVar218,auVar182);
  fVar141 = (ray->super_RayK<1>).tfar;
  auVar183._4_4_ = fVar141;
  auVar183._0_4_ = fVar141;
  auVar183._8_4_ = fVar141;
  auVar183._12_4_ = fVar141;
  auVar112 = vminps_avx(auVar112,auVar183);
  auVar149 = vminps_avx(auVar149,auVar112);
  auVar108._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar108._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar108._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar149 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar112 = vpcmpgtd_avx(auVar149,_DAT_01ff0cf0);
  auVar149 = vcmpps_avx(local_490,auVar108,2);
  auVar149 = vandps_avx(auVar149,auVar112);
  uVar97 = vmovmskps_avx(auVar149);
  if (uVar97 == 0) {
    return;
  }
  uVar97 = uVar97 & 0xff;
  auVar124._16_16_ = mm_lookupmask_ps._240_16_;
  auVar124._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar124,ZEXT832(0) << 0x20,0x80);
  auVar308 = ZEXT464(0) << 0x20;
LAB_01006026:
  local_768 = (ulong)uVar97;
  lVar101 = 0;
  if ((ulong)uVar97 != 0) {
    for (; (uVar97 >> lVar101 & 1) == 0; lVar101 = lVar101 + 1) {
    }
  }
  local_ac8 = (ulong)*(uint *)(local_770 + 2);
  pGVar14 = (context->scene->geometries).items[*(uint *)(local_770 + 2)].ptr;
  local_a68 = (ulong)*(uint *)(local_770 + lVar101 * 4 + 6);
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                            (ulong)*(uint *)(local_770 + lVar101 * 4 + 6) *
                            pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar141 = (pGVar14->time_range).lower;
  fVar141 = pGVar14->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar141) /
            ((pGVar14->time_range).upper - fVar141));
  auVar149 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
  auVar149 = vminss_avx(auVar149,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
  auVar149 = vmaxss_avx(auVar308._0_16_,auVar149);
  fVar141 = fVar141 - auVar149._0_4_;
  _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar100 = (long)(int)auVar149._0_4_ * 0x38;
  lVar101 = *(long *)(_Var15 + 0x10 + lVar100);
  lVar16 = *(long *)(_Var15 + 0x38 + lVar100);
  lVar17 = *(long *)(_Var15 + 0x48 + lVar100);
  auVar149 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
  pfVar1 = (float *)(lVar16 + uVar103 * lVar17);
  fVar199 = auVar149._0_4_;
  fVar212 = auVar149._4_4_;
  fVar213 = auVar149._8_4_;
  fVar214 = auVar149._12_4_;
  pfVar2 = (float *)(lVar16 + (uVar103 + 1) * lVar17);
  pfVar3 = (float *)(lVar16 + (uVar103 + 2) * lVar17);
  pfVar4 = (float *)(lVar16 + lVar17 * (uVar103 + 3));
  lVar16 = *(long *)(_Var15 + lVar100);
  auVar149 = vshufps_avx(ZEXT416((uint)(1.0 - fVar141)),ZEXT416((uint)(1.0 - fVar141)),0);
  pfVar5 = (float *)(lVar16 + lVar101 * uVar103);
  fVar141 = auVar149._0_4_;
  fVar175 = auVar149._4_4_;
  fVar177 = auVar149._8_4_;
  fVar180 = auVar149._12_4_;
  pfVar6 = (float *)(lVar16 + lVar101 * (uVar103 + 1));
  pfVar7 = (float *)(lVar16 + lVar101 * (uVar103 + 2));
  auVar184._0_4_ = fVar199 * *pfVar1 + fVar141 * *pfVar5;
  auVar184._4_4_ = fVar212 * pfVar1[1] + fVar175 * pfVar5[1];
  auVar184._8_4_ = fVar213 * pfVar1[2] + fVar177 * pfVar5[2];
  auVar184._12_4_ = fVar214 * pfVar1[3] + fVar180 * pfVar5[3];
  auVar202._0_4_ = fVar141 * *pfVar6 + fVar199 * *pfVar2;
  auVar202._4_4_ = fVar175 * pfVar6[1] + fVar212 * pfVar2[1];
  auVar202._8_4_ = fVar177 * pfVar6[2] + fVar213 * pfVar2[2];
  auVar202._12_4_ = fVar180 * pfVar6[3] + fVar214 * pfVar2[3];
  auVar219._0_4_ = fVar141 * *pfVar7 + fVar199 * *pfVar3;
  auVar219._4_4_ = fVar175 * pfVar7[1] + fVar212 * pfVar3[1];
  auVar219._8_4_ = fVar177 * pfVar7[2] + fVar213 * pfVar3[2];
  auVar219._12_4_ = fVar180 * pfVar7[3] + fVar214 * pfVar3[3];
  pfVar1 = (float *)(lVar16 + lVar101 * (uVar103 + 3));
  auVar245._0_4_ = fVar141 * *pfVar1 + fVar199 * *pfVar4;
  auVar245._4_4_ = fVar175 * pfVar1[1] + fVar212 * pfVar4[1];
  auVar245._8_4_ = fVar177 * pfVar1[2] + fVar213 * pfVar4[2];
  auVar245._12_4_ = fVar180 * pfVar1[3] + fVar214 * pfVar4[3];
  auVar109._0_4_ = (auVar184._0_4_ + auVar202._0_4_ + auVar219._0_4_ + auVar245._0_4_) * 0.25;
  auVar109._4_4_ = (auVar184._4_4_ + auVar202._4_4_ + auVar219._4_4_ + auVar245._4_4_) * 0.25;
  auVar109._8_4_ = (auVar184._8_4_ + auVar202._8_4_ + auVar219._8_4_ + auVar245._8_4_) * 0.25;
  auVar109._12_4_ = (auVar184._12_4_ + auVar202._12_4_ + auVar219._12_4_ + auVar245._12_4_) * 0.25;
  aVar10 = (ray->super_RayK<1>).org.field_0.field_1;
  aVar11 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar149 = vsubps_avx(auVar109,(undefined1  [16])aVar10);
  auVar149 = vdpps_avx(auVar149,(undefined1  [16])aVar11,0x7f);
  auVar112 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
  auVar146 = vrcpss_avx(auVar112,auVar112);
  auVar344 = ZEXT464(0x40000000);
  fVar141 = auVar149._0_4_ * auVar146._0_4_ * (2.0 - auVar146._0_4_ * auVar112._0_4_);
  local_780 = ZEXT416((uint)fVar141);
  auVar112 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
  fVar141 = aVar11.x;
  fVar175 = aVar11.y;
  fVar177 = aVar11.z;
  aVar178 = aVar11.field_3;
  auVar268._0_4_ = aVar10.x + fVar141 * auVar112._0_4_;
  auVar268._4_4_ = aVar10.y + fVar175 * auVar112._4_4_;
  auVar268._8_4_ = aVar10.z + fVar177 * auVar112._8_4_;
  auVar268._12_4_ = aVar10.field_3.w + aVar178.w * auVar112._12_4_;
  auVar149 = vblendps_avx(auVar268,_DAT_01feba10,8);
  _local_990 = vsubps_avx(auVar184,auVar149);
  auVar308 = ZEXT1664(_local_990);
  _local_9a0 = vsubps_avx(auVar219,auVar149);
  _local_9b0 = vsubps_avx(auVar202,auVar149);
  _local_9c0 = vsubps_avx(auVar245,auVar149);
  auVar259 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  auVar149 = vshufps_avx(_local_990,_local_990,0);
  register0x00001290 = auVar149;
  _local_1a0 = auVar149;
  auVar149 = vshufps_avx(_local_990,_local_990,0x55);
  register0x00001290 = auVar149;
  _local_1c0 = auVar149;
  auVar149 = vshufps_avx(_local_990,_local_990,0xaa);
  register0x00001290 = auVar149;
  _local_1e0 = auVar149;
  auVar149 = vshufps_avx(_local_990,_local_990,0xff);
  register0x00001290 = auVar149;
  _local_2a0 = auVar149;
  auVar149 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001290 = auVar149;
  _local_200 = auVar149;
  auVar149 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001290 = auVar149;
  _local_220 = auVar149;
  auVar149 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001290 = auVar149;
  _local_240 = auVar149;
  auVar145._0_4_ = fVar141 * fVar141;
  auVar145._4_4_ = fVar175 * fVar175;
  auVar145._8_4_ = fVar177 * fVar177;
  auVar145._12_4_ = aVar178.w * aVar178.w;
  auVar149 = vshufps_avx(auVar145,auVar145,0xaa);
  auVar146 = vshufps_avx(auVar145,auVar145,0x55);
  auVar111 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x000012d0 = auVar111;
  _local_2c0 = auVar111;
  auVar111 = vshufps_avx(auVar145,auVar145,0);
  local_260._0_4_ = auVar111._0_4_ + auVar146._0_4_ + auVar149._0_4_;
  local_260._4_4_ = auVar111._4_4_ + auVar146._4_4_ + auVar149._4_4_;
  local_260._8_4_ = auVar111._8_4_ + auVar146._8_4_ + auVar149._8_4_;
  local_260._12_4_ = auVar111._12_4_ + auVar146._12_4_ + auVar149._12_4_;
  local_260._16_4_ = auVar111._0_4_ + auVar146._0_4_ + auVar149._0_4_;
  local_260._20_4_ = auVar111._4_4_ + auVar146._4_4_ + auVar149._4_4_;
  local_260._24_4_ = auVar111._8_4_ + auVar146._8_4_ + auVar149._8_4_;
  local_260._28_4_ = auVar111._12_4_ + auVar146._12_4_ + auVar149._12_4_;
  auVar149 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001250 = auVar149;
  _local_2e0 = auVar149;
  auVar149 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001250 = auVar149;
  _local_300 = auVar149;
  auVar149 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001250 = auVar149;
  _local_320 = auVar149;
  auVar149 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001250 = auVar149;
  _local_340 = auVar149;
  auVar149 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001250 = auVar149;
  _local_360 = auVar149;
  auVar149 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001250 = auVar149;
  _local_380 = auVar149;
  auVar149 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001250 = auVar149;
  _local_3a0 = auVar149;
  auVar149 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001250 = auVar149;
  _local_3c0 = auVar149;
  local_800._16_16_ = auVar112;
  local_800._0_16_ = auVar112;
  auVar276 = ZEXT3264(local_800);
  uVar103 = 1;
  uVar98 = 0;
  local_500 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fStack_4fc = local_500;
  fStack_4f8 = local_500;
  fStack_4f4 = local_500;
  fStack_4f0 = local_500;
  fStack_4ec = local_500;
  fStack_4e8 = local_500;
  fStack_4e4 = local_500;
  local_520 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  local_600 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_5fc = local_600;
  fStack_5f8 = local_600;
  fStack_5f4 = local_600;
  fStack_5f0 = local_600;
  fStack_5ec = local_600;
  fStack_5e8 = local_600;
  fStack_5e4 = local_600;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  local_3e0 = vandps_avx(local_260,auVar122);
  local_790 = 0x3f80000000000000;
  uStack_788 = 0;
  do {
    auVar93._8_8_ = uStack_788;
    auVar93._0_8_ = local_790;
    auVar149 = vmovshdup_avx(auVar93);
    fVar214 = auVar149._0_4_ - (float)local_790;
    auVar149 = vshufps_avx(auVar93,auVar93,0);
    register0x00001210 = auVar149;
    _local_820 = auVar149;
    auVar112 = vshufps_avx(ZEXT416((uint)fVar214),ZEXT416((uint)fVar214),0);
    local_840._16_16_ = auVar112;
    local_840._0_16_ = auVar112;
    fVar140 = auVar112._0_4_;
    fVar174 = auVar112._4_4_;
    fVar176 = auVar112._8_4_;
    fVar179 = auVar112._12_4_;
    fVar105 = auVar149._0_4_;
    auVar208._0_4_ = fVar105 + fVar140 * 0.0;
    fVar131 = auVar149._4_4_;
    auVar208._4_4_ = fVar131 + fVar174 * 0.14285715;
    fVar133 = auVar149._8_4_;
    auVar208._8_4_ = fVar133 + fVar176 * 0.2857143;
    fVar135 = auVar149._12_4_;
    auVar208._12_4_ = fVar135 + fVar179 * 0.42857146;
    auVar208._16_4_ = fVar105 + fVar140 * 0.5714286;
    auVar208._20_4_ = fVar131 + fVar174 * 0.71428573;
    auVar208._24_4_ = fVar133 + fVar176 * 0.8571429;
    auVar208._28_4_ = fVar135 + fVar179;
    auVar124 = vsubps_avx(auVar259._0_32_,auVar208);
    fVar141 = auVar124._0_4_;
    fVar175 = auVar124._4_4_;
    fVar177 = auVar124._8_4_;
    fVar180 = auVar124._12_4_;
    fVar199 = auVar124._16_4_;
    fVar212 = auVar124._20_4_;
    fVar213 = auVar124._24_4_;
    fVar234 = fVar141 * fVar141 * fVar141;
    fVar277 = fVar175 * fVar175 * fVar175;
    fVar280 = fVar177 * fVar177 * fVar177;
    fVar284 = fVar180 * fVar180 * fVar180;
    fVar288 = fVar199 * fVar199 * fVar199;
    fVar292 = fVar212 * fVar212 * fVar212;
    fVar296 = fVar213 * fVar213 * fVar213;
    fVar301 = auVar208._0_4_ * auVar208._0_4_ * auVar208._0_4_;
    fVar309 = auVar208._4_4_ * auVar208._4_4_ * auVar208._4_4_;
    fVar310 = auVar208._8_4_ * auVar208._8_4_ * auVar208._8_4_;
    fVar311 = auVar208._12_4_ * auVar208._12_4_ * auVar208._12_4_;
    fVar312 = auVar208._16_4_ * auVar208._16_4_ * auVar208._16_4_;
    fVar313 = auVar208._20_4_ * auVar208._20_4_ * auVar208._20_4_;
    fVar314 = auVar208._24_4_ * auVar208._24_4_ * auVar208._24_4_;
    fVar215 = auVar208._0_4_ * fVar141;
    fVar236 = auVar208._4_4_ * fVar175;
    fVar238 = auVar208._8_4_ * fVar177;
    fVar243 = auVar208._12_4_ * fVar180;
    fVar260 = auVar208._16_4_ * fVar199;
    fVar261 = auVar208._20_4_ * fVar212;
    fVar263 = auVar208._24_4_ * fVar213;
    fVar262 = auVar353._28_4_ + auVar374._28_4_;
    fVar338 = auVar308._28_4_ + auVar259._28_4_ + fVar262;
    fVar346 = fVar262 + auVar276._28_4_ + auVar360._28_4_ + auVar344._28_4_;
    fVar262 = fVar234 * 0.16666667;
    fVar278 = fVar277 * 0.16666667;
    fVar281 = fVar280 * 0.16666667;
    fVar285 = fVar284 * 0.16666667;
    fVar289 = fVar288 * 0.16666667;
    fVar293 = fVar292 * 0.16666667;
    fVar297 = fVar296 * 0.16666667;
    fVar315 = (fVar301 + fVar234 * 4.0 + fVar141 * fVar215 * 12.0 + auVar208._0_4_ * fVar215 * 6.0)
              * 0.16666667;
    fVar326 = (fVar309 + fVar277 * 4.0 + fVar175 * fVar236 * 12.0 + auVar208._4_4_ * fVar236 * 6.0)
              * 0.16666667;
    fVar328 = (fVar310 + fVar280 * 4.0 + fVar177 * fVar238 * 12.0 + auVar208._8_4_ * fVar238 * 6.0)
              * 0.16666667;
    fVar330 = (fVar311 + fVar284 * 4.0 + fVar180 * fVar243 * 12.0 + auVar208._12_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar332 = (fVar312 + fVar288 * 4.0 + fVar199 * fVar260 * 12.0 + auVar208._16_4_ * fVar260 * 6.0)
              * 0.16666667;
    fVar334 = (fVar313 + fVar292 * 4.0 + fVar212 * fVar261 * 12.0 + auVar208._20_4_ * fVar261 * 6.0)
              * 0.16666667;
    fVar336 = (fVar314 + fVar296 * 4.0 + fVar213 * fVar263 * 12.0 + auVar208._24_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar234 = (fVar301 * 4.0 + fVar234 + auVar208._0_4_ * fVar215 * 12.0 + fVar141 * fVar215 * 6.0)
              * 0.16666667;
    fVar277 = (fVar309 * 4.0 + fVar277 + auVar208._4_4_ * fVar236 * 12.0 + fVar175 * fVar236 * 6.0)
              * 0.16666667;
    fVar280 = (fVar310 * 4.0 + fVar280 + auVar208._8_4_ * fVar238 * 12.0 + fVar177 * fVar238 * 6.0)
              * 0.16666667;
    fVar284 = (fVar311 * 4.0 + fVar284 + auVar208._12_4_ * fVar243 * 12.0 + fVar180 * fVar243 * 6.0)
              * 0.16666667;
    fVar288 = (fVar312 * 4.0 + fVar288 + auVar208._16_4_ * fVar260 * 12.0 + fVar199 * fVar260 * 6.0)
              * 0.16666667;
    fVar292 = (fVar313 * 4.0 + fVar292 + auVar208._20_4_ * fVar261 * 12.0 + fVar212 * fVar261 * 6.0)
              * 0.16666667;
    fVar296 = (fVar314 * 4.0 + fVar296 + auVar208._24_4_ * fVar263 * 12.0 + fVar213 * fVar263 * 6.0)
              * 0.16666667;
    fVar301 = fVar301 * 0.16666667;
    fVar309 = fVar309 * 0.16666667;
    fVar310 = fVar310 * 0.16666667;
    fVar311 = fVar311 * 0.16666667;
    fVar312 = fVar312 * 0.16666667;
    fVar313 = fVar313 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar367 = auVar360._28_4_ + 12.0;
    fVar347 = fVar346 + 12.166667;
    local_a40 = (float)local_1a0._0_4_ * fVar262 +
                (float)local_200._0_4_ * fVar315 +
                fVar301 * (float)local_360._0_4_ + fVar234 * (float)local_2e0._0_4_;
    fStack_a3c = (float)local_1a0._4_4_ * fVar278 +
                 (float)local_200._4_4_ * fVar326 +
                 fVar309 * (float)local_360._4_4_ + fVar277 * (float)local_2e0._4_4_;
    fStack_a38 = fStack_198 * fVar281 +
                 fStack_1f8 * fVar328 + fVar310 * fStack_358 + fVar280 * fStack_2d8;
    fStack_a34 = fStack_194 * fVar285 +
                 fStack_1f4 * fVar330 + fVar311 * fStack_354 + fVar284 * fStack_2d4;
    fStack_a30 = fStack_190 * fVar289 +
                 fStack_1f0 * fVar332 + fVar312 * fStack_350 + fVar288 * fStack_2d0;
    fStack_a2c = fStack_18c * fVar293 +
                 fStack_1ec * fVar334 + fVar313 * fStack_34c + fVar292 * fStack_2cc;
    fStack_a28 = fStack_188 * fVar297 +
                 fStack_1e8 * fVar336 + fVar314 * fStack_348 + fVar296 * fStack_2c8;
    fStack_a24 = fVar338 + fVar347;
    local_ac0 = (float)local_1c0._0_4_ * fVar262 +
                (float)local_220._0_4_ * fVar315 +
                fVar301 * (float)local_380._0_4_ + fVar234 * (float)local_300._0_4_;
    fStack_abc = (float)local_1c0._4_4_ * fVar278 +
                 (float)local_220._4_4_ * fVar326 +
                 fVar309 * (float)local_380._4_4_ + fVar277 * (float)local_300._4_4_;
    fStack_ab8 = fStack_1b8 * fVar281 +
                 fStack_218 * fVar328 + fVar310 * fStack_378 + fVar280 * fStack_2f8;
    fStack_ab4 = fStack_1b4 * fVar285 +
                 fStack_214 * fVar330 + fVar311 * fStack_374 + fVar284 * fStack_2f4;
    fStack_ab0 = fStack_1b0 * fVar289 +
                 fStack_210 * fVar332 + fVar312 * fStack_370 + fVar288 * fStack_2f0;
    fStack_aac = fStack_1ac * fVar293 +
                 fStack_20c * fVar334 + fVar313 * fStack_36c + fVar292 * fStack_2ec;
    fStack_aa8 = fStack_1a8 * fVar297 +
                 fStack_208 * fVar336 + fVar314 * fStack_368 + fVar296 * fStack_2e8;
    fStack_aa4 = fStack_a24 + fVar367 + 12.166667;
    local_aa0 = (float)local_1e0._0_4_ * fVar262 +
                fVar315 * (float)local_240._0_4_ +
                fVar301 * (float)local_3a0._0_4_ + fVar234 * (float)local_320._0_4_;
    fStack_a9c = (float)local_1e0._4_4_ * fVar278 +
                 fVar326 * (float)local_240._4_4_ +
                 fVar309 * (float)local_3a0._4_4_ + fVar277 * (float)local_320._4_4_;
    fStack_a98 = fStack_1d8 * fVar281 +
                 fVar328 * fStack_238 + fVar310 * fStack_398 + fVar280 * fStack_318;
    fStack_a94 = fStack_1d4 * fVar285 +
                 fVar330 * fStack_234 + fVar311 * fStack_394 + fVar284 * fStack_314;
    fStack_a90 = fStack_1d0 * fVar289 +
                 fVar332 * fStack_230 + fVar312 * fStack_390 + fVar288 * fStack_310;
    fStack_a8c = fStack_1cc * fVar293 +
                 fVar334 * fStack_22c + fVar313 * fStack_38c + fVar292 * fStack_30c;
    fStack_a88 = fStack_1c8 * fVar297 +
                 fVar336 * fStack_228 + fVar314 * fStack_388 + fVar296 * fStack_308;
    fStack_a84 = fStack_aa4 + fVar367 + auVar374._28_4_ + 12.0;
    local_7e0._0_4_ =
         fVar262 * (float)local_2a0._0_4_ +
         fVar315 * (float)local_2c0._0_4_ +
         fVar234 * (float)local_340._0_4_ + fVar301 * (float)local_3c0._0_4_;
    local_7e0._4_4_ =
         fVar278 * (float)local_2a0._4_4_ +
         fVar326 * (float)local_2c0._4_4_ +
         fVar277 * (float)local_340._4_4_ + fVar309 * (float)local_3c0._4_4_;
    local_7e0._8_4_ =
         fVar281 * fStack_298 + fVar328 * fStack_2b8 + fVar280 * fStack_338 + fVar310 * fStack_3b8;
    local_7e0._12_4_ =
         fVar285 * fStack_294 + fVar330 * fStack_2b4 + fVar284 * fStack_334 + fVar311 * fStack_3b4;
    local_7e0._16_4_ =
         fVar289 * fStack_290 + fVar332 * fStack_2b0 + fVar288 * fStack_330 + fVar312 * fStack_3b0;
    local_7e0._20_4_ =
         fVar293 * fStack_28c + fVar334 * fStack_2ac + fVar292 * fStack_32c + fVar313 * fStack_3ac;
    local_7e0._24_4_ =
         fVar297 * fStack_288 + fVar336 * fStack_2a8 + fVar296 * fStack_328 + fVar314 * fStack_3a8;
    local_7e0._28_4_ = auVar276._28_4_ + fVar338 + fVar346 + auVar308._28_4_;
    auVar33._4_4_ = auVar208._4_4_ * -auVar208._4_4_;
    auVar33._0_4_ = auVar208._0_4_ * -auVar208._0_4_;
    auVar33._8_4_ = auVar208._8_4_ * -auVar208._8_4_;
    auVar33._12_4_ = auVar208._12_4_ * -auVar208._12_4_;
    auVar33._16_4_ = auVar208._16_4_ * -auVar208._16_4_;
    auVar33._20_4_ = auVar208._20_4_ * -auVar208._20_4_;
    auVar33._24_4_ = auVar208._24_4_ * -auVar208._24_4_;
    auVar33._28_4_ = auVar208._28_4_;
    auVar34._4_4_ = fVar236 * 4.0;
    auVar34._0_4_ = fVar215 * 4.0;
    auVar34._8_4_ = fVar238 * 4.0;
    auVar34._12_4_ = fVar243 * 4.0;
    auVar34._16_4_ = fVar260 * 4.0;
    auVar34._20_4_ = fVar261 * 4.0;
    auVar34._24_4_ = fVar263 * 4.0;
    auVar34._28_4_ = auVar259._28_4_;
    auVar124 = vsubps_avx(auVar33,auVar34);
    fVar285 = fVar141 * -fVar141 * 0.5;
    fVar289 = fVar175 * -fVar175 * 0.5;
    fVar297 = fVar177 * -fVar177 * 0.5;
    fVar301 = fVar180 * -fVar180 * 0.5;
    fVar309 = fVar199 * -fVar199 * 0.5;
    fVar310 = fVar212 * -fVar212 * 0.5;
    fVar311 = fVar213 * -fVar213 * 0.5;
    fVar262 = auVar124._0_4_ * 0.5;
    fVar280 = auVar124._4_4_ * 0.5;
    fVar281 = auVar124._8_4_ * 0.5;
    fVar284 = auVar124._12_4_ * 0.5;
    fVar292 = auVar124._16_4_ * 0.5;
    fVar293 = auVar124._20_4_ * 0.5;
    fVar296 = auVar124._24_4_ * 0.5;
    fVar234 = (fVar141 * fVar141 + fVar215 * 4.0) * 0.5;
    fVar236 = (fVar175 * fVar175 + fVar236 * 4.0) * 0.5;
    fVar238 = (fVar177 * fVar177 + fVar238 * 4.0) * 0.5;
    fVar243 = (fVar180 * fVar180 + fVar243 * 4.0) * 0.5;
    fVar260 = (fVar199 * fVar199 + fVar260 * 4.0) * 0.5;
    fVar277 = (fVar212 * fVar212 + fVar261 * 4.0) * 0.5;
    fVar278 = (fVar213 * fVar213 + fVar263 * 4.0) * 0.5;
    fVar141 = auVar208._0_4_ * auVar208._0_4_ * 0.5;
    fVar175 = auVar208._4_4_ * auVar208._4_4_ * 0.5;
    fVar177 = auVar208._8_4_ * auVar208._8_4_ * 0.5;
    fVar180 = auVar208._12_4_ * auVar208._12_4_ * 0.5;
    fVar199 = auVar208._16_4_ * auVar208._16_4_ * 0.5;
    fVar212 = auVar208._20_4_ * auVar208._20_4_ * 0.5;
    fVar215 = auVar208._24_4_ * auVar208._24_4_ * 0.5;
    fVar300 = fStack_a84 + fVar347 + fVar347 + 4.0;
    auVar149 = vpermilps_avx(ZEXT416((uint)(fVar214 * 0.04761905)),0);
    fVar213 = auVar149._0_4_;
    fVar265 = fVar213 * ((float)local_1a0._0_4_ * fVar285 +
                        (float)local_200._0_4_ * fVar262 +
                        fVar234 * (float)local_2e0._0_4_ + fVar141 * (float)local_360._0_4_);
    fVar261 = auVar149._4_4_;
    fVar279 = fVar261 * ((float)local_1a0._4_4_ * fVar289 +
                        (float)local_200._4_4_ * fVar280 +
                        fVar236 * (float)local_2e0._4_4_ + fVar175 * (float)local_360._4_4_);
    local_980._4_4_ = fVar279;
    local_980._0_4_ = fVar265;
    fVar263 = auVar149._8_4_;
    fVar282 = fVar263 * (fStack_198 * fVar297 +
                        fStack_1f8 * fVar281 + fVar238 * fStack_2d8 + fVar177 * fStack_358);
    local_980._8_4_ = fVar282;
    fVar288 = auVar149._12_4_;
    fVar286 = fVar288 * (fStack_194 * fVar301 +
                        fStack_1f4 * fVar284 + fVar243 * fStack_2d4 + fVar180 * fStack_354);
    local_980._12_4_ = fVar286;
    fVar290 = fVar213 * (fStack_190 * fVar309 +
                        fStack_1f0 * fVar292 + fVar260 * fStack_2d0 + fVar199 * fStack_350);
    local_980._16_4_ = fVar290;
    fVar294 = fVar261 * (fStack_18c * fVar310 +
                        fStack_1ec * fVar293 + fVar277 * fStack_2cc + fVar212 * fStack_34c);
    local_980._20_4_ = fVar294;
    fVar298 = fVar263 * (fStack_188 * fVar311 +
                        fStack_1e8 * fVar296 + fVar278 * fStack_2c8 + fVar215 * fStack_348);
    local_980._24_4_ = fVar298;
    local_980._28_4_ = fVar300;
    fVar368 = fVar213 * ((float)local_1c0._0_4_ * fVar285 +
                        (float)local_220._0_4_ * fVar262 +
                        fVar234 * (float)local_300._0_4_ + fVar141 * (float)local_380._0_4_);
    fVar375 = fVar261 * ((float)local_1c0._4_4_ * fVar289 +
                        (float)local_220._4_4_ * fVar280 +
                        fVar236 * (float)local_300._4_4_ + fVar175 * (float)local_380._4_4_);
    local_920._4_4_ = fVar375;
    local_920._0_4_ = fVar368;
    fVar377 = fVar263 * (fStack_1b8 * fVar297 +
                        fStack_218 * fVar281 + fVar238 * fStack_2f8 + fVar177 * fStack_378);
    local_920._8_4_ = fVar377;
    fVar378 = fVar288 * (fStack_1b4 * fVar301 +
                        fStack_214 * fVar284 + fVar243 * fStack_2f4 + fVar180 * fStack_374);
    local_920._12_4_ = fVar378;
    fVar379 = fVar213 * (fStack_1b0 * fVar309 +
                        fStack_210 * fVar292 + fVar260 * fStack_2f0 + fVar199 * fStack_370);
    local_920._16_4_ = fVar379;
    fVar380 = fVar261 * (fStack_1ac * fVar310 +
                        fStack_20c * fVar293 + fVar277 * fStack_2ec + fVar212 * fStack_36c);
    local_920._20_4_ = fVar380;
    fVar381 = fVar263 * (fStack_1a8 * fVar311 +
                        fStack_208 * fVar296 + fVar278 * fStack_2e8 + fVar215 * fStack_368);
    local_920._24_4_ = fVar381;
    local_920._28_4_ = fStack_184;
    fVar383 = fVar213 * ((float)local_1e0._0_4_ * fVar285 +
                        fVar141 * (float)local_3a0._0_4_ + fVar234 * (float)local_320._0_4_ +
                        (float)local_240._0_4_ * fVar262);
    fVar387 = fVar261 * ((float)local_1e0._4_4_ * fVar289 +
                        fVar175 * (float)local_3a0._4_4_ + fVar236 * (float)local_320._4_4_ +
                        (float)local_240._4_4_ * fVar280);
    local_8a0._4_4_ = fVar387;
    local_8a0._0_4_ = fVar383;
    fVar389 = fVar263 * (fStack_1d8 * fVar297 +
                        fVar177 * fStack_398 + fVar238 * fStack_318 + fStack_238 * fVar281);
    local_8a0._8_4_ = fVar389;
    fVar391 = fVar288 * (fStack_1d4 * fVar301 +
                        fVar180 * fStack_394 + fVar243 * fStack_314 + fStack_234 * fVar284);
    local_8a0._12_4_ = fVar391;
    fVar393 = fVar213 * (fStack_1d0 * fVar309 +
                        fVar199 * fStack_390 + fVar260 * fStack_310 + fStack_230 * fVar292);
    local_8a0._16_4_ = fVar393;
    fVar395 = fVar261 * (fStack_1cc * fVar310 +
                        fVar212 * fStack_38c + fVar277 * fStack_30c + fStack_22c * fVar293);
    local_8a0._20_4_ = fVar395;
    fVar397 = fVar263 * (fStack_1c8 * fVar311 +
                        fVar215 * fStack_388 + fVar278 * fStack_308 + fStack_228 * fVar296);
    local_8a0._24_4_ = fVar397;
    local_8a0._28_4_ = uStack_1a4;
    fVar214 = fVar213 * (fVar285 * (float)local_2a0._0_4_ +
                        fVar262 * (float)local_2c0._0_4_ +
                        fVar141 * (float)local_3c0._0_4_ + fVar234 * (float)local_340._0_4_);
    fVar262 = fVar261 * (fVar289 * (float)local_2a0._4_4_ +
                        fVar280 * (float)local_2c0._4_4_ +
                        fVar175 * (float)local_3c0._4_4_ + fVar236 * (float)local_340._4_4_);
    auVar158._4_4_ = fVar262;
    auVar158._0_4_ = fVar214;
    fVar285 = fVar263 * (fVar297 * fStack_298 +
                        fVar281 * fStack_2b8 + fVar177 * fStack_3b8 + fVar238 * fStack_338);
    auVar158._8_4_ = fVar285;
    fVar289 = fVar288 * (fVar301 * fStack_294 +
                        fVar284 * fStack_2b4 + fVar180 * fStack_3b4 + fVar243 * fStack_334);
    auVar158._12_4_ = fVar289;
    fVar213 = fVar213 * (fVar309 * fStack_290 +
                        fVar292 * fStack_2b0 + fVar199 * fStack_3b0 + fVar260 * fStack_330);
    auVar158._16_4_ = fVar213;
    fVar261 = fVar261 * (fVar310 * fStack_28c +
                        fVar293 * fStack_2ac + fVar212 * fStack_3ac + fVar277 * fStack_32c);
    auVar158._20_4_ = fVar261;
    fVar263 = fVar263 * (fVar311 * fStack_288 +
                        fVar296 * fStack_2a8 + fVar215 * fStack_3a8 + fVar278 * fStack_328);
    auVar158._24_4_ = fVar263;
    auVar158._28_4_ = fVar288;
    auVar88._4_4_ = fStack_abc;
    auVar88._0_4_ = local_ac0;
    auVar88._8_4_ = fStack_ab8;
    auVar88._12_4_ = fStack_ab4;
    auVar88._16_4_ = fStack_ab0;
    auVar88._20_4_ = fStack_aac;
    auVar88._24_4_ = fStack_aa8;
    auVar88._28_4_ = fStack_aa4;
    auVar124 = vperm2f128_avx(auVar88,auVar88,1);
    auVar124 = vshufps_avx(auVar124,auVar88,0x30);
    _local_860 = vshufps_avx(auVar88,auVar124,0x29);
    auVar90._4_4_ = fStack_a9c;
    auVar90._0_4_ = local_aa0;
    auVar90._8_4_ = fStack_a98;
    auVar90._12_4_ = fStack_a94;
    auVar90._16_4_ = fStack_a90;
    auVar90._20_4_ = fStack_a8c;
    auVar90._24_4_ = fStack_a88;
    auVar90._28_4_ = fStack_a84;
    auVar124 = vperm2f128_avx(auVar90,auVar90,1);
    auVar124 = vshufps_avx(auVar124,auVar90,0x30);
    _local_880 = vshufps_avx(auVar90,auVar124,0x29);
    auVar122 = vsubps_avx(local_7e0,auVar158);
    auVar124 = vperm2f128_avx(auVar122,auVar122,1);
    auVar124 = vshufps_avx(auVar124,auVar122,0x30);
    local_6e0 = vshufps_avx(auVar122,auVar124,0x29);
    _local_680 = vsubps_avx(_local_860,auVar88);
    _local_660 = vsubps_avx(_local_880,auVar90);
    fVar175 = local_680._0_4_;
    fVar234 = local_680._4_4_;
    auVar160._4_4_ = fVar387 * fVar234;
    auVar160._0_4_ = fVar383 * fVar175;
    fVar277 = local_680._8_4_;
    auVar160._8_4_ = fVar389 * fVar277;
    fVar292 = local_680._12_4_;
    auVar160._12_4_ = fVar391 * fVar292;
    fVar312 = local_680._16_4_;
    auVar160._16_4_ = fVar393 * fVar312;
    fVar334 = local_680._20_4_;
    auVar160._20_4_ = fVar395 * fVar334;
    fVar20 = local_680._24_4_;
    auVar160._24_4_ = fVar397 * fVar20;
    auVar160._28_4_ = auVar122._28_4_;
    fVar177 = local_660._0_4_;
    fVar236 = local_660._4_4_;
    auVar386._4_4_ = fVar375 * fVar236;
    auVar386._0_4_ = fVar368 * fVar177;
    fVar278 = local_660._8_4_;
    auVar386._8_4_ = fVar377 * fVar278;
    fVar293 = local_660._12_4_;
    auVar386._12_4_ = fVar378 * fVar293;
    fVar313 = local_660._16_4_;
    auVar386._16_4_ = fVar379 * fVar313;
    fVar336 = local_660._20_4_;
    auVar386._20_4_ = fVar380 * fVar336;
    fVar21 = local_660._24_4_;
    auVar386._24_4_ = fVar381 * fVar21;
    auVar386._28_4_ = auVar124._28_4_;
    auVar33 = vsubps_avx(auVar386,auVar160);
    auVar92._4_4_ = fStack_a3c;
    auVar92._0_4_ = local_a40;
    auVar92._8_4_ = fStack_a38;
    auVar92._12_4_ = fStack_a34;
    auVar92._16_4_ = fStack_a30;
    auVar92._20_4_ = fStack_a2c;
    auVar92._24_4_ = fStack_a28;
    auVar92._28_4_ = fStack_a24;
    auVar124 = vperm2f128_avx(auVar92,auVar92,1);
    auVar124 = vshufps_avx(auVar124,auVar92,0x30);
    local_940 = vshufps_avx(auVar92,auVar124,0x29);
    local_540 = vsubps_avx(local_940,auVar92);
    auVar35._4_4_ = fVar236 * fVar279;
    auVar35._0_4_ = fVar177 * fVar265;
    auVar35._8_4_ = fVar278 * fVar282;
    auVar35._12_4_ = fVar293 * fVar286;
    auVar35._16_4_ = fVar313 * fVar290;
    auVar35._20_4_ = fVar336 * fVar294;
    auVar35._24_4_ = fVar21 * fVar298;
    auVar35._28_4_ = auVar124._28_4_;
    fVar180 = local_540._0_4_;
    fVar238 = local_540._4_4_;
    auVar36._4_4_ = fVar387 * fVar238;
    auVar36._0_4_ = fVar383 * fVar180;
    fVar280 = local_540._8_4_;
    auVar36._8_4_ = fVar389 * fVar280;
    fVar296 = local_540._12_4_;
    auVar36._12_4_ = fVar391 * fVar296;
    fVar314 = local_540._16_4_;
    auVar36._16_4_ = fVar393 * fVar314;
    fVar338 = local_540._20_4_;
    auVar36._20_4_ = fVar395 * fVar338;
    fVar22 = local_540._24_4_;
    auVar36._24_4_ = fVar397 * fVar22;
    auVar36._28_4_ = local_880._28_4_;
    auVar34 = vsubps_avx(auVar36,auVar35);
    auVar343._4_4_ = fVar375 * fVar238;
    auVar343._0_4_ = fVar368 * fVar180;
    auVar343._8_4_ = fVar377 * fVar280;
    auVar343._12_4_ = fVar378 * fVar296;
    auVar343._16_4_ = fVar379 * fVar314;
    auVar343._20_4_ = fVar380 * fVar338;
    auVar343._24_4_ = fVar381 * fVar22;
    auVar343._28_4_ = local_880._28_4_;
    auVar37._4_4_ = fVar234 * fVar279;
    auVar37._0_4_ = fVar175 * fVar265;
    auVar37._8_4_ = fVar277 * fVar282;
    auVar37._12_4_ = fVar292 * fVar286;
    auVar37._16_4_ = fVar312 * fVar290;
    auVar37._20_4_ = fVar334 * fVar294;
    auVar37._24_4_ = fVar20 * fVar298;
    auVar37._28_4_ = uStack_1c4;
    auVar158 = vsubps_avx(auVar37,auVar343);
    fVar141 = auVar158._28_4_;
    auVar157._0_4_ = fVar180 * fVar180 + fVar175 * fVar175 + fVar177 * fVar177;
    auVar157._4_4_ = fVar238 * fVar238 + fVar234 * fVar234 + fVar236 * fVar236;
    auVar157._8_4_ = fVar280 * fVar280 + fVar277 * fVar277 + fVar278 * fVar278;
    auVar157._12_4_ = fVar296 * fVar296 + fVar292 * fVar292 + fVar293 * fVar293;
    auVar157._16_4_ = fVar314 * fVar314 + fVar312 * fVar312 + fVar313 * fVar313;
    auVar157._20_4_ = fVar338 * fVar338 + fVar334 * fVar334 + fVar336 * fVar336;
    auVar157._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar157._28_4_ = fVar141 + fVar141 + auVar33._28_4_;
    auVar124 = vrcpps_avx(auVar157);
    fVar309 = auVar124._0_4_;
    fVar310 = auVar124._4_4_;
    auVar38._4_4_ = fVar310 * auVar157._4_4_;
    auVar38._0_4_ = fVar309 * auVar157._0_4_;
    fVar311 = auVar124._8_4_;
    auVar38._8_4_ = fVar311 * auVar157._8_4_;
    fVar328 = auVar124._12_4_;
    auVar38._12_4_ = fVar328 * auVar157._12_4_;
    fVar330 = auVar124._16_4_;
    auVar38._16_4_ = fVar330 * auVar157._16_4_;
    fVar332 = auVar124._20_4_;
    auVar38._20_4_ = fVar332 * auVar157._20_4_;
    fVar367 = auVar124._24_4_;
    auVar38._24_4_ = fVar367 * auVar157._24_4_;
    auVar38._28_4_ = uStack_1c4;
    auVar193._8_4_ = 0x3f800000;
    auVar193._0_8_ = &DAT_3f8000003f800000;
    auVar193._12_4_ = 0x3f800000;
    auVar193._16_4_ = 0x3f800000;
    auVar193._20_4_ = 0x3f800000;
    auVar193._24_4_ = 0x3f800000;
    auVar193._28_4_ = 0x3f800000;
    auVar160 = vsubps_avx(auVar193,auVar38);
    fVar309 = auVar160._0_4_ * fVar309 + fVar309;
    fVar310 = auVar160._4_4_ * fVar310 + fVar310;
    fVar311 = auVar160._8_4_ * fVar311 + fVar311;
    fVar328 = auVar160._12_4_ * fVar328 + fVar328;
    fVar330 = auVar160._16_4_ * fVar330 + fVar330;
    fVar332 = auVar160._20_4_ * fVar332 + fVar332;
    fVar367 = auVar160._24_4_ * fVar367 + fVar367;
    auVar122 = vperm2f128_avx(local_920,local_920,1);
    auVar122 = vshufps_avx(auVar122,local_920,0x30);
    local_9e0 = vshufps_avx(local_920,auVar122,0x29);
    auVar122 = vperm2f128_avx(local_8a0,local_8a0,1);
    auVar122 = vshufps_avx(auVar122,local_8a0,0x30);
    local_7c0 = vshufps_avx(local_8a0,auVar122,0x29);
    fVar384 = local_7c0._0_4_;
    fVar388 = local_7c0._4_4_;
    auVar39._4_4_ = fVar388 * fVar234;
    auVar39._0_4_ = fVar384 * fVar175;
    fVar390 = local_7c0._8_4_;
    auVar39._8_4_ = fVar390 * fVar277;
    fVar392 = local_7c0._12_4_;
    auVar39._12_4_ = fVar392 * fVar292;
    fVar394 = local_7c0._16_4_;
    auVar39._16_4_ = fVar394 * fVar312;
    fVar396 = local_7c0._20_4_;
    auVar39._20_4_ = fVar396 * fVar334;
    fVar398 = local_7c0._24_4_;
    auVar39._24_4_ = fVar398 * fVar20;
    auVar39._28_4_ = auVar122._28_4_;
    fVar199 = local_9e0._0_4_;
    fVar243 = local_9e0._4_4_;
    auVar40._4_4_ = fVar236 * fVar243;
    auVar40._0_4_ = fVar177 * fVar199;
    fVar281 = local_9e0._8_4_;
    auVar40._8_4_ = fVar278 * fVar281;
    fVar297 = local_9e0._12_4_;
    auVar40._12_4_ = fVar293 * fVar297;
    fVar315 = local_9e0._16_4_;
    auVar40._16_4_ = fVar313 * fVar315;
    fVar346 = local_9e0._20_4_;
    auVar40._20_4_ = fVar336 * fVar346;
    fVar23 = local_9e0._24_4_;
    auVar40._24_4_ = fVar21 * fVar23;
    auVar40._28_4_ = fStack_184;
    auVar386 = vsubps_avx(auVar40,auVar39);
    auVar122 = vperm2f128_avx(local_980,local_980,1);
    auVar122 = vshufps_avx(auVar122,local_980,0x30);
    local_960 = vshufps_avx(local_980,auVar122,0x29);
    fVar212 = local_960._0_4_;
    fVar260 = local_960._4_4_;
    auVar41._4_4_ = fVar236 * fVar260;
    auVar41._0_4_ = fVar177 * fVar212;
    fVar284 = local_960._8_4_;
    auVar41._8_4_ = fVar278 * fVar284;
    fVar301 = local_960._12_4_;
    auVar41._12_4_ = fVar293 * fVar301;
    fVar326 = local_960._16_4_;
    auVar41._16_4_ = fVar313 * fVar326;
    fVar347 = local_960._20_4_;
    auVar41._20_4_ = fVar336 * fVar347;
    fVar24 = local_960._24_4_;
    auVar41._24_4_ = fVar21 * fVar24;
    auVar41._28_4_ = auVar122._28_4_;
    auVar42._4_4_ = fVar388 * fVar238;
    auVar42._0_4_ = fVar384 * fVar180;
    auVar42._8_4_ = fVar390 * fVar280;
    auVar42._12_4_ = fVar392 * fVar296;
    auVar42._16_4_ = fVar394 * fVar314;
    auVar42._20_4_ = fVar396 * fVar338;
    uVar97 = local_7c0._28_4_;
    auVar42._24_4_ = fVar398 * fVar22;
    auVar42._28_4_ = uVar97;
    auVar122 = vsubps_avx(auVar42,auVar41);
    auVar36 = local_9e0;
    auVar43._4_4_ = fVar238 * fVar243;
    auVar43._0_4_ = fVar180 * fVar199;
    auVar43._8_4_ = fVar280 * fVar281;
    auVar43._12_4_ = fVar296 * fVar297;
    auVar43._16_4_ = fVar314 * fVar315;
    auVar43._20_4_ = fVar338 * fVar346;
    auVar43._24_4_ = fVar22 * fVar23;
    auVar43._28_4_ = uVar97;
    auVar44._4_4_ = fVar234 * fVar260;
    auVar44._0_4_ = fVar175 * fVar212;
    auVar44._8_4_ = fVar277 * fVar284;
    auVar44._12_4_ = fVar292 * fVar301;
    auVar44._16_4_ = fVar312 * fVar326;
    auVar44._20_4_ = fVar334 * fVar347;
    auVar44._24_4_ = fVar20 * fVar24;
    auVar44._28_4_ = uStack_1e4;
    auVar35 = vsubps_avx(auVar44,auVar43);
    fVar215 = auVar35._28_4_;
    fVar382 = auVar122._28_4_ + fVar215;
    auVar45._4_4_ =
         (auVar33._4_4_ * auVar33._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar158._4_4_ * auVar158._4_4_) * fVar310;
    auVar45._0_4_ =
         (auVar33._0_4_ * auVar33._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar158._0_4_ * auVar158._0_4_) * fVar309;
    auVar45._8_4_ =
         (auVar33._8_4_ * auVar33._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar158._8_4_ * auVar158._8_4_) * fVar311;
    auVar45._12_4_ =
         (auVar33._12_4_ * auVar33._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar158._12_4_ * auVar158._12_4_) * fVar328;
    auVar45._16_4_ =
         (auVar33._16_4_ * auVar33._16_4_ +
         auVar34._16_4_ * auVar34._16_4_ + auVar158._16_4_ * auVar158._16_4_) * fVar330;
    auVar45._20_4_ =
         (auVar33._20_4_ * auVar33._20_4_ +
         auVar34._20_4_ * auVar34._20_4_ + auVar158._20_4_ * auVar158._20_4_) * fVar332;
    auVar45._24_4_ =
         (auVar33._24_4_ * auVar33._24_4_ +
         auVar34._24_4_ * auVar34._24_4_ + auVar158._24_4_ * auVar158._24_4_) * fVar367;
    auVar45._28_4_ = auVar33._28_4_ + auVar34._28_4_ + fVar141;
    auVar46._4_4_ =
         (auVar386._4_4_ * auVar386._4_4_ +
         auVar122._4_4_ * auVar122._4_4_ + auVar35._4_4_ * auVar35._4_4_) * fVar310;
    auVar46._0_4_ =
         (auVar386._0_4_ * auVar386._0_4_ +
         auVar122._0_4_ * auVar122._0_4_ + auVar35._0_4_ * auVar35._0_4_) * fVar309;
    auVar46._8_4_ =
         (auVar386._8_4_ * auVar386._8_4_ +
         auVar122._8_4_ * auVar122._8_4_ + auVar35._8_4_ * auVar35._8_4_) * fVar311;
    auVar46._12_4_ =
         (auVar386._12_4_ * auVar386._12_4_ +
         auVar122._12_4_ * auVar122._12_4_ + auVar35._12_4_ * auVar35._12_4_) * fVar328;
    auVar46._16_4_ =
         (auVar386._16_4_ * auVar386._16_4_ +
         auVar122._16_4_ * auVar122._16_4_ + auVar35._16_4_ * auVar35._16_4_) * fVar330;
    auVar46._20_4_ =
         (auVar386._20_4_ * auVar386._20_4_ +
         auVar122._20_4_ * auVar122._20_4_ + auVar35._20_4_ * auVar35._20_4_) * fVar332;
    auVar46._24_4_ =
         (auVar386._24_4_ * auVar386._24_4_ +
         auVar122._24_4_ * auVar122._24_4_ + auVar35._24_4_ * auVar35._24_4_) * fVar367;
    auVar46._28_4_ = auVar160._28_4_ + auVar124._28_4_;
    auVar124 = vmaxps_avx(auVar45,auVar46);
    auVar122 = vperm2f128_avx(local_7e0,local_7e0,1);
    auVar122 = vshufps_avx(auVar122,local_7e0,0x30);
    local_700 = vshufps_avx(local_7e0,auVar122,0x29);
    local_720._0_4_ = (float)local_7e0._0_4_ + fVar214;
    local_720._4_4_ = local_7e0._4_4_ + fVar262;
    fStack_718 = local_7e0._8_4_ + fVar285;
    fStack_714 = local_7e0._12_4_ + fVar289;
    fStack_710 = local_7e0._16_4_ + fVar213;
    fStack_70c = local_7e0._20_4_ + fVar261;
    fStack_708 = local_7e0._24_4_ + fVar263;
    fStack_704 = local_7e0._28_4_ + fVar288;
    auVar122 = vmaxps_avx(local_7e0,_local_720);
    auVar33 = vmaxps_avx(local_6e0,local_700);
    _local_a60 = vmaxps_avx(auVar122,auVar33);
    auVar122 = vrsqrtps_avx(auVar157);
    fVar141 = auVar122._0_4_;
    fVar213 = auVar122._4_4_;
    fVar214 = auVar122._8_4_;
    fVar261 = auVar122._12_4_;
    fVar262 = auVar122._16_4_;
    fVar263 = auVar122._20_4_;
    fVar285 = auVar122._24_4_;
    auVar47._4_4_ = fVar213 * fVar213 * fVar213 * auVar157._4_4_ * 0.5;
    auVar47._0_4_ = fVar141 * fVar141 * fVar141 * auVar157._0_4_ * 0.5;
    auVar47._8_4_ = fVar214 * fVar214 * fVar214 * auVar157._8_4_ * 0.5;
    auVar47._12_4_ = fVar261 * fVar261 * fVar261 * auVar157._12_4_ * 0.5;
    auVar47._16_4_ = fVar262 * fVar262 * fVar262 * auVar157._16_4_ * 0.5;
    auVar47._20_4_ = fVar263 * fVar263 * fVar263 * auVar157._20_4_ * 0.5;
    auVar47._24_4_ = fVar285 * fVar285 * fVar285 * auVar157._24_4_ * 0.5;
    auVar47._28_4_ = auVar157._28_4_;
    auVar48._4_4_ = fVar213 * 1.5;
    auVar48._0_4_ = fVar141 * 1.5;
    auVar48._8_4_ = fVar214 * 1.5;
    auVar48._12_4_ = fVar261 * 1.5;
    auVar48._16_4_ = fVar262 * 1.5;
    auVar48._20_4_ = fVar263 * 1.5;
    auVar48._24_4_ = fVar285 * 1.5;
    auVar48._28_4_ = auVar122._28_4_;
    local_580 = vsubps_avx(auVar48,auVar47);
    auVar89._4_4_ = fStack_abc;
    auVar89._0_4_ = local_ac0;
    auVar89._8_4_ = fStack_ab8;
    auVar89._12_4_ = fStack_ab4;
    auVar89._16_4_ = fStack_ab0;
    auVar89._20_4_ = fStack_aac;
    auVar89._24_4_ = fStack_aa8;
    auVar89._28_4_ = fStack_aa4;
    auVar122 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_8c0 = vsubps_avx(auVar122,auVar89);
    auVar91._4_4_ = fStack_a9c;
    auVar91._0_4_ = local_aa0;
    auVar91._8_4_ = fStack_a98;
    auVar91._12_4_ = fStack_a94;
    auVar91._16_4_ = fStack_a90;
    auVar91._20_4_ = fStack_a8c;
    auVar91._24_4_ = fStack_a88;
    auVar91._28_4_ = fStack_a84;
    auVar122 = vsubps_avx(auVar122,auVar91);
    fVar213 = auVar122._0_4_;
    fVar261 = auVar122._4_4_;
    fVar285 = auVar122._8_4_;
    fVar309 = auVar122._12_4_;
    fVar328 = auVar122._16_4_;
    fVar367 = auVar122._20_4_;
    fVar25 = auVar122._24_4_;
    fVar214 = local_8c0._0_4_;
    fVar262 = local_8c0._4_4_;
    fVar288 = local_8c0._8_4_;
    fVar310 = local_8c0._12_4_;
    fVar330 = local_8c0._16_4_;
    fVar19 = local_8c0._20_4_;
    fVar26 = local_8c0._24_4_;
    auVar158 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar33 = vsubps_avx(auVar158,auVar92);
    auVar360 = ZEXT3264(auVar33);
    fVar354 = auVar33._0_4_;
    fVar361 = auVar33._4_4_;
    fVar362 = auVar33._8_4_;
    fVar363 = auVar33._12_4_;
    fVar364 = auVar33._16_4_;
    fVar365 = auVar33._20_4_;
    fVar366 = auVar33._24_4_;
    auVar350._0_4_ = fVar354 * local_500 + local_520 * fVar214 + local_600 * fVar213;
    auVar350._4_4_ = fVar361 * fStack_4fc + fStack_51c * fVar262 + fStack_5fc * fVar261;
    auVar350._8_4_ = fVar362 * fStack_4f8 + fStack_518 * fVar288 + fStack_5f8 * fVar285;
    auVar350._12_4_ = fVar363 * fStack_4f4 + fStack_514 * fVar310 + fStack_5f4 * fVar309;
    auVar350._16_4_ = fVar364 * fStack_4f0 + fStack_510 * fVar330 + fStack_5f0 * fVar328;
    auVar350._20_4_ = fVar365 * fStack_4ec + fStack_50c * fVar19 + fStack_5ec * fVar367;
    auVar350._24_4_ = fVar366 * fStack_4e8 + fStack_508 * fVar26 + fStack_5e8 * fVar25;
    auVar350._28_4_ = fVar382 + fVar382 + auVar386._28_4_ + fVar382;
    auVar353 = ZEXT3264(auVar350);
    auVar371._0_4_ = fVar354 * fVar354 + fVar214 * fVar214 + fVar213 * fVar213;
    auVar371._4_4_ = fVar361 * fVar361 + fVar262 * fVar262 + fVar261 * fVar261;
    auVar371._8_4_ = fVar362 * fVar362 + fVar288 * fVar288 + fVar285 * fVar285;
    auVar371._12_4_ = fVar363 * fVar363 + fVar310 * fVar310 + fVar309 * fVar309;
    auVar371._16_4_ = fVar364 * fVar364 + fVar330 * fVar330 + fVar328 * fVar328;
    auVar371._20_4_ = fVar365 * fVar365 + fVar19 * fVar19 + fVar367 * fVar367;
    auVar371._24_4_ = fVar366 * fVar366 + fVar26 * fVar26 + fVar25 * fVar25;
    auVar371._28_4_ = fVar215 + fVar215 + fVar382;
    fVar215 = local_580._0_4_;
    fVar263 = local_580._4_4_;
    fVar289 = local_580._8_4_;
    fVar311 = local_580._12_4_;
    fVar332 = local_580._16_4_;
    fVar382 = local_580._20_4_;
    fVar264 = local_580._24_4_;
    fVar316 = local_500 * fVar180 * fVar215 +
              fVar175 * fVar215 * local_520 + fVar177 * fVar215 * local_600;
    fVar327 = fStack_4fc * fVar238 * fVar263 +
              fVar234 * fVar263 * fStack_51c + fVar236 * fVar263 * fStack_5fc;
    fVar329 = fStack_4f8 * fVar280 * fVar289 +
              fVar277 * fVar289 * fStack_518 + fVar278 * fVar289 * fStack_5f8;
    fVar331 = fStack_4f4 * fVar296 * fVar311 +
              fVar292 * fVar311 * fStack_514 + fVar293 * fVar311 * fStack_5f4;
    fVar333 = fStack_4f0 * fVar314 * fVar332 +
              fVar312 * fVar332 * fStack_510 + fVar313 * fVar332 * fStack_5f0;
    fVar335 = fStack_4ec * fVar338 * fVar382 +
              fVar334 * fVar382 * fStack_50c + fVar336 * fVar382 * fStack_5ec;
    fVar337 = fStack_4e8 * fVar22 * fVar264 +
              fVar20 * fVar264 * fStack_508 + fVar21 * fVar264 * fStack_5e8;
    fVar339 = fStack_4e4 + fStack_504 + fStack_5e4;
    fVar141 = fStack_4e4 + fStack_504 + fStack_5e4;
    local_6c0._0_4_ =
         fVar354 * fVar180 * fVar215 + fVar175 * fVar215 * fVar214 + fVar177 * fVar215 * fVar213;
    local_6c0._4_4_ =
         fVar361 * fVar238 * fVar263 + fVar234 * fVar263 * fVar262 + fVar236 * fVar263 * fVar261;
    local_6c0._8_4_ =
         fVar362 * fVar280 * fVar289 + fVar277 * fVar289 * fVar288 + fVar278 * fVar289 * fVar285;
    local_6c0._12_4_ =
         fVar363 * fVar296 * fVar311 + fVar292 * fVar311 * fVar310 + fVar293 * fVar311 * fVar309;
    local_6c0._16_4_ =
         fVar364 * fVar314 * fVar332 + fVar312 * fVar332 * fVar330 + fVar313 * fVar332 * fVar328;
    local_6c0._20_4_ =
         fVar365 * fVar338 * fVar382 + fVar334 * fVar382 * fVar19 + fVar336 * fVar382 * fVar367;
    local_6c0._24_4_ =
         fVar366 * fVar22 * fVar264 + fVar20 * fVar264 * fVar26 + fVar21 * fVar264 * fVar25;
    local_6c0._28_4_ = fStack_504 + fVar141;
    auVar49._4_4_ = fVar327 * local_6c0._4_4_;
    auVar49._0_4_ = fVar316 * local_6c0._0_4_;
    auVar49._8_4_ = fVar329 * local_6c0._8_4_;
    auVar49._12_4_ = fVar331 * local_6c0._12_4_;
    auVar49._16_4_ = fVar333 * local_6c0._16_4_;
    auVar49._20_4_ = fVar335 * local_6c0._20_4_;
    auVar49._24_4_ = fVar337 * local_6c0._24_4_;
    auVar49._28_4_ = fVar141;
    auVar33 = vsubps_avx(auVar350,auVar49);
    auVar50._4_4_ = local_6c0._4_4_ * local_6c0._4_4_;
    auVar50._0_4_ = local_6c0._0_4_ * local_6c0._0_4_;
    auVar50._8_4_ = local_6c0._8_4_ * local_6c0._8_4_;
    auVar50._12_4_ = local_6c0._12_4_ * local_6c0._12_4_;
    auVar50._16_4_ = local_6c0._16_4_ * local_6c0._16_4_;
    auVar50._20_4_ = local_6c0._20_4_ * local_6c0._20_4_;
    auVar50._24_4_ = local_6c0._24_4_ * local_6c0._24_4_;
    auVar50._28_4_ = fStack_504;
    local_740 = vsubps_avx(auVar371,auVar50);
    _local_640 = vsqrtps_avx(auVar124);
    fVar141 = (local_640._0_4_ + (float)local_a60._0_4_) * 1.0000002;
    fVar132 = (local_640._4_4_ + (float)local_a60._4_4_) * 1.0000002;
    fVar134 = (local_640._8_4_ + fStack_a58) * 1.0000002;
    fVar136 = (local_640._12_4_ + fStack_a54) * 1.0000002;
    fVar137 = (local_640._16_4_ + fStack_a50) * 1.0000002;
    fVar138 = (local_640._20_4_ + fStack_a4c) * 1.0000002;
    fVar139 = (local_640._24_4_ + fStack_a48) * 1.0000002;
    auVar51._4_4_ = fVar132 * fVar132;
    auVar51._0_4_ = fVar141 * fVar141;
    auVar51._8_4_ = fVar134 * fVar134;
    auVar51._12_4_ = fVar136 * fVar136;
    auVar51._16_4_ = fVar137 * fVar137;
    auVar51._20_4_ = fVar138 * fVar138;
    auVar51._24_4_ = fVar139 * fVar139;
    auVar51._28_4_ = local_640._28_4_ + fStack_a44;
    fVar369 = auVar33._0_4_ + auVar33._0_4_;
    fVar376 = auVar33._4_4_ + auVar33._4_4_;
    local_560._0_8_ = CONCAT44(fVar376,fVar369);
    local_560._8_4_ = auVar33._8_4_ + auVar33._8_4_;
    local_560._12_4_ = auVar33._12_4_ + auVar33._12_4_;
    local_560._16_4_ = auVar33._16_4_ + auVar33._16_4_;
    local_560._20_4_ = auVar33._20_4_ + auVar33._20_4_;
    local_560._24_4_ = auVar33._24_4_ + auVar33._24_4_;
    local_560._28_4_ = auVar33._28_4_ + auVar33._28_4_;
    auVar33 = vsubps_avx(local_740,auVar51);
    local_5a0._4_4_ = (uint)(fVar327 * fVar327);
    local_5a0._0_4_ = (uint)(fVar316 * fVar316);
    local_5a0._8_4_ = (uint)(fVar329 * fVar329);
    local_5a0._12_4_ = (uint)(fVar331 * fVar331);
    local_5a0._16_4_ = (uint)(fVar333 * fVar333);
    local_5a0._20_4_ = (uint)(fVar335 * fVar335);
    local_5a0._24_4_ = (uint)(fVar337 * fVar337);
    local_5a0._28_4_ = local_540._28_4_;
    _local_6a0 = vsubps_avx(local_260,local_5a0);
    auVar344 = ZEXT3264(_local_6a0);
    local_620._4_4_ = fVar376 * fVar376;
    local_620._0_4_ = fVar369 * fVar369;
    local_620._8_4_ = local_560._8_4_ * local_560._8_4_;
    local_620._12_4_ = local_560._12_4_ * local_560._12_4_;
    local_620._16_4_ = local_560._16_4_ * local_560._16_4_;
    local_620._20_4_ = local_560._20_4_ * local_560._20_4_;
    local_620._24_4_ = local_560._24_4_ * local_560._24_4_;
    local_620._28_4_ = 0x3f800002;
    fVar132 = local_6a0._0_4_;
    local_760._0_4_ = fVar132 * 4.0;
    fVar134 = local_6a0._4_4_;
    local_760._4_4_ = fVar134 * 4.0;
    fVar136 = local_6a0._8_4_;
    fStack_758 = fVar136 * 4.0;
    fVar137 = local_6a0._12_4_;
    fStack_754 = fVar137 * 4.0;
    fVar138 = local_6a0._16_4_;
    fStack_750 = fVar138 * 4.0;
    fVar139 = local_6a0._20_4_;
    fStack_74c = fVar139 * 4.0;
    fVar345 = local_6a0._24_4_;
    fStack_748 = fVar345 * 4.0;
    fStack_744 = 4.0;
    auVar52._4_4_ = auVar33._4_4_ * (float)local_760._4_4_;
    auVar52._0_4_ = auVar33._0_4_ * (float)local_760._0_4_;
    auVar52._8_4_ = auVar33._8_4_ * fStack_758;
    auVar52._12_4_ = auVar33._12_4_ * fStack_754;
    auVar52._16_4_ = auVar33._16_4_ * fStack_750;
    auVar52._20_4_ = auVar33._20_4_ * fStack_74c;
    auVar52._24_4_ = auVar33._24_4_ * fStack_748;
    auVar52._28_4_ = 0x40800000;
    auVar34 = vsubps_avx(local_620,auVar52);
    auVar124 = vcmpps_avx(auVar34,auVar158,5);
    fVar141 = local_6a0._28_4_;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar228._8_4_ = 0x7f800000;
      auVar228._0_8_ = 0x7f8000007f800000;
      auVar228._12_4_ = 0x7f800000;
      auVar228._16_4_ = 0x7f800000;
      auVar228._20_4_ = 0x7f800000;
      auVar228._24_4_ = 0x7f800000;
      auVar228._28_4_ = 0x7f800000;
      auVar372._8_4_ = 0xff800000;
      auVar372._0_8_ = 0xff800000ff800000;
      auVar372._12_4_ = 0xff800000;
      auVar372._16_4_ = 0xff800000;
      auVar372._20_4_ = 0xff800000;
      auVar372._24_4_ = 0xff800000;
      auVar372._28_4_ = 0xff800000;
      fVar369 = 0.0;
    }
    else {
      auVar386 = vsqrtps_avx(auVar34);
      auVar270._0_4_ = fVar132 + fVar132;
      auVar270._4_4_ = fVar134 + fVar134;
      auVar270._8_4_ = fVar136 + fVar136;
      auVar270._12_4_ = fVar137 + fVar137;
      auVar270._16_4_ = fVar138 + fVar138;
      auVar270._20_4_ = fVar139 + fVar139;
      auVar270._24_4_ = fVar345 + fVar345;
      auVar270._28_4_ = fVar141 + fVar141;
      auVar160 = vrcpps_avx(auVar270);
      auVar158 = vcmpps_avx(auVar34,auVar158,5);
      fVar216 = auVar160._0_4_;
      fVar235 = auVar160._4_4_;
      auVar53._4_4_ = auVar270._4_4_ * fVar235;
      auVar53._0_4_ = auVar270._0_4_ * fVar216;
      fVar237 = auVar160._8_4_;
      auVar53._8_4_ = auVar270._8_4_ * fVar237;
      fVar239 = auVar160._12_4_;
      auVar53._12_4_ = auVar270._12_4_ * fVar239;
      fVar240 = auVar160._16_4_;
      auVar53._16_4_ = auVar270._16_4_ * fVar240;
      fVar241 = auVar160._20_4_;
      auVar53._20_4_ = auVar270._20_4_ * fVar241;
      fVar242 = auVar160._24_4_;
      auVar53._24_4_ = auVar270._24_4_ * fVar242;
      auVar53._28_4_ = auVar34._28_4_;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = &DAT_3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar159._16_4_ = 0x3f800000;
      auVar159._20_4_ = 0x3f800000;
      auVar159._24_4_ = 0x3f800000;
      auVar159._28_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar159,auVar53);
      fVar216 = fVar216 + fVar216 * auVar34._0_4_;
      fVar235 = fVar235 + fVar235 * auVar34._4_4_;
      fVar237 = fVar237 + fVar237 * auVar34._8_4_;
      fVar239 = fVar239 + fVar239 * auVar34._12_4_;
      fVar240 = fVar240 + fVar240 * auVar34._16_4_;
      fVar241 = fVar241 + fVar241 * auVar34._20_4_;
      fVar242 = fVar242 + fVar242 * auVar34._24_4_;
      auVar271._0_8_ = CONCAT44(fVar376,fVar369) ^ 0x8000000080000000;
      auVar271._8_4_ = -local_560._8_4_;
      auVar271._12_4_ = -local_560._12_4_;
      auVar271._16_4_ = -local_560._16_4_;
      auVar271._20_4_ = -local_560._20_4_;
      auVar271._24_4_ = -local_560._24_4_;
      auVar271._28_4_ = -local_560._28_4_;
      auVar35 = vsubps_avx(auVar271,auVar386);
      fVar369 = auVar35._0_4_ * fVar216;
      fVar376 = auVar35._4_4_ * fVar235;
      auVar54._4_4_ = fVar376;
      auVar54._0_4_ = fVar369;
      fVar283 = auVar35._8_4_ * fVar237;
      auVar54._8_4_ = fVar283;
      fVar287 = auVar35._12_4_ * fVar239;
      auVar54._12_4_ = fVar287;
      fVar291 = auVar35._16_4_ * fVar240;
      auVar54._16_4_ = fVar291;
      fVar295 = auVar35._20_4_ * fVar241;
      auVar54._20_4_ = fVar295;
      fVar299 = auVar35._24_4_ * fVar242;
      auVar54._24_4_ = fVar299;
      auVar54._28_4_ = auVar35._28_4_;
      auVar386 = vsubps_avx(auVar386,local_560);
      fVar216 = auVar386._0_4_ * fVar216;
      fVar235 = auVar386._4_4_ * fVar235;
      auVar55._4_4_ = fVar235;
      auVar55._0_4_ = fVar216;
      fVar237 = auVar386._8_4_ * fVar237;
      auVar55._8_4_ = fVar237;
      fVar239 = auVar386._12_4_ * fVar239;
      auVar55._12_4_ = fVar239;
      fVar240 = auVar386._16_4_ * fVar240;
      auVar55._16_4_ = fVar240;
      fVar241 = auVar386._20_4_ * fVar241;
      auVar55._20_4_ = fVar241;
      fVar242 = auVar386._24_4_ * fVar242;
      auVar55._24_4_ = fVar242;
      auVar55._28_4_ = auVar386._28_4_;
      fStack_4a4 = local_6c0._28_4_ + auVar160._28_4_ + auVar34._28_4_;
      local_4c0[0] = fVar215 * (local_6c0._0_4_ + fVar316 * fVar369);
      local_4c0[1] = fVar263 * (local_6c0._4_4_ + fVar327 * fVar376);
      local_4c0[2] = fVar289 * (local_6c0._8_4_ + fVar329 * fVar283);
      local_4c0[3] = fVar311 * (local_6c0._12_4_ + fVar331 * fVar287);
      fStack_4b0 = fVar332 * (local_6c0._16_4_ + fVar333 * fVar291);
      fStack_4ac = fVar382 * (local_6c0._20_4_ + fVar335 * fVar295);
      fStack_4a8 = fVar264 * (local_6c0._24_4_ + fVar337 * fVar299);
      local_a60._4_4_ = fVar327;
      local_a60._0_4_ = fVar316;
      fStack_a58 = fVar329;
      fStack_a54 = fVar331;
      fStack_a50 = fVar333;
      fStack_a4c = fVar335;
      fStack_a48 = fVar337;
      fStack_a44 = fVar339;
      local_4e0[0] = fVar215 * (local_6c0._0_4_ + fVar316 * fVar216);
      local_4e0[1] = fVar263 * (local_6c0._4_4_ + fVar327 * fVar235);
      local_4e0[2] = fVar289 * (local_6c0._8_4_ + fVar329 * fVar237);
      local_4e0[3] = fVar311 * (local_6c0._12_4_ + fVar331 * fVar239);
      fStack_4d0 = fVar332 * (local_6c0._16_4_ + fVar333 * fVar240);
      fStack_4cc = fVar382 * (local_6c0._20_4_ + fVar335 * fVar241);
      fStack_4c8 = fVar264 * (local_6c0._24_4_ + fVar337 * fVar242);
      fStack_4c4 = local_6c0._28_4_ + fStack_4a4;
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar228 = vblendvps_avx(auVar229,auVar54,auVar158);
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar34 = vandps_avx(local_5a0,auVar307);
      auVar34 = vmaxps_avx(local_3e0,auVar34);
      auVar56._4_4_ = auVar34._4_4_ * 1.9073486e-06;
      auVar56._0_4_ = auVar34._0_4_ * 1.9073486e-06;
      auVar56._8_4_ = auVar34._8_4_ * 1.9073486e-06;
      auVar56._12_4_ = auVar34._12_4_ * 1.9073486e-06;
      auVar56._16_4_ = auVar34._16_4_ * 1.9073486e-06;
      auVar56._20_4_ = auVar34._20_4_ * 1.9073486e-06;
      auVar56._24_4_ = auVar34._24_4_ * 1.9073486e-06;
      auVar56._28_4_ = auVar34._28_4_;
      auVar34 = vandps_avx(_local_6a0,auVar307);
      auVar34 = vcmpps_avx(auVar34,auVar56,1);
      auVar353 = ZEXT3264(auVar34);
      auVar272._8_4_ = 0xff800000;
      auVar272._0_8_ = 0xff800000ff800000;
      auVar272._12_4_ = 0xff800000;
      auVar272._16_4_ = 0xff800000;
      auVar272._20_4_ = 0xff800000;
      auVar272._24_4_ = 0xff800000;
      auVar272._28_4_ = 0xff800000;
      auVar372 = vblendvps_avx(auVar272,auVar55,auVar158);
      auVar160 = auVar158 & auVar34;
      fVar369 = local_6c0._28_4_;
      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0x7f,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0xbf,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar160[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar34,auVar158);
        auVar149 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar34 = vcmpps_avx(auVar33,ZEXT832(0) << 0x20,2);
        auVar401._8_4_ = 0xff800000;
        auVar401._0_8_ = 0xff800000ff800000;
        auVar401._12_4_ = 0xff800000;
        auVar401._16_4_ = 0xff800000;
        auVar401._20_4_ = 0xff800000;
        auVar401._24_4_ = 0xff800000;
        auVar401._28_4_ = 0xff800000;
        auVar324._8_4_ = 0x7f800000;
        auVar324._0_8_ = 0x7f8000007f800000;
        auVar324._12_4_ = 0x7f800000;
        auVar324._16_4_ = 0x7f800000;
        auVar324._20_4_ = 0x7f800000;
        auVar324._24_4_ = 0x7f800000;
        auVar324._28_4_ = 0x7f800000;
        auVar33 = vblendvps_avx(auVar324,auVar401,auVar34);
        auVar112 = vpmovsxwd_avx(auVar149);
        auVar353 = ZEXT1664(auVar112);
        auVar149 = vpunpckhwd_avx(auVar149,auVar149);
        auVar258._16_16_ = auVar149;
        auVar258._0_16_ = auVar112;
        auVar228 = vblendvps_avx(auVar228,auVar33,auVar258);
        auVar33 = vblendvps_avx(auVar401,auVar324,auVar34);
        auVar372 = vblendvps_avx(auVar372,auVar33,auVar258);
        auVar33 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar129._0_4_ = auVar124._0_4_ ^ auVar33._0_4_;
        auVar129._4_4_ = auVar124._4_4_ ^ auVar33._4_4_;
        auVar129._8_4_ = auVar124._8_4_ ^ auVar33._8_4_;
        auVar129._12_4_ = auVar124._12_4_ ^ auVar33._12_4_;
        auVar129._16_4_ = auVar124._16_4_ ^ auVar33._16_4_;
        auVar129._20_4_ = auVar124._20_4_ ^ auVar33._20_4_;
        auVar129._24_4_ = auVar124._24_4_ ^ auVar33._24_4_;
        auVar129._28_4_ = auVar124._28_4_ ^ auVar33._28_4_;
        auVar124 = vorps_avx(auVar34,auVar129);
        auVar124 = vandps_avx(auVar158,auVar124);
      }
    }
    auVar374 = ZEXT3264(auVar372);
    auVar33 = local_280 & auVar124;
    auVar249._8_4_ = 0x3f800000;
    auVar249._0_8_ = &DAT_3f8000003f800000;
    auVar249._12_4_ = 0x3f800000;
    auVar249._16_4_ = 0x3f800000;
    auVar249._20_4_ = 0x3f800000;
    auVar249._24_4_ = 0x3f800000;
    auVar249._28_4_ = 0x3f800000;
    auVar259 = ZEXT3264(auVar249);
    auVar276 = ZEXT3264(local_800);
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0x7f,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar33 >> 0xbf,0) == '\0') &&
        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f]) {
      auVar308 = ZEXT864(0) << 0x20;
    }
    else {
      local_a60._4_4_ = fVar327;
      local_a60._0_4_ = fVar316;
      fStack_a58 = fVar329;
      fStack_a54 = fVar331;
      fStack_a50 = fVar333;
      fStack_a4c = fVar335;
      fStack_a48 = fVar337;
      fStack_a44 = fVar339;
      auVar149 = ZEXT416((uint)((ray->super_RayK<1>).org.field_0.m128[3] - (float)local_780._0_4_));
      auVar149 = vshufps_avx(auVar149,auVar149,0);
      auVar250._16_16_ = auVar149;
      auVar250._0_16_ = auVar149;
      auVar34 = vmaxps_avx(auVar250,auVar228);
      auVar149 = ZEXT416((uint)((ray->super_RayK<1>).tfar - (float)local_780._0_4_));
      auVar149 = vshufps_avx(auVar149,auVar149,0);
      auVar251._16_16_ = auVar149;
      auVar251._0_16_ = auVar149;
      auVar158 = vminps_avx(auVar251,auVar372);
      fVar240 = auVar122._28_4_;
      auVar194._0_4_ = local_500 * fVar265 + local_520 * fVar368 + fVar383 * local_600;
      auVar194._4_4_ = fStack_4fc * fVar279 + fStack_51c * fVar375 + fVar387 * fStack_5fc;
      auVar194._8_4_ = fStack_4f8 * fVar282 + fStack_518 * fVar377 + fVar389 * fStack_5f8;
      auVar194._12_4_ = fStack_4f4 * fVar286 + fStack_514 * fVar378 + fVar391 * fStack_5f4;
      auVar194._16_4_ = fStack_4f0 * fVar290 + fStack_510 * fVar379 + fVar393 * fStack_5f0;
      auVar194._20_4_ = fStack_4ec * fVar294 + fStack_50c * fVar380 + fVar395 * fStack_5ec;
      auVar194._24_4_ = fStack_4e8 * fVar298 + fStack_508 * fVar381 + fVar397 * fStack_5e8;
      auVar194._28_4_ = fVar300 + fStack_184 + fVar240;
      auVar122 = vrcpps_avx(auVar194);
      fVar300 = auVar122._0_4_;
      fVar339 = auVar122._4_4_;
      auVar57._4_4_ = auVar194._4_4_ * fVar339;
      auVar57._0_4_ = auVar194._0_4_ * fVar300;
      fVar376 = auVar122._8_4_;
      auVar57._8_4_ = auVar194._8_4_ * fVar376;
      fVar216 = auVar122._12_4_;
      auVar57._12_4_ = auVar194._12_4_ * fVar216;
      fVar235 = auVar122._16_4_;
      auVar57._16_4_ = auVar194._16_4_ * fVar235;
      fVar237 = auVar122._20_4_;
      auVar57._20_4_ = auVar194._20_4_ * fVar237;
      fVar239 = auVar122._24_4_;
      auVar57._24_4_ = auVar194._24_4_ * fVar239;
      auVar57._28_4_ = fStack_184;
      auVar33 = vsubps_avx(auVar249,auVar57);
      auVar322._8_4_ = 0x7fffffff;
      auVar322._0_8_ = 0x7fffffff7fffffff;
      auVar322._12_4_ = 0x7fffffff;
      auVar322._16_4_ = 0x7fffffff;
      auVar322._20_4_ = 0x7fffffff;
      auVar322._24_4_ = 0x7fffffff;
      auVar322._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar322,auVar194);
      auVar400._8_4_ = 0x219392ef;
      auVar400._0_8_ = 0x219392ef219392ef;
      auVar400._12_4_ = 0x219392ef;
      auVar400._16_4_ = 0x219392ef;
      auVar400._20_4_ = 0x219392ef;
      auVar400._24_4_ = 0x219392ef;
      auVar400._28_4_ = 0x219392ef;
      auVar122 = vcmpps_avx(auVar122,auVar400,1);
      auVar58._4_4_ =
           (fVar339 + fVar339 * auVar33._4_4_) *
           -(fVar361 * fVar279 + fVar375 * fVar262 + fVar387 * fVar261);
      auVar58._0_4_ =
           (fVar300 + fVar300 * auVar33._0_4_) *
           -(fVar354 * fVar265 + fVar368 * fVar214 + fVar383 * fVar213);
      auVar58._8_4_ =
           (fVar376 + fVar376 * auVar33._8_4_) *
           -(fVar362 * fVar282 + fVar377 * fVar288 + fVar389 * fVar285);
      auVar58._12_4_ =
           (fVar216 + fVar216 * auVar33._12_4_) *
           -(fVar363 * fVar286 + fVar378 * fVar310 + fVar391 * fVar309);
      auVar58._16_4_ =
           (fVar235 + fVar235 * auVar33._16_4_) *
           -(fVar364 * fVar290 + fVar379 * fVar330 + fVar393 * fVar328);
      auVar58._20_4_ =
           (fVar237 + fVar237 * auVar33._20_4_) *
           -(fVar365 * fVar294 + fVar380 * fVar19 + fVar395 * fVar367);
      auVar58._24_4_ =
           (fVar239 + fVar239 * auVar33._24_4_) *
           -(fVar366 * fVar298 + fVar381 * fVar26 + fVar397 * fVar25);
      auVar58._28_4_ = -(fVar240 + fVar369 + fVar240);
      auVar81 = ZEXT812(0);
      auVar344 = ZEXT1264(auVar81) << 0x20;
      auVar33 = vcmpps_avx(auVar194,ZEXT1232(auVar81) << 0x20,1);
      auVar160 = vorps_avx(auVar122,auVar33);
      auVar33 = vcmpps_avx(auVar194,ZEXT1232(auVar81) << 0x20,6);
      auVar33 = vorps_avx(auVar122,auVar33);
      auVar351._8_4_ = 0xff800000;
      auVar351._0_8_ = 0xff800000ff800000;
      auVar351._12_4_ = 0xff800000;
      auVar351._16_4_ = 0xff800000;
      auVar351._20_4_ = 0xff800000;
      auVar351._24_4_ = 0xff800000;
      auVar351._28_4_ = 0xff800000;
      auVar353 = ZEXT3264(auVar351);
      auVar122 = vblendvps_avx(auVar58,auVar351,auVar160);
      auVar358._8_4_ = 0x7f800000;
      auVar358._0_8_ = 0x7f8000007f800000;
      auVar358._12_4_ = 0x7f800000;
      auVar358._16_4_ = 0x7f800000;
      auVar358._20_4_ = 0x7f800000;
      auVar358._24_4_ = 0x7f800000;
      auVar358._28_4_ = 0x7f800000;
      auVar360 = ZEXT3264(auVar358);
      auVar33 = vblendvps_avx(auVar58,auVar358,auVar33);
      auVar34 = vmaxps_avx(auVar34,auVar122);
      auVar158 = vminps_avx(auVar158,auVar33);
      auVar343 = ZEXT1232(auVar81) << 0x20;
      auVar122 = vsubps_avx(auVar343,_local_860);
      auVar33 = vsubps_avx(auVar343,_local_880);
      auVar59._4_4_ = auVar33._4_4_ * -fVar388;
      auVar59._0_4_ = auVar33._0_4_ * -fVar384;
      auVar59._8_4_ = auVar33._8_4_ * -fVar390;
      auVar59._12_4_ = auVar33._12_4_ * -fVar392;
      auVar59._16_4_ = auVar33._16_4_ * -fVar394;
      auVar59._20_4_ = auVar33._20_4_ * -fVar396;
      auVar59._24_4_ = auVar33._24_4_ * -fVar398;
      auVar59._28_4_ = auVar33._28_4_;
      auVar60._4_4_ = fVar243 * auVar122._4_4_;
      auVar60._0_4_ = fVar199 * auVar122._0_4_;
      auVar60._8_4_ = fVar281 * auVar122._8_4_;
      auVar60._12_4_ = fVar297 * auVar122._12_4_;
      auVar60._16_4_ = fVar315 * auVar122._16_4_;
      auVar60._20_4_ = fVar346 * auVar122._20_4_;
      auVar60._24_4_ = fVar23 * auVar122._24_4_;
      auVar60._28_4_ = auVar122._28_4_;
      auVar122 = vsubps_avx(auVar59,auVar60);
      auVar33 = vsubps_avx(auVar343,local_940);
      auVar61._4_4_ = fVar260 * auVar33._4_4_;
      auVar61._0_4_ = fVar212 * auVar33._0_4_;
      auVar61._8_4_ = fVar284 * auVar33._8_4_;
      auVar61._12_4_ = fVar301 * auVar33._12_4_;
      auVar61._16_4_ = fVar326 * auVar33._16_4_;
      auVar61._20_4_ = fVar347 * auVar33._20_4_;
      uVar8 = auVar33._28_4_;
      auVar61._24_4_ = fVar24 * auVar33._24_4_;
      auVar61._28_4_ = uVar8;
      auVar160 = vsubps_avx(auVar122,auVar61);
      auVar62._4_4_ = -fVar388 * fStack_5fc;
      auVar62._0_4_ = -fVar384 * local_600;
      auVar62._8_4_ = -fVar390 * fStack_5f8;
      auVar62._12_4_ = -fVar392 * fStack_5f4;
      auVar62._16_4_ = -fVar394 * fStack_5f0;
      auVar62._20_4_ = -fVar396 * fStack_5ec;
      auVar62._24_4_ = -fVar398 * fStack_5e8;
      auVar62._28_4_ = uVar97 ^ 0x80000000;
      auVar63._4_4_ = fStack_51c * fVar243;
      auVar63._0_4_ = local_520 * fVar199;
      auVar63._8_4_ = fStack_518 * fVar281;
      auVar63._12_4_ = fStack_514 * fVar297;
      auVar63._16_4_ = fStack_510 * fVar315;
      auVar63._20_4_ = fStack_50c * fVar346;
      auVar63._24_4_ = fStack_508 * fVar23;
      auVar63._28_4_ = uVar8;
      auVar122 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fStack_4fc * fVar260;
      auVar64._0_4_ = local_500 * fVar212;
      auVar64._8_4_ = fStack_4f8 * fVar284;
      auVar64._12_4_ = fStack_4f4 * fVar301;
      auVar64._16_4_ = fStack_4f0 * fVar326;
      auVar64._20_4_ = fStack_4ec * fVar347;
      auVar64._24_4_ = fStack_4e8 * fVar24;
      auVar64._28_4_ = uVar8;
      auVar373._8_4_ = 0x3f800000;
      auVar373._0_8_ = &DAT_3f8000003f800000;
      auVar373._12_4_ = 0x3f800000;
      auVar373._16_4_ = 0x3f800000;
      auVar373._20_4_ = 0x3f800000;
      auVar373._24_4_ = 0x3f800000;
      auVar373._28_4_ = 0x3f800000;
      auVar374 = ZEXT3264(auVar373);
      auVar386 = vsubps_avx(auVar122,auVar64);
      auVar122 = vrcpps_avx(auVar386);
      fVar199 = auVar122._0_4_;
      fVar212 = auVar122._4_4_;
      auVar65._4_4_ = auVar386._4_4_ * fVar212;
      auVar65._0_4_ = auVar386._0_4_ * fVar199;
      fVar213 = auVar122._8_4_;
      auVar65._8_4_ = auVar386._8_4_ * fVar213;
      fVar214 = auVar122._12_4_;
      auVar65._12_4_ = auVar386._12_4_ * fVar214;
      fVar243 = auVar122._16_4_;
      auVar65._16_4_ = auVar386._16_4_ * fVar243;
      fVar260 = auVar122._20_4_;
      auVar65._20_4_ = auVar386._20_4_ * fVar260;
      fVar261 = auVar122._24_4_;
      auVar65._24_4_ = auVar386._24_4_ * fVar261;
      auVar65._28_4_ = local_9e0._28_4_;
      auVar35 = vsubps_avx(auVar373,auVar65);
      auVar273._8_4_ = 0x7fffffff;
      auVar273._0_8_ = 0x7fffffff7fffffff;
      auVar273._12_4_ = 0x7fffffff;
      auVar273._16_4_ = 0x7fffffff;
      auVar273._20_4_ = 0x7fffffff;
      auVar273._24_4_ = 0x7fffffff;
      auVar273._28_4_ = 0x7fffffff;
      auVar122 = vandps_avx(auVar386,auVar273);
      auVar33 = vcmpps_avx(auVar122,auVar400,1);
      auVar66._4_4_ = (fVar212 + fVar212 * auVar35._4_4_) * -auVar160._4_4_;
      auVar66._0_4_ = (fVar199 + fVar199 * auVar35._0_4_) * -auVar160._0_4_;
      auVar66._8_4_ = (fVar213 + fVar213 * auVar35._8_4_) * -auVar160._8_4_;
      auVar66._12_4_ = (fVar214 + fVar214 * auVar35._12_4_) * -auVar160._12_4_;
      auVar66._16_4_ = (fVar243 + fVar243 * auVar35._16_4_) * -auVar160._16_4_;
      auVar66._20_4_ = (fVar260 + fVar260 * auVar35._20_4_) * -auVar160._20_4_;
      auVar66._24_4_ = (fVar261 + fVar261 * auVar35._24_4_) * -auVar160._24_4_;
      auVar66._28_4_ = auVar160._28_4_ ^ 0x80000000;
      auVar122 = vcmpps_avx(auVar386,auVar343,1);
      auVar122 = vorps_avx(auVar33,auVar122);
      auVar122 = vblendvps_avx(auVar66,auVar351,auVar122);
      local_400 = vmaxps_avx(auVar34,auVar122);
      auVar122 = vcmpps_avx(auVar386,ZEXT1232(auVar81) << 0x20,6);
      auVar122 = vorps_avx(auVar33,auVar122);
      auVar122 = vblendvps_avx(auVar66,auVar358,auVar122);
      auVar124 = vandps_avx(auVar124,local_280);
      local_460 = vminps_avx(auVar158,auVar122);
      auVar122 = vcmpps_avx(local_400,local_460,2);
      auVar33 = auVar124 & auVar122;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
        auVar308 = ZEXT864(0) << 0x20;
        auVar259 = ZEXT3264(auVar373);
        auVar276 = ZEXT3264(local_800);
      }
      else {
        auVar33 = vminps_avx(local_7e0,_local_720);
        auVar34 = vminps_avx(local_6e0,local_700);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar33 = vsubps_avx(auVar33,_local_640);
        auVar124 = vandps_avx(auVar122,auVar124);
        auVar96._4_4_ = local_4c0[1];
        auVar96._0_4_ = local_4c0[0];
        auVar96._8_4_ = local_4c0[2];
        auVar96._12_4_ = local_4c0[3];
        auVar96._16_4_ = fStack_4b0;
        auVar96._20_4_ = fStack_4ac;
        auVar96._24_4_ = fStack_4a8;
        auVar96._28_4_ = fStack_4a4;
        auVar122 = vminps_avx(auVar96,auVar373);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_4c0[0] = fVar105 + fVar140 * (auVar122._0_4_ + 0.0) * 0.125;
        local_4c0[1] = fVar131 + fVar174 * (auVar122._4_4_ + 1.0) * 0.125;
        local_4c0[2] = fVar133 + fVar176 * (auVar122._8_4_ + 2.0) * 0.125;
        local_4c0[3] = fVar135 + fVar179 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_4b0 = fVar105 + fVar140 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_4ac = fVar131 + fVar174 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_4a8 = fVar133 + fVar176 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_4a4 = fVar135 + auVar122._28_4_ + 7.0;
        auVar95._4_4_ = local_4e0[1];
        auVar95._0_4_ = local_4e0[0];
        auVar95._8_4_ = local_4e0[2];
        auVar95._12_4_ = local_4e0[3];
        auVar95._16_4_ = fStack_4d0;
        auVar95._20_4_ = fStack_4cc;
        auVar95._24_4_ = fStack_4c8;
        auVar95._28_4_ = fStack_4c4;
        auVar122 = vminps_avx(auVar95,auVar373);
        auVar122 = vmaxps_avx(auVar122,ZEXT832(0) << 0x20);
        local_4e0[0] = fVar105 + fVar140 * (auVar122._0_4_ + 0.0) * 0.125;
        local_4e0[1] = fVar131 + fVar174 * (auVar122._4_4_ + 1.0) * 0.125;
        local_4e0[2] = fVar133 + fVar176 * (auVar122._8_4_ + 2.0) * 0.125;
        local_4e0[3] = fVar135 + fVar179 * (auVar122._12_4_ + 3.0) * 0.125;
        fStack_4d0 = fVar105 + fVar140 * (auVar122._16_4_ + 4.0) * 0.125;
        fStack_4cc = fVar131 + fVar174 * (auVar122._20_4_ + 5.0) * 0.125;
        fStack_4c8 = fVar133 + fVar176 * (auVar122._24_4_ + 6.0) * 0.125;
        fStack_4c4 = fVar135 + auVar122._28_4_ + 7.0;
        auVar67._4_4_ = auVar33._4_4_ * 0.99999976;
        auVar67._0_4_ = auVar33._0_4_ * 0.99999976;
        auVar67._8_4_ = auVar33._8_4_ * 0.99999976;
        auVar67._12_4_ = auVar33._12_4_ * 0.99999976;
        auVar67._16_4_ = auVar33._16_4_ * 0.99999976;
        auVar67._20_4_ = auVar33._20_4_ * 0.99999976;
        auVar67._24_4_ = auVar33._24_4_ * 0.99999976;
        auVar67._28_4_ = 0x3f7ffffc;
        auVar122 = vmaxps_avx(ZEXT1232(auVar81) << 0x20,auVar67);
        auVar68._4_4_ = auVar122._4_4_ * auVar122._4_4_;
        auVar68._0_4_ = auVar122._0_4_ * auVar122._0_4_;
        auVar68._8_4_ = auVar122._8_4_ * auVar122._8_4_;
        auVar68._12_4_ = auVar122._12_4_ * auVar122._12_4_;
        auVar68._16_4_ = auVar122._16_4_ * auVar122._16_4_;
        auVar68._20_4_ = auVar122._20_4_ * auVar122._20_4_;
        auVar68._24_4_ = auVar122._24_4_ * auVar122._24_4_;
        auVar68._28_4_ = auVar122._28_4_;
        auVar33 = vsubps_avx(local_740,auVar68);
        auVar69._4_4_ = auVar33._4_4_ * (float)local_760._4_4_;
        auVar69._0_4_ = auVar33._0_4_ * (float)local_760._0_4_;
        auVar69._8_4_ = auVar33._8_4_ * fStack_758;
        auVar69._12_4_ = auVar33._12_4_ * fStack_754;
        auVar69._16_4_ = auVar33._16_4_ * fStack_750;
        auVar69._20_4_ = auVar33._20_4_ * fStack_74c;
        auVar69._24_4_ = auVar33._24_4_ * fStack_748;
        auVar69._28_4_ = auVar122._28_4_;
        auVar34 = vsubps_avx(local_620,auVar69);
        auVar122 = vcmpps_avx(auVar34,ZEXT832(0) << 0x20,5);
        fVar199 = local_800._28_4_;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar122 >> 0x7f,0) == '\0') &&
              (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar122 >> 0xbf,0) == '\0') &&
            (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar122[0x1f]) {
          auVar160 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_640 = ZEXT832(0) << 0x20;
          _local_680 = ZEXT832(0) << 0x20;
          _local_660 = ZEXT832(0) << 0x20;
          auVar207 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
        }
        else {
          local_940 = auVar33;
          local_8a0 = auVar122;
          _local_860 = auVar124;
          auVar160 = vsqrtps_avx(auVar34);
          auVar209._0_4_ = fVar132 + fVar132;
          auVar209._4_4_ = fVar134 + fVar134;
          auVar209._8_4_ = fVar136 + fVar136;
          auVar209._12_4_ = fVar137 + fVar137;
          auVar209._16_4_ = fVar138 + fVar138;
          auVar209._20_4_ = fVar139 + fVar139;
          auVar209._24_4_ = fVar345 + fVar345;
          auVar209._28_4_ = fVar141 + fVar141;
          auVar158 = vrcpps_avx(auVar209);
          fVar141 = auVar158._0_4_;
          fVar212 = auVar158._4_4_;
          auVar70._4_4_ = auVar209._4_4_ * fVar212;
          auVar70._0_4_ = auVar209._0_4_ * fVar141;
          fVar213 = auVar158._8_4_;
          auVar70._8_4_ = auVar209._8_4_ * fVar213;
          fVar214 = auVar158._12_4_;
          auVar70._12_4_ = auVar209._12_4_ * fVar214;
          fVar243 = auVar158._16_4_;
          auVar70._16_4_ = auVar209._16_4_ * fVar243;
          fVar260 = auVar158._20_4_;
          auVar70._20_4_ = auVar209._20_4_ * fVar260;
          fVar261 = auVar158._24_4_;
          auVar70._24_4_ = auVar209._24_4_ * fVar261;
          auVar70._28_4_ = auVar209._28_4_;
          auVar386 = vsubps_avx(auVar373,auVar70);
          fVar141 = fVar141 + fVar141 * auVar386._0_4_;
          fVar212 = fVar212 + fVar212 * auVar386._4_4_;
          fVar213 = fVar213 + fVar213 * auVar386._8_4_;
          fVar214 = fVar214 + fVar214 * auVar386._12_4_;
          fVar243 = fVar243 + fVar243 * auVar386._16_4_;
          fVar260 = fVar260 + fVar260 * auVar386._20_4_;
          fVar261 = fVar261 + fVar261 * auVar386._24_4_;
          fVar262 = auVar158._28_4_ + auVar386._28_4_;
          auVar253._0_8_ = local_560._0_8_ ^ 0x8000000080000000;
          auVar253._8_4_ = -local_560._8_4_;
          auVar253._12_4_ = -local_560._12_4_;
          auVar253._16_4_ = -local_560._16_4_;
          auVar253._20_4_ = -local_560._20_4_;
          auVar253._24_4_ = -local_560._24_4_;
          auVar253._28_4_ = -local_560._28_4_;
          auVar158 = vsubps_avx(auVar253,auVar160);
          fVar310 = auVar158._0_4_ * fVar141;
          fVar315 = auVar158._4_4_ * fVar212;
          auVar71._4_4_ = fVar315;
          auVar71._0_4_ = fVar310;
          fVar326 = auVar158._8_4_ * fVar213;
          auVar71._8_4_ = fVar326;
          fVar328 = auVar158._12_4_ * fVar214;
          auVar71._12_4_ = fVar328;
          fVar330 = auVar158._16_4_ * fVar243;
          auVar71._16_4_ = fVar330;
          fVar346 = auVar158._20_4_ * fVar260;
          auVar71._20_4_ = fVar346;
          fVar347 = auVar158._24_4_ * fVar261;
          auVar71._24_4_ = fVar347;
          auVar71._28_4_ = 0x80000000;
          auVar160 = vsubps_avx(auVar160,local_560);
          fVar141 = auVar160._0_4_ * fVar141;
          fVar212 = auVar160._4_4_ * fVar212;
          auVar72._4_4_ = fVar212;
          auVar72._0_4_ = fVar141;
          fVar213 = auVar160._8_4_ * fVar213;
          auVar72._8_4_ = fVar213;
          fVar214 = auVar160._12_4_ * fVar214;
          auVar72._12_4_ = fVar214;
          fVar243 = auVar160._16_4_ * fVar243;
          auVar72._16_4_ = fVar243;
          fVar260 = auVar160._20_4_ * fVar260;
          auVar72._20_4_ = fVar260;
          fVar261 = auVar160._24_4_ * fVar261;
          auVar72._24_4_ = fVar261;
          auVar72._28_4_ = 0x3f800000;
          fVar281 = fVar215 * (fVar310 * fVar316 + local_6c0._0_4_);
          fVar284 = fVar263 * (fVar315 * fVar327 + local_6c0._4_4_);
          fVar285 = fVar289 * (fVar326 * fVar329 + local_6c0._8_4_);
          fVar288 = fVar311 * (fVar328 * fVar331 + local_6c0._12_4_);
          fVar297 = fVar332 * (fVar330 * fVar333 + local_6c0._16_4_);
          fVar301 = fVar382 * (fVar346 * fVar335 + local_6c0._20_4_);
          fVar309 = fVar264 * (fVar347 * fVar337 + local_6c0._24_4_);
          auVar161._0_4_ = local_a40 + fVar180 * fVar281;
          auVar161._4_4_ = fStack_a3c + fVar238 * fVar284;
          auVar161._8_4_ = fStack_a38 + fVar280 * fVar285;
          auVar161._12_4_ = fStack_a34 + fVar296 * fVar288;
          auVar161._16_4_ = fStack_a30 + fVar314 * fVar297;
          auVar161._20_4_ = fStack_a2c + fVar338 * fVar301;
          auVar161._24_4_ = fStack_a28 + fVar22 * fVar309;
          auVar161._28_4_ = fStack_a24 + auVar160._28_4_ + local_6c0._28_4_;
          auVar73._4_4_ = fStack_4fc * fVar315;
          auVar73._0_4_ = local_500 * fVar310;
          auVar73._8_4_ = fStack_4f8 * fVar326;
          auVar73._12_4_ = fStack_4f4 * fVar328;
          auVar73._16_4_ = fStack_4f0 * fVar330;
          auVar73._20_4_ = fStack_4ec * fVar346;
          auVar73._24_4_ = fStack_4e8 * fVar347;
          auVar73._28_4_ = fVar262;
          auVar160 = vsubps_avx(auVar73,auVar161);
          _local_880 = auVar160;
          auVar210._0_4_ = local_ac0 + fVar175 * fVar281;
          auVar210._4_4_ = fStack_abc + fVar234 * fVar284;
          auVar210._8_4_ = fStack_ab8 + fVar277 * fVar285;
          auVar210._12_4_ = fStack_ab4 + fVar292 * fVar288;
          auVar210._16_4_ = fStack_ab0 + fVar312 * fVar297;
          auVar210._20_4_ = fStack_aac + fVar334 * fVar301;
          auVar210._24_4_ = fStack_aa8 + fVar20 * fVar309;
          auVar210._28_4_ = fStack_aa4 + fVar262;
          auVar74._4_4_ = fStack_51c * fVar315;
          auVar74._0_4_ = local_520 * fVar310;
          auVar74._8_4_ = fStack_518 * fVar326;
          auVar74._12_4_ = fStack_514 * fVar328;
          auVar74._16_4_ = fStack_510 * fVar330;
          auVar74._20_4_ = fStack_50c * fVar346;
          auVar74._24_4_ = fStack_508 * fVar347;
          auVar74._28_4_ = fVar199;
          local_980 = vsubps_avx(auVar74,auVar210);
          auVar254._0_4_ = local_aa0 + fVar177 * fVar281;
          auVar254._4_4_ = fStack_a9c + fVar236 * fVar284;
          auVar254._8_4_ = fStack_a98 + fVar278 * fVar285;
          auVar254._12_4_ = fStack_a94 + fVar293 * fVar288;
          auVar254._16_4_ = fStack_a90 + fVar313 * fVar297;
          auVar254._20_4_ = fStack_a8c + fVar336 * fVar301;
          auVar254._24_4_ = fStack_a88 + fVar21 * fVar309;
          auVar254._28_4_ = fStack_a84 + auVar158._28_4_;
          auVar75._4_4_ = fStack_5fc * fVar315;
          auVar75._0_4_ = local_600 * fVar310;
          auVar75._8_4_ = fStack_5f8 * fVar326;
          auVar75._12_4_ = fStack_5f4 * fVar328;
          auVar75._16_4_ = fStack_5f0 * fVar330;
          auVar75._20_4_ = fStack_5ec * fVar346;
          auVar75._24_4_ = fStack_5e8 * fVar347;
          auVar75._28_4_ = fVar199;
          local_920 = vsubps_avx(auVar75,auVar254);
          fVar215 = fVar215 * (fVar141 * fVar316 + local_6c0._0_4_);
          fVar263 = fVar263 * (fVar212 * fVar327 + local_6c0._4_4_);
          fVar289 = fVar289 * (fVar213 * fVar329 + local_6c0._8_4_);
          fVar311 = fVar311 * (fVar214 * fVar331 + local_6c0._12_4_);
          fVar332 = fVar332 * (fVar243 * fVar333 + local_6c0._16_4_);
          fVar382 = fVar382 * (fVar260 * fVar335 + local_6c0._20_4_);
          fVar264 = fVar264 * (fVar261 * fVar337 + local_6c0._24_4_);
          auVar274._0_4_ = local_a40 + fVar180 * fVar215;
          auVar274._4_4_ = fStack_a3c + fVar238 * fVar263;
          auVar274._8_4_ = fStack_a38 + fVar280 * fVar289;
          auVar274._12_4_ = fStack_a34 + fVar296 * fVar311;
          auVar274._16_4_ = fStack_a30 + fVar314 * fVar332;
          auVar274._20_4_ = fStack_a2c + fVar338 * fVar382;
          auVar274._24_4_ = fStack_a28 + fVar22 * fVar264;
          auVar274._28_4_ = fStack_a24 + fVar199;
          auVar76._4_4_ = fStack_4fc * fVar212;
          auVar76._0_4_ = local_500 * fVar141;
          auVar76._8_4_ = fStack_4f8 * fVar213;
          auVar76._12_4_ = fStack_4f4 * fVar214;
          auVar76._16_4_ = fStack_4f0 * fVar243;
          auVar76._20_4_ = fStack_4ec * fVar260;
          auVar76._24_4_ = fStack_4e8 * fVar261;
          auVar76._28_4_ = fStack_4e4;
          _local_640 = vsubps_avx(auVar76,auVar274);
          auVar275._0_4_ = local_ac0 + fVar175 * fVar215;
          auVar275._4_4_ = fStack_abc + fVar234 * fVar263;
          auVar275._8_4_ = fStack_ab8 + fVar277 * fVar289;
          auVar275._12_4_ = fStack_ab4 + fVar292 * fVar311;
          auVar275._16_4_ = fStack_ab0 + fVar312 * fVar332;
          auVar275._20_4_ = fStack_aac + fVar334 * fVar382;
          auVar275._24_4_ = fStack_aa8 + fVar20 * fVar264;
          auVar275._28_4_ = fStack_aa4 + local_640._28_4_;
          auVar77._4_4_ = fStack_51c * fVar212;
          auVar77._0_4_ = local_520 * fVar141;
          auVar77._8_4_ = fStack_518 * fVar213;
          auVar77._12_4_ = fStack_514 * fVar214;
          auVar77._16_4_ = fStack_510 * fVar243;
          auVar77._20_4_ = fStack_50c * fVar260;
          auVar77._24_4_ = fStack_508 * fVar261;
          auVar77._28_4_ = fStack_4e4;
          _local_680 = vsubps_avx(auVar77,auVar275);
          auVar255._0_4_ = local_aa0 + fVar177 * fVar215;
          auVar255._4_4_ = fStack_a9c + fVar236 * fVar263;
          auVar255._8_4_ = fStack_a98 + fVar278 * fVar289;
          auVar255._12_4_ = fStack_a94 + fVar293 * fVar311;
          auVar255._16_4_ = fStack_a90 + fVar313 * fVar332;
          auVar255._20_4_ = fStack_a8c + fVar336 * fVar382;
          auVar255._24_4_ = fStack_a88 + fVar21 * fVar264;
          auVar255._28_4_ = fStack_a84 + local_920._28_4_ + local_6c0._28_4_;
          auVar78._4_4_ = fStack_5fc * fVar212;
          auVar78._0_4_ = local_600 * fVar141;
          auVar78._8_4_ = fStack_5f8 * fVar213;
          auVar78._12_4_ = fStack_5f4 * fVar214;
          auVar78._16_4_ = fStack_5f0 * fVar243;
          auVar78._20_4_ = fStack_5ec * fVar260;
          auVar78._24_4_ = fStack_5e8 * fVar261;
          auVar78._28_4_ = local_680._28_4_;
          _local_660 = vsubps_avx(auVar78,auVar255);
          auVar158 = vcmpps_avx(auVar34,_DAT_02020f00,5);
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar231,auVar71,auVar158);
          auVar323._8_4_ = 0x7fffffff;
          auVar323._0_8_ = 0x7fffffff7fffffff;
          auVar323._12_4_ = 0x7fffffff;
          auVar323._16_4_ = 0x7fffffff;
          auVar323._20_4_ = 0x7fffffff;
          auVar323._24_4_ = 0x7fffffff;
          auVar323._28_4_ = 0x7fffffff;
          auVar34 = vandps_avx(auVar323,local_5a0);
          auVar34 = vmaxps_avx(local_3e0,auVar34);
          auVar79._4_4_ = auVar34._4_4_ * 1.9073486e-06;
          auVar79._0_4_ = auVar34._0_4_ * 1.9073486e-06;
          auVar79._8_4_ = auVar34._8_4_ * 1.9073486e-06;
          auVar79._12_4_ = auVar34._12_4_ * 1.9073486e-06;
          auVar79._16_4_ = auVar34._16_4_ * 1.9073486e-06;
          auVar79._20_4_ = auVar34._20_4_ * 1.9073486e-06;
          auVar79._24_4_ = auVar34._24_4_ * 1.9073486e-06;
          auVar79._28_4_ = auVar34._28_4_;
          auVar34 = vandps_avx(auVar323,_local_6a0);
          auVar34 = vcmpps_avx(auVar34,auVar79,1);
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar252 = vblendvps_avx(auVar256,auVar72,auVar158);
          auVar386 = auVar158 & auVar34;
          if ((((((((auVar386 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar386 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar386 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar386 >> 0x7f,0) != '\0') ||
                (auVar386 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar386 >> 0xbf,0) != '\0') ||
              (auVar386 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar386[0x1f] < '\0') {
            auVar122 = vandps_avx(auVar34,auVar158);
            auVar149 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
            auVar386 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar34 = vcmpps_avx(auVar33,auVar386,2);
            auVar402._8_4_ = 0xff800000;
            auVar402._0_8_ = 0xff800000ff800000;
            auVar402._12_4_ = 0xff800000;
            auVar402._16_4_ = 0xff800000;
            auVar402._20_4_ = 0xff800000;
            auVar402._24_4_ = 0xff800000;
            auVar402._28_4_ = 0xff800000;
            auVar404._8_4_ = 0x7f800000;
            auVar404._0_8_ = 0x7f8000007f800000;
            auVar404._12_4_ = 0x7f800000;
            auVar404._16_4_ = 0x7f800000;
            auVar404._20_4_ = 0x7f800000;
            auVar404._24_4_ = 0x7f800000;
            auVar404._28_4_ = 0x7f800000;
            auVar33 = vblendvps_avx(auVar404,auVar402,auVar34);
            auVar112 = vpmovsxwd_avx(auVar149);
            auVar149 = vpunpckhwd_avx(auVar149,auVar149);
            auVar325._16_16_ = auVar149;
            auVar325._0_16_ = auVar112;
            auVar230 = vblendvps_avx(auVar230,auVar33,auVar325);
            auVar33 = vblendvps_avx(auVar402,auVar404,auVar34);
            auVar252 = vblendvps_avx(auVar252,auVar33,auVar325);
            auVar33 = vcmpps_avx(auVar386,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar130._0_4_ = auVar33._0_4_ ^ auVar122._0_4_;
            auVar130._4_4_ = auVar33._4_4_ ^ auVar122._4_4_;
            auVar130._8_4_ = auVar33._8_4_ ^ auVar122._8_4_;
            auVar130._12_4_ = auVar33._12_4_ ^ auVar122._12_4_;
            auVar130._16_4_ = auVar33._16_4_ ^ auVar122._16_4_;
            auVar130._20_4_ = auVar33._20_4_ ^ auVar122._20_4_;
            auVar130._24_4_ = auVar33._24_4_ ^ auVar122._24_4_;
            auVar130._28_4_ = auVar33._28_4_ ^ auVar122._28_4_;
            auVar122 = vorps_avx(auVar34,auVar130);
            auVar122 = vandps_avx(auVar158,auVar122);
          }
          auVar207 = local_980._0_28_;
          auVar344 = ZEXT3264(local_920);
        }
        auVar276 = ZEXT3264(local_800);
        fVar141 = (ray->super_RayK<1>).dir.field_0.m128[0];
        auVar352._4_4_ = fVar141;
        auVar352._0_4_ = fVar141;
        auVar352._8_4_ = fVar141;
        auVar352._12_4_ = fVar141;
        auVar352._16_4_ = fVar141;
        auVar352._20_4_ = fVar141;
        auVar352._24_4_ = fVar141;
        auVar352._28_4_ = fVar141;
        auVar353 = ZEXT3264(auVar352);
        fVar175 = (ray->super_RayK<1>).dir.field_0.m128[1];
        fVar177 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar359._4_4_ = fVar177;
        auVar359._0_4_ = fVar177;
        auVar359._8_4_ = fVar177;
        auVar359._12_4_ = fVar177;
        auVar359._16_4_ = fVar177;
        auVar359._20_4_ = fVar177;
        auVar359._24_4_ = fVar177;
        auVar359._28_4_ = fVar177;
        auVar360 = ZEXT3264(auVar359);
        local_440 = local_400;
        local_420 = vminps_avx(local_460,auVar230);
        _local_480 = vmaxps_avx(local_400,auVar252);
        auVar374 = ZEXT3264(_local_480);
        auVar33 = vcmpps_avx(local_400,local_420,2);
        local_540 = vandps_avx(auVar33,auVar124);
        local_5c0 = local_540;
        auVar33 = vcmpps_avx(_local_480,local_460,2);
        local_5e0 = vandps_avx(auVar33,auVar124);
        auVar124 = vorps_avx(local_5e0,local_540);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar308 = ZEXT864(0) << 0x20;
        }
        else {
          _local_6a0 = _local_480;
          local_6c0 = local_5e0;
          auVar124 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5a0._0_4_ = auVar122._0_4_ ^ auVar124._0_4_;
          local_5a0._4_4_ = auVar122._4_4_ ^ auVar124._4_4_;
          local_5a0._8_4_ = auVar122._8_4_ ^ auVar124._8_4_;
          local_5a0._12_4_ = auVar122._12_4_ ^ auVar124._12_4_;
          local_5a0._16_4_ = auVar122._16_4_ ^ auVar124._16_4_;
          local_5a0._20_4_ = auVar122._20_4_ ^ auVar124._20_4_;
          local_5a0._24_4_ = auVar122._24_4_ ^ auVar124._24_4_;
          local_5a0._28_4_ = (uint)auVar122._28_4_ ^ (uint)auVar124._28_4_;
          auVar374 = ZEXT3264(auVar352);
          auVar123._0_4_ =
               fVar141 * auVar160._0_4_ + fVar175 * auVar207._0_4_ + auVar344._0_4_ * fVar177;
          auVar123._4_4_ =
               fVar141 * auVar160._4_4_ + fVar175 * auVar207._4_4_ + auVar344._4_4_ * fVar177;
          auVar123._8_4_ =
               fVar141 * auVar160._8_4_ + fVar175 * auVar207._8_4_ + auVar344._8_4_ * fVar177;
          auVar123._12_4_ =
               fVar141 * auVar160._12_4_ + fVar175 * auVar207._12_4_ + auVar344._12_4_ * fVar177;
          auVar123._16_4_ =
               fVar141 * auVar160._16_4_ + fVar175 * auVar207._16_4_ + auVar344._16_4_ * fVar177;
          auVar123._20_4_ =
               fVar141 * auVar160._20_4_ + fVar175 * auVar207._20_4_ + auVar344._20_4_ * fVar177;
          auVar123._24_4_ =
               fVar141 * auVar160._24_4_ + fVar175 * auVar207._24_4_ + auVar344._24_4_ * fVar177;
          auVar123._28_4_ = auVar122._28_4_ + auVar160._28_4_ + auVar124._28_4_;
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar162._16_4_ = 0x7fffffff;
          auVar162._20_4_ = 0x7fffffff;
          auVar162._24_4_ = 0x7fffffff;
          auVar162._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar123,auVar162);
          auVar163._8_4_ = 0x3e99999a;
          auVar163._0_8_ = 0x3e99999a3e99999a;
          auVar163._12_4_ = 0x3e99999a;
          auVar163._16_4_ = 0x3e99999a;
          auVar163._20_4_ = 0x3e99999a;
          auVar163._24_4_ = 0x3e99999a;
          auVar163._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar163,1);
          auVar124 = vorps_avx(auVar124,local_5a0);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar195._8_4_ = 2;
          auVar195._0_8_ = 0x200000002;
          auVar195._12_4_ = 2;
          auVar195._16_4_ = 2;
          auVar195._20_4_ = 2;
          auVar195._24_4_ = 2;
          auVar195._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar195,auVar164,auVar124);
          local_580 = ZEXT432((uint)uVar103);
          local_4a0 = vpshufd_avx(ZEXT416((uint)uVar103),0);
          auVar149 = vpcmpgtd_avx(auVar124._16_16_,local_4a0);
          auVar112 = vpcmpgtd_avx(auVar124._0_16_,local_4a0);
          auVar165._16_16_ = auVar149;
          auVar165._0_16_ = auVar112;
          auVar124 = vblendps_avx(ZEXT1632(auVar112),auVar165,0xf0);
          local_5c0 = vandnps_avx(auVar124,local_540);
          auVar259 = ZEXT3264(local_5c0);
          local_560 = auVar124;
          auVar122 = local_540 & ~auVar124;
          auVar233 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar308 = ZEXT464(0) << 0x20;
          local_620._0_8_ = uVar103;
          fVar141 = fVar175;
          fVar177 = fVar175;
          fVar180 = fVar175;
          fVar212 = fVar175;
          fVar213 = fVar175;
          fVar214 = fVar175;
          local_9e0 = auVar36;
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            local_760._4_4_ = local_400._4_4_ + local_800._4_4_;
            local_760._0_4_ = local_400._0_4_ + local_800._0_4_;
            fStack_758 = local_400._8_4_ + local_800._8_4_;
            fStack_754 = local_400._12_4_ + local_800._12_4_;
            fStack_750 = local_400._16_4_ + local_800._16_4_;
            fStack_74c = local_400._20_4_ + local_800._20_4_;
            fStack_748 = local_400._24_4_ + local_800._24_4_;
            fStack_744 = local_400._28_4_ + fVar199;
            local_8c0 = auVar352;
            local_820._4_4_ = fVar175;
            local_820._0_4_ = fVar175;
            fStack_818 = fVar175;
            fStack_814 = fVar175;
            fStack_810 = fVar175;
            fStack_80c = fVar175;
            fStack_808 = fVar175;
            fStack_804 = fVar175;
            local_840 = auVar359;
            do {
              auVar220 = auVar233._0_16_;
              auVar166._8_4_ = 0x7f800000;
              auVar166._0_8_ = 0x7f8000007f800000;
              auVar166._12_4_ = 0x7f800000;
              auVar166._16_4_ = 0x7f800000;
              auVar166._20_4_ = 0x7f800000;
              auVar166._24_4_ = 0x7f800000;
              auVar166._28_4_ = 0x7f800000;
              auVar124 = auVar259._0_32_;
              auVar122 = vblendvps_avx(auVar166,local_400,auVar124);
              auVar33 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar33 = vminps_avx(auVar122,auVar33);
              auVar34 = vshufpd_avx(auVar33,auVar33,5);
              auVar33 = vminps_avx(auVar33,auVar34);
              auVar34 = vperm2f128_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar33,auVar34);
              auVar122 = vcmpps_avx(auVar122,auVar33,0);
              auVar33 = auVar124 & auVar122;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar122,auVar124);
              }
              uVar102 = vmovmskps_avx(auVar124);
              uVar97 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                }
              }
              uVar103 = (ulong)uVar97;
              *(undefined4 *)(local_5c0 + uVar103 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_880 = (undefined1  [16])aVar12;
              auVar149 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_aa0 = local_4c0[uVar103];
              auVar259 = ZEXT464((uint)local_aa0);
              local_ac0 = *(float *)(local_440 + uVar103 * 4);
              auVar276 = ZEXT464((uint)local_ac0);
              if (auVar149._0_4_ < 0.0) {
                fStack_a9c = 0.0;
                fStack_a98 = 0.0;
                fStack_a94 = 0.0;
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fVar141 = sqrtf(auVar149._0_4_);
                auVar276 = ZEXT1664(CONCAT412(fStack_ab4,
                                              CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
                auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                              CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
                auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar220._8_4_ = 0x7fffffff;
                auVar220._0_8_ = 0x7fffffff7fffffff;
                auVar220._12_4_ = 0x7fffffff;
              }
              else {
                auVar149 = vsqrtss_avx(auVar149,auVar149);
                fVar141 = auVar149._0_4_;
              }
              auVar112 = vminps_avx(_local_990,_local_9b0);
              auVar149 = vmaxps_avx(_local_990,_local_9b0);
              auVar146 = vminps_avx(_local_9a0,_local_9c0);
              auVar111 = vminps_avx(auVar112,auVar146);
              auVar112 = vmaxps_avx(_local_9a0,_local_9c0);
              auVar146 = vmaxps_avx(auVar149,auVar112);
              auVar149 = vandps_avx(auVar111,auVar220);
              auVar112 = vandps_avx(auVar146,auVar220);
              auVar149 = vmaxps_avx(auVar149,auVar112);
              auVar112 = vmovshdup_avx(auVar149);
              auVar112 = vmaxss_avx(auVar112,auVar149);
              auVar149 = vshufpd_avx(auVar149,auVar149,1);
              auVar149 = vmaxss_avx(auVar149,auVar112);
              local_980._0_4_ = auVar149._0_4_ * 1.9073486e-06;
              local_7c0._0_4_ = fVar141 * 1.9073486e-06;
              local_740._0_16_ = vshufps_avx(auVar146,auVar146,0xff);
              lVar101 = 4;
              do {
                local_aa0 = auVar259._0_4_;
                fVar212 = 1.0 - local_aa0;
                local_920._0_16_ = ZEXT416((uint)fVar212);
                fVar141 = fVar212 * fVar212;
                fVar175 = fVar212 * fVar141;
                fVar177 = local_aa0 * local_aa0;
                fVar180 = local_aa0 * fVar177;
                fVar199 = local_aa0 * fVar212;
                auVar149 = vshufps_avx(ZEXT416((uint)(fVar180 * 0.16666667)),
                                       ZEXT416((uint)(fVar180 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar180 * 4.0 + fVar175 +
                                          local_aa0 * fVar199 * 12.0 + fVar212 * fVar199 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar146 = ZEXT416((uint)((fVar175 * 4.0 + fVar180 +
                                          fVar212 * fVar199 * 12.0 + local_aa0 * fVar199 * 6.0) *
                                         0.16666667));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar403 = auVar276._0_16_;
                auVar111 = vshufps_avx(auVar403,auVar403,0);
                auVar185._0_4_ = auVar111._0_4_ * (float)local_880._0_4_ + 0.0;
                auVar185._4_4_ = auVar111._4_4_ * (float)local_880._4_4_ + 0.0;
                auVar185._8_4_ = auVar111._8_4_ * fStack_878 + 0.0;
                auVar185._12_4_ = auVar111._12_4_ * fStack_874 + 0.0;
                auVar111 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                       ZEXT416((uint)(fVar175 * 0.16666667)),0);
                auVar110._0_4_ =
                     auVar111._0_4_ * (float)local_990._0_4_ +
                     auVar146._0_4_ * (float)local_9b0._0_4_ +
                     auVar149._0_4_ * (float)local_9c0._0_4_ +
                     auVar112._0_4_ * (float)local_9a0._0_4_;
                auVar110._4_4_ =
                     auVar111._4_4_ * (float)local_990._4_4_ +
                     auVar146._4_4_ * (float)local_9b0._4_4_ +
                     auVar149._4_4_ * (float)local_9c0._4_4_ +
                     auVar112._4_4_ * (float)local_9a0._4_4_;
                auVar110._8_4_ =
                     auVar111._8_4_ * fStack_988 +
                     auVar146._8_4_ * fStack_9a8 +
                     auVar149._8_4_ * fStack_9b8 + auVar112._8_4_ * fStack_998;
                auVar110._12_4_ =
                     auVar111._12_4_ * fStack_984 +
                     auVar146._12_4_ * fStack_9a4 +
                     auVar149._12_4_ * fStack_9b4 + auVar112._12_4_ * fStack_994;
                local_8a0._0_16_ = auVar110;
                auVar149 = vsubps_avx(auVar185,auVar110);
                _local_860 = auVar149;
                auVar149 = vdpps_avx(auVar149,auVar149,0x7f);
                local_a40 = auVar149._0_4_;
                auVar399 = auVar259._0_16_;
                fStack_a9c = auVar259._4_4_;
                fStack_a98 = auVar259._8_4_;
                fStack_a94 = auVar259._12_4_;
                local_ac0 = auVar276._0_4_;
                fStack_abc = auVar276._4_4_;
                fStack_ab8 = auVar276._8_4_;
                fStack_ab4 = auVar276._12_4_;
                fStack_a3c = auVar149._4_4_;
                fStack_a38 = auVar149._8_4_;
                fStack_a34 = auVar149._12_4_;
                local_a60._0_4_ = fVar199;
                if (local_a40 < 0.0) {
                  local_920._0_16_ = ZEXT416((uint)fVar212);
                  local_940._0_4_ = fVar177;
                  local_9e0._0_4_ = fVar141;
                  fVar175 = sqrtf(local_a40);
                  auVar403._4_4_ = fStack_abc;
                  auVar403._0_4_ = local_ac0;
                  auVar403._8_4_ = fStack_ab8;
                  auVar403._12_4_ = fStack_ab4;
                  auVar399._4_4_ = fStack_a9c;
                  auVar399._0_4_ = local_aa0;
                  auVar399._8_4_ = fStack_a98;
                  auVar399._12_4_ = fStack_a94;
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar141 = (float)local_9e0._0_4_;
                  fVar177 = (float)local_940._0_4_;
                }
                else {
                  auVar149 = vsqrtss_avx(auVar149,auVar149);
                  fVar175 = auVar149._0_4_;
                }
                fVar180 = local_920._0_4_;
                fVar199 = auVar399._0_4_;
                auVar149 = vshufps_avx(ZEXT416((uint)(fVar177 * 0.5)),ZEXT416((uint)(fVar177 * 0.5))
                                       ,0);
                auVar112 = ZEXT416((uint)((fVar141 + (float)local_a60._0_4_ * 4.0) * 0.5));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar146 = ZEXT416((uint)((fVar199 * -fVar199 - (float)local_a60._0_4_ * 4.0) * 0.5)
                                  );
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar111 = ZEXT416((uint)(fVar180 * -fVar180 * 0.5));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar341._0_4_ =
                     (float)local_990._0_4_ * auVar111._0_4_ +
                     (float)local_9b0._0_4_ * auVar146._0_4_ +
                     (float)local_9c0._0_4_ * auVar149._0_4_ +
                     (float)local_9a0._0_4_ * auVar112._0_4_;
                auVar341._4_4_ =
                     (float)local_990._4_4_ * auVar111._4_4_ +
                     (float)local_9b0._4_4_ * auVar146._4_4_ +
                     (float)local_9c0._4_4_ * auVar149._4_4_ +
                     (float)local_9a0._4_4_ * auVar112._4_4_;
                auVar341._8_4_ =
                     fStack_988 * auVar111._8_4_ +
                     fStack_9a8 * auVar146._8_4_ +
                     fStack_9b8 * auVar149._8_4_ + fStack_998 * auVar112._8_4_;
                auVar341._12_4_ =
                     fStack_984 * auVar111._12_4_ +
                     fStack_9a4 * auVar146._12_4_ +
                     fStack_9b4 * auVar149._12_4_ + fStack_994 * auVar112._12_4_;
                auVar149 = vshufps_avx(auVar399,auVar399,0);
                auVar112 = ZEXT416((uint)(fVar180 - (fVar199 + fVar199)));
                auVar146 = vshufps_avx(auVar112,auVar112,0);
                auVar112 = ZEXT416((uint)(fVar199 - (fVar180 + fVar180)));
                auVar111 = vshufps_avx(auVar112,auVar112,0);
                auVar117 = vshufps_avx(local_920._0_16_,local_920._0_16_,0);
                auVar112 = vdpps_avx(auVar341,auVar341,0x7f);
                auVar147._0_4_ =
                     (float)local_990._0_4_ * auVar117._0_4_ +
                     (float)local_9b0._0_4_ * auVar111._0_4_ +
                     (float)local_9c0._0_4_ * auVar149._0_4_ +
                     (float)local_9a0._0_4_ * auVar146._0_4_;
                auVar147._4_4_ =
                     (float)local_990._4_4_ * auVar117._4_4_ +
                     (float)local_9b0._4_4_ * auVar111._4_4_ +
                     (float)local_9c0._4_4_ * auVar149._4_4_ +
                     (float)local_9a0._4_4_ * auVar146._4_4_;
                auVar147._8_4_ =
                     fStack_988 * auVar117._8_4_ +
                     fStack_9a8 * auVar111._8_4_ +
                     fStack_9b8 * auVar149._8_4_ + fStack_998 * auVar146._8_4_;
                auVar147._12_4_ =
                     fStack_984 * auVar117._12_4_ +
                     fStack_9a4 * auVar111._12_4_ +
                     fStack_9b4 * auVar149._12_4_ + fStack_994 * auVar146._12_4_;
                auVar149 = vblendps_avx(auVar112,_DAT_01feba10,0xe);
                auVar146 = vrsqrtss_avx(auVar149,auVar149);
                fVar177 = auVar146._0_4_;
                fVar141 = auVar112._0_4_;
                auVar146 = vdpps_avx(auVar341,auVar147,0x7f);
                auVar111 = vshufps_avx(auVar112,auVar112,0);
                auVar148._0_4_ = auVar147._0_4_ * auVar111._0_4_;
                auVar148._4_4_ = auVar147._4_4_ * auVar111._4_4_;
                auVar148._8_4_ = auVar147._8_4_ * auVar111._8_4_;
                auVar148._12_4_ = auVar147._12_4_ * auVar111._12_4_;
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar221._0_4_ = auVar341._0_4_ * auVar146._0_4_;
                auVar221._4_4_ = auVar341._4_4_ * auVar146._4_4_;
                auVar221._8_4_ = auVar341._8_4_ * auVar146._8_4_;
                auVar221._12_4_ = auVar341._12_4_ * auVar146._12_4_;
                auVar111 = vsubps_avx(auVar148,auVar221);
                auVar146 = vrcpss_avx(auVar149,auVar149);
                auVar149 = vmaxss_avx(ZEXT416((uint)local_980._0_4_),
                                      ZEXT416((uint)(auVar403._0_4_ * (float)local_7c0._0_4_)));
                local_a60._0_4_ = auVar149._0_4_;
                auVar149 = ZEXT416((uint)(auVar146._0_4_ * (2.0 - fVar141 * auVar146._0_4_)));
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                uVar103 = CONCAT44(auVar341._4_4_,auVar341._0_4_);
                auVar356._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar356._8_4_ = -auVar341._8_4_;
                auVar356._12_4_ = -auVar341._12_4_;
                auVar146 = ZEXT416((uint)(fVar177 * 1.5 +
                                         fVar141 * -0.5 * fVar177 * fVar177 * fVar177));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar203._0_4_ = auVar146._0_4_ * auVar111._0_4_ * auVar149._0_4_;
                auVar203._4_4_ = auVar146._4_4_ * auVar111._4_4_ * auVar149._4_4_;
                auVar203._8_4_ = auVar146._8_4_ * auVar111._8_4_ * auVar149._8_4_;
                auVar203._12_4_ = auVar146._12_4_ * auVar111._12_4_ * auVar149._12_4_;
                local_960._0_4_ = auVar341._0_4_ * auVar146._0_4_;
                local_960._4_4_ = auVar341._4_4_ * auVar146._4_4_;
                local_960._8_4_ = auVar341._8_4_ * auVar146._8_4_;
                local_960._12_4_ = auVar341._12_4_ * auVar146._12_4_;
                local_920._0_16_ = auVar341;
                if (fVar141 < 0.0) {
                  local_940._0_4_ = fVar175;
                  local_9e0._0_16_ = auVar356;
                  local_7e0._0_16_ = auVar203;
                  fVar141 = sqrtf(fVar141);
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar203 = local_7e0._0_16_;
                  auVar356 = local_9e0._0_16_;
                }
                else {
                  auVar149 = vsqrtss_avx(auVar112,auVar112);
                  fVar141 = auVar149._0_4_;
                  local_940._0_4_ = fVar175;
                }
                auVar320._4_4_ = fStack_a3c;
                auVar320._0_4_ = local_a40;
                auVar320._8_4_ = fStack_a38;
                auVar320._12_4_ = fStack_a34;
                auVar149 = vdpps_avx(_local_860,local_960._0_16_,0x7f);
                local_9e0._0_4_ =
                     ((float)local_980._0_4_ / fVar141) * ((float)local_940._0_4_ + 1.0) +
                     (float)local_940._0_4_ * (float)local_980._0_4_ + (float)local_a60._0_4_;
                auVar112 = vdpps_avx(auVar356,local_960._0_16_,0x7f);
                auVar146 = vdpps_avx(_local_860,auVar203,0x7f);
                auVar111 = vdpps_avx(_local_880,local_960._0_16_,0x7f);
                auVar117 = vdpps_avx(_local_860,auVar356,0x7f);
                fVar141 = auVar112._0_4_ + auVar146._0_4_;
                fVar175 = auVar149._0_4_;
                auVar113._0_4_ = fVar175 * fVar175;
                auVar113._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                auVar113._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                auVar113._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                auVar146 = vsubps_avx(auVar320,auVar113);
                local_960._0_16_ = ZEXT416((uint)fVar141);
                auVar112 = vdpps_avx(_local_860,_local_880,0x7f);
                fVar177 = auVar117._0_4_ - fVar175 * fVar141;
                local_940._0_16_ = auVar149;
                fVar175 = auVar112._0_4_ - fVar175 * auVar111._0_4_;
                auVar149 = vrsqrtss_avx(auVar146,auVar146);
                fVar180 = auVar146._0_4_;
                fVar141 = auVar149._0_4_;
                fVar141 = fVar141 * 1.5 + fVar180 * -0.5 * fVar141 * fVar141 * fVar141;
                if (fVar180 < 0.0) {
                  local_7e0._0_16_ = auVar111;
                  local_6e0._0_4_ = fVar177;
                  local_700._0_4_ = fVar175;
                  local_720._0_4_ = fVar141;
                  fVar180 = sqrtf(fVar180);
                  auVar320._4_4_ = fStack_a3c;
                  auVar320._0_4_ = local_a40;
                  auVar320._8_4_ = fStack_a38;
                  auVar320._12_4_ = fStack_a34;
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar141 = (float)local_720._0_4_;
                  fVar177 = (float)local_6e0._0_4_;
                  fVar175 = (float)local_700._0_4_;
                  auVar111 = local_7e0._0_16_;
                }
                else {
                  auVar149 = vsqrtss_avx(auVar146,auVar146);
                  fVar180 = auVar149._0_4_;
                }
                auVar374 = ZEXT3264(local_8c0);
                auVar360 = ZEXT3264(local_840);
                auVar344 = ZEXT1664(local_920._0_16_);
                auVar112 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar117 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xff);
                fVar177 = fVar177 * fVar141 - auVar117._0_4_;
                auVar222._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar222._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar222._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar246._0_4_ = -fVar177;
                auVar246._4_4_ = 0x80000000;
                auVar246._8_4_ = 0x80000000;
                auVar246._12_4_ = 0x80000000;
                auVar353 = ZEXT1664(local_960._0_16_);
                auVar149 = vinsertps_avx(ZEXT416((uint)(fVar175 * fVar141)),auVar222,0x10);
                auVar146 = vmovsldup_avx(ZEXT416((uint)(local_960._0_4_ * fVar175 * fVar141 -
                                                       auVar111._0_4_ * fVar177)));
                auVar149 = vdivps_avx(auVar149,auVar146);
                auVar111 = ZEXT416((uint)(fVar180 - auVar112._0_4_));
                auVar112 = vinsertps_avx(local_940._0_16_,auVar111,0x10);
                auVar204._0_4_ = auVar112._0_4_ * auVar149._0_4_;
                auVar204._4_4_ = auVar112._4_4_ * auVar149._4_4_;
                auVar204._8_4_ = auVar112._8_4_ * auVar149._8_4_;
                auVar204._12_4_ = auVar112._12_4_ * auVar149._12_4_;
                auVar149 = vinsertps_avx(auVar246,local_960._0_16_,0x1c);
                auVar149 = vdivps_avx(auVar149,auVar146);
                auVar186._0_4_ = auVar112._0_4_ * auVar149._0_4_;
                auVar186._4_4_ = auVar112._4_4_ * auVar149._4_4_;
                auVar186._8_4_ = auVar112._8_4_ * auVar149._8_4_;
                auVar186._12_4_ = auVar112._12_4_ * auVar149._12_4_;
                auVar149 = vhaddps_avx(auVar204,auVar204);
                auVar112 = vhaddps_avx(auVar186,auVar186);
                local_aa0 = local_aa0 - auVar149._0_4_;
                auVar259 = ZEXT464((uint)local_aa0);
                local_ac0 = local_ac0 - auVar112._0_4_;
                auVar276 = ZEXT464((uint)local_ac0);
                auVar223._8_4_ = 0x7fffffff;
                auVar223._0_8_ = 0x7fffffff7fffffff;
                auVar223._12_4_ = 0x7fffffff;
                auVar233 = ZEXT1664(auVar223);
                auVar149 = vandps_avx(local_940._0_16_,auVar223);
                fVar141 = (float)local_820._4_4_;
                fVar177 = fStack_818;
                fVar180 = fStack_814;
                fVar212 = fStack_810;
                fVar213 = fStack_80c;
                fVar214 = fStack_808;
                fVar175 = (float)local_820._0_4_;
                if ((float)local_9e0._0_4_ <= auVar149._0_4_) {
LAB_01007ad4:
                  bVar80 = false;
                }
                else {
                  auVar149 = vandps_avx(auVar111,auVar223);
                  if ((float)local_740._0_4_ * 1.9073486e-06 +
                      (float)local_9e0._0_4_ + (float)local_a60._0_4_ <= auVar149._0_4_)
                  goto LAB_01007ad4;
                  local_ac0 = local_ac0 + (float)local_780._0_4_;
                  auVar276 = ZEXT464((uint)local_ac0);
                  bVar80 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                       (fVar199 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar199)) &&
                      (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                    auVar149 = vrsqrtss_avx(auVar320,auVar320);
                    fVar215 = auVar149._0_4_;
                    pGVar14 = (context->scene->geometries).items[local_ac8].ptr;
                    if ((pGVar14->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar149 = ZEXT416((uint)(fVar215 * 1.5 +
                                               auVar320._0_4_ * -0.5 * fVar215 * fVar215 * fVar215))
                      ;
                      auVar149 = vshufps_avx(auVar149,auVar149,0);
                      auVar150._0_4_ = auVar149._0_4_ * (float)local_860._0_4_;
                      auVar150._4_4_ = auVar149._4_4_ * (float)local_860._4_4_;
                      auVar150._8_4_ = auVar149._8_4_ * fStack_858;
                      auVar150._12_4_ = auVar149._12_4_ * fStack_854;
                      auVar114._0_4_ = local_920._0_4_ + auVar117._0_4_ * auVar150._0_4_;
                      auVar114._4_4_ = local_920._4_4_ + auVar117._4_4_ * auVar150._4_4_;
                      auVar114._8_4_ = local_920._8_4_ + auVar117._8_4_ * auVar150._8_4_;
                      auVar114._12_4_ = local_920._12_4_ + auVar117._12_4_ * auVar150._12_4_;
                      auVar149 = vshufps_avx(auVar150,auVar150,0xc9);
                      auVar112 = vshufps_avx(local_920._0_16_,local_920._0_16_,0xc9);
                      auVar151._0_4_ = auVar112._0_4_ * auVar150._0_4_;
                      auVar151._4_4_ = auVar112._4_4_ * auVar150._4_4_;
                      auVar151._8_4_ = auVar112._8_4_ * auVar150._8_4_;
                      auVar151._12_4_ = auVar112._12_4_ * auVar150._12_4_;
                      auVar187._0_4_ = local_920._0_4_ * auVar149._0_4_;
                      auVar187._4_4_ = local_920._4_4_ * auVar149._4_4_;
                      auVar187._8_4_ = local_920._8_4_ * auVar149._8_4_;
                      auVar187._12_4_ = local_920._12_4_ * auVar149._12_4_;
                      auVar146 = vsubps_avx(auVar187,auVar151);
                      auVar149 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar112 = vshufps_avx(auVar114,auVar114,0xc9);
                      auVar188._0_4_ = auVar112._0_4_ * auVar149._0_4_;
                      auVar188._4_4_ = auVar112._4_4_ * auVar149._4_4_;
                      auVar188._8_4_ = auVar112._8_4_ * auVar149._8_4_;
                      auVar188._12_4_ = auVar112._12_4_ * auVar149._12_4_;
                      auVar149 = vshufps_avx(auVar146,auVar146,0xd2);
                      auVar115._0_4_ = auVar114._0_4_ * auVar149._0_4_;
                      auVar115._4_4_ = auVar114._4_4_ * auVar149._4_4_;
                      auVar115._8_4_ = auVar114._8_4_ * auVar149._8_4_;
                      auVar115._12_4_ = auVar114._12_4_ * auVar149._12_4_;
                      auVar149 = vsubps_avx(auVar188,auVar115);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ac0;
                        auVar112 = vshufps_avx(auVar149,auVar149,0xe9);
                        uVar9 = vmovlps_avx(auVar112);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar149._0_4_;
                        ray->u = local_aa0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a68;
                        ray->geomID = (uint)local_ac8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar112 = vshufps_avx(auVar149,auVar149,0xe9);
                        local_8f0 = vmovlps_avx(auVar112);
                        local_8e8 = auVar149._0_4_;
                        local_8e4 = local_aa0;
                        local_8e0 = 0;
                        local_8dc = (uint)local_a68;
                        local_8d8 = (uint)local_ac8;
                        local_8d4 = context->user->instID[0];
                        local_8d0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ac0;
                        local_acc = -1;
                        local_a10.valid = &local_acc;
                        local_a10.geometryUserPtr = pGVar14->userPtr;
                        local_a10.context = context->user;
                        local_a10.ray = (RTCRayN *)ray;
                        local_a10.hit = (RTCHitN *)&local_8f0;
                        local_a10.N = 1;
                        fStack_a9c = 0.0;
                        fStack_a98 = 0.0;
                        fStack_a94 = 0.0;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        local_a40 = fVar199;
                        if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01007c27:
                          p_Var18 = context->args->filter;
                          fVar175 = (float)local_820._0_4_;
                          fVar141 = (float)local_820._4_4_;
                          fVar177 = fStack_818;
                          fVar180 = fStack_814;
                          fVar212 = fStack_810;
                          fVar213 = fStack_80c;
                          fVar214 = fStack_808;
                          if (p_Var18 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                              auVar344 = ZEXT1664(auVar344._0_16_);
                              auVar353 = ZEXT1664(auVar353._0_16_);
                              (*p_Var18)(&local_a10);
                              auVar276 = ZEXT1664(CONCAT412(fStack_ab4,
                                                            CONCAT48(fStack_ab8,
                                                                     CONCAT44(fStack_abc,local_ac0))
                                                           ));
                              auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                            CONCAT48(fStack_a98,
                                                                     CONCAT44(fStack_a9c,local_aa0))
                                                           ));
                              auVar360 = ZEXT3264(local_840);
                              auVar374 = ZEXT3264(local_8c0);
                              auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar233 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              fVar175 = (float)local_820._0_4_;
                              fVar141 = (float)local_820._4_4_;
                              fVar177 = fStack_818;
                              fVar180 = fStack_814;
                              fVar212 = fStack_810;
                              fVar213 = fStack_80c;
                              fVar214 = fStack_808;
                            }
                            if (*local_a10.valid == 0) goto LAB_01007cf7;
                          }
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a10.hit;
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a10.hit + 4);
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a10.hit + 8);
                          *(float *)((long)local_a10.ray + 0x3c) = *(float *)(local_a10.hit + 0xc);
                          *(float *)((long)local_a10.ray + 0x40) = *(float *)(local_a10.hit + 0x10);
                          *(float *)((long)local_a10.ray + 0x44) = *(float *)(local_a10.hit + 0x14);
                          *(float *)((long)local_a10.ray + 0x48) = *(float *)(local_a10.hit + 0x18);
                          *(float *)((long)local_a10.ray + 0x4c) = *(float *)(local_a10.hit + 0x1c);
                          *(float *)((long)local_a10.ray + 0x50) = *(float *)(local_a10.hit + 0x20);
                        }
                        else {
                          auVar344 = ZEXT1664(local_920._0_16_);
                          auVar353 = ZEXT1664(local_960._0_16_);
                          (*pGVar14->intersectionFilterN)(&local_a10);
                          auVar276 = ZEXT1664(CONCAT412(fStack_ab4,
                                                        CONCAT48(fStack_ab8,
                                                                 CONCAT44(fStack_abc,local_ac0))));
                          auVar259 = ZEXT1664(CONCAT412(fStack_a94,
                                                        CONCAT48(fStack_a98,
                                                                 CONCAT44(fStack_a9c,local_aa0))));
                          auVar360 = ZEXT3264(local_840);
                          auVar374 = ZEXT3264(local_8c0);
                          auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar233 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          fVar175 = (float)local_820._0_4_;
                          fVar141 = (float)local_820._4_4_;
                          fVar177 = fStack_818;
                          fVar180 = fStack_814;
                          fVar212 = fStack_810;
                          fVar213 = fStack_80c;
                          fVar214 = fStack_808;
                          if (*local_a10.valid != 0) goto LAB_01007c27;
LAB_01007cf7:
                          (ray->super_RayK<1>).tfar = local_a40;
                        }
                      }
                    }
                  }
                }
                auVar122 = local_5c0;
                bVar104 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar80) && (bVar104));
              fVar199 = (ray->super_RayK<1>).tfar;
              auVar125._4_4_ = fVar199;
              auVar125._0_4_ = fVar199;
              auVar125._8_4_ = fVar199;
              auVar125._12_4_ = fVar199;
              auVar125._16_4_ = fVar199;
              auVar125._20_4_ = fVar199;
              auVar125._24_4_ = fVar199;
              auVar125._28_4_ = fVar199;
              auVar124 = vcmpps_avx(_local_760,auVar125,2);
              local_5c0 = vandps_avx(auVar124,local_5c0);
              auVar259 = ZEXT3264(local_5c0);
              auVar122 = auVar122 & auVar124;
              auVar276 = ZEXT3264(local_800);
              uVar103 = local_620._0_8_;
            } while ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar122 >> 0x7f,0) != '\0') ||
                       (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar122 >> 0xbf,0) != '\0') ||
                     (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar122[0x1f] < '\0');
          }
          auVar126._0_4_ =
               auVar374._0_4_ * (float)local_640._0_4_ +
               fVar175 * (float)local_680._0_4_ + auVar360._0_4_ * (float)local_660._0_4_;
          auVar126._4_4_ =
               auVar374._4_4_ * (float)local_640._4_4_ +
               fVar141 * (float)local_680._4_4_ + auVar360._4_4_ * (float)local_660._4_4_;
          auVar126._8_4_ =
               auVar374._8_4_ * fStack_638 + fVar177 * fStack_678 + auVar360._8_4_ * fStack_658;
          auVar126._12_4_ =
               auVar374._12_4_ * fStack_634 + fVar180 * fStack_674 + auVar360._12_4_ * fStack_654;
          auVar126._16_4_ =
               auVar374._16_4_ * fStack_630 + fVar212 * fStack_670 + auVar360._16_4_ * fStack_650;
          auVar126._20_4_ =
               auVar374._20_4_ * fStack_62c + fVar213 * fStack_66c + auVar360._20_4_ * fStack_64c;
          auVar126._24_4_ =
               auVar374._24_4_ * fStack_628 + fVar214 * fStack_668 + auVar360._24_4_ * fStack_648;
          auVar126._28_4_ = auVar124._28_4_ + auVar124._28_4_ + auVar259._28_4_;
          auVar167._8_4_ = 0x7fffffff;
          auVar167._0_8_ = 0x7fffffff7fffffff;
          auVar167._12_4_ = 0x7fffffff;
          auVar167._16_4_ = 0x7fffffff;
          auVar167._20_4_ = 0x7fffffff;
          auVar167._24_4_ = 0x7fffffff;
          auVar167._28_4_ = 0x7fffffff;
          auVar124 = vandps_avx(auVar126,auVar167);
          auVar168._8_4_ = 0x3e99999a;
          auVar168._0_8_ = 0x3e99999a3e99999a;
          auVar168._12_4_ = 0x3e99999a;
          auVar168._16_4_ = 0x3e99999a;
          auVar168._20_4_ = 0x3e99999a;
          auVar168._24_4_ = 0x3e99999a;
          auVar168._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar168,1);
          auVar122 = vorps_avx(auVar124,local_5a0);
          auVar169._0_4_ = auVar276._0_4_ + (float)local_6a0._0_4_;
          auVar169._4_4_ = auVar276._4_4_ + (float)local_6a0._4_4_;
          auVar169._8_4_ = auVar276._8_4_ + fStack_698;
          auVar169._12_4_ = auVar276._12_4_ + fStack_694;
          auVar169._16_4_ = auVar276._16_4_ + fStack_690;
          auVar169._20_4_ = auVar276._20_4_ + fStack_68c;
          auVar169._24_4_ = auVar276._24_4_ + fStack_688;
          auVar169._28_4_ = auVar276._28_4_ + fStack_684;
          fVar141 = (ray->super_RayK<1>).tfar;
          auVar196._4_4_ = fVar141;
          auVar196._0_4_ = fVar141;
          auVar196._8_4_ = fVar141;
          auVar196._12_4_ = fVar141;
          auVar196._16_4_ = fVar141;
          auVar196._20_4_ = fVar141;
          auVar196._24_4_ = fVar141;
          auVar196._28_4_ = fVar141;
          auVar124 = vcmpps_avx(auVar169,auVar196,2);
          local_740 = vandps_avx(auVar124,local_6c0);
          auVar170._8_4_ = 3;
          auVar170._0_8_ = 0x300000003;
          auVar170._12_4_ = 3;
          auVar170._16_4_ = 3;
          auVar170._20_4_ = 3;
          auVar170._24_4_ = 3;
          auVar170._28_4_ = 3;
          auVar197._8_4_ = 2;
          auVar197._0_8_ = 0x200000002;
          auVar197._12_4_ = 2;
          auVar197._16_4_ = 2;
          auVar197._20_4_ = 2;
          auVar197._24_4_ = 2;
          auVar197._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar197,auVar170,auVar122);
          auVar149 = vpcmpgtd_avx(auVar124._16_16_,local_4a0);
          auVar112 = vpshufd_avx(local_580._0_16_,0);
          auVar112 = vpcmpgtd_avx(auVar124._0_16_,auVar112);
          auVar171._16_16_ = auVar149;
          auVar171._0_16_ = auVar112;
          _local_760 = vblendps_avx(ZEXT1632(auVar112),auVar171,0xf0);
          local_5e0 = vandnps_avx(_local_760,local_740);
          auVar124 = local_740 & ~_local_760;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            local_700 = _local_480;
            local_720._4_4_ = auVar276._4_4_ + (float)local_480._4_4_;
            local_720._0_4_ = auVar276._0_4_ + (float)local_480._0_4_;
            fStack_718 = auVar276._8_4_ + fStack_478;
            fStack_714 = auVar276._12_4_ + fStack_474;
            fStack_710 = auVar276._16_4_ + fStack_470;
            fStack_70c = auVar276._20_4_ + fStack_46c;
            fStack_708 = auVar276._24_4_ + fStack_468;
            fStack_704 = auVar276._28_4_ + fStack_464;
            do {
              auVar224 = auVar233._0_16_;
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar172,local_700,local_5e0);
              auVar122 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar122 = vminps_avx(auVar124,auVar122);
              auVar33 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar33);
              auVar33 = vperm2f128_avx(auVar122,auVar122,1);
              auVar122 = vminps_avx(auVar122,auVar33);
              auVar122 = vcmpps_avx(auVar124,auVar122,0);
              auVar33 = local_5e0 & auVar122;
              auVar124 = local_5e0;
              if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar33 >> 0x7f,0) != '\0') ||
                    (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar33 >> 0xbf,0) != '\0') ||
                  (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar33[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar122,local_5e0);
              }
              uVar102 = vmovmskps_avx(auVar124);
              uVar97 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
                }
              }
              uVar103 = (ulong)uVar97;
              *(undefined4 *)(local_5e0 + uVar103 * 4) = 0;
              aVar12 = (ray->super_RayK<1>).dir.field_0;
              _local_860 = (undefined1  [16])aVar12;
              auVar149 = vdpps_avx((undefined1  [16])aVar12,(undefined1  [16])aVar12,0x7f);
              local_aa0 = local_4e0[uVar103];
              auVar353 = ZEXT464((uint)local_aa0);
              local_ac0 = *(float *)(local_460 + uVar103 * 4);
              auVar360 = ZEXT464((uint)local_ac0);
              if (auVar149._0_4_ < 0.0) {
                fStack_a9c = 0.0;
                fStack_a98 = 0.0;
                fStack_a94 = 0.0;
                fStack_abc = 0.0;
                fStack_ab8 = 0.0;
                fStack_ab4 = 0.0;
                fVar141 = sqrtf(auVar149._0_4_);
                auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                              CONCAT48(fStack_ab8,CONCAT44(fStack_abc,local_ac0))));
                auVar353 = ZEXT1664(CONCAT412(fStack_a94,
                                              CONCAT48(fStack_a98,CONCAT44(fStack_a9c,local_aa0))));
                auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar224._8_4_ = 0x7fffffff;
                auVar224._0_8_ = 0x7fffffff7fffffff;
                auVar224._12_4_ = 0x7fffffff;
              }
              else {
                auVar149 = vsqrtss_avx(auVar149,auVar149);
                fVar141 = auVar149._0_4_;
              }
              auVar112 = vminps_avx(_local_990,_local_9b0);
              auVar149 = vmaxps_avx(_local_990,_local_9b0);
              auVar146 = vminps_avx(_local_9a0,_local_9c0);
              auVar111 = vminps_avx(auVar112,auVar146);
              auVar112 = vmaxps_avx(_local_9a0,_local_9c0);
              auVar146 = vmaxps_avx(auVar149,auVar112);
              auVar149 = vandps_avx(auVar111,auVar224);
              auVar112 = vandps_avx(auVar146,auVar224);
              auVar149 = vmaxps_avx(auVar149,auVar112);
              auVar112 = vmovshdup_avx(auVar149);
              auVar112 = vmaxss_avx(auVar112,auVar149);
              auVar149 = vshufpd_avx(auVar149,auVar149,1);
              auVar149 = vmaxss_avx(auVar149,auVar112);
              local_880._0_4_ = auVar149._0_4_ * 1.9073486e-06;
              local_940._0_4_ = fVar141 * 1.9073486e-06;
              local_6e0._0_16_ = vshufps_avx(auVar146,auVar146,0xff);
              lVar101 = 4;
              do {
                local_aa0 = auVar353._0_4_;
                fVar212 = 1.0 - local_aa0;
                fVar141 = fVar212 * fVar212;
                fVar175 = fVar212 * fVar141;
                fVar177 = local_aa0 * local_aa0;
                fVar180 = local_aa0 * fVar177;
                fVar199 = local_aa0 * fVar212;
                local_980._0_4_ = fVar199;
                auVar149 = vshufps_avx(ZEXT416((uint)(fVar180 * 0.16666667)),
                                       ZEXT416((uint)(fVar180 * 0.16666667)),0);
                auVar112 = ZEXT416((uint)((fVar180 * 4.0 + fVar175 +
                                          local_aa0 * fVar199 * 12.0 + fVar212 * fVar199 * 6.0) *
                                         0.16666667));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar146 = ZEXT416((uint)((fVar175 * 4.0 + fVar180 +
                                          fVar212 * fVar199 * 12.0 + local_aa0 * fVar199 * 6.0) *
                                         0.16666667));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar357 = auVar360._0_16_;
                auVar111 = vshufps_avx(auVar357,auVar357,0);
                auVar189._0_4_ = auVar111._0_4_ * (float)local_860._0_4_ + 0.0;
                auVar189._4_4_ = auVar111._4_4_ * (float)local_860._4_4_ + 0.0;
                auVar189._8_4_ = auVar111._8_4_ * fStack_858 + 0.0;
                auVar189._12_4_ = auVar111._12_4_ * fStack_854 + 0.0;
                auVar111 = vshufps_avx(ZEXT416((uint)(fVar175 * 0.16666667)),
                                       ZEXT416((uint)(fVar175 * 0.16666667)),0);
                auVar116._0_4_ =
                     auVar111._0_4_ * (float)local_990._0_4_ +
                     auVar146._0_4_ * (float)local_9b0._0_4_ +
                     auVar149._0_4_ * (float)local_9c0._0_4_ +
                     auVar112._0_4_ * (float)local_9a0._0_4_;
                auVar116._4_4_ =
                     auVar111._4_4_ * (float)local_990._4_4_ +
                     auVar146._4_4_ * (float)local_9b0._4_4_ +
                     auVar149._4_4_ * (float)local_9c0._4_4_ +
                     auVar112._4_4_ * (float)local_9a0._4_4_;
                auVar116._8_4_ =
                     auVar111._8_4_ * fStack_988 +
                     auVar146._8_4_ * fStack_9a8 +
                     auVar149._8_4_ * fStack_9b8 + auVar112._8_4_ * fStack_998;
                auVar116._12_4_ =
                     auVar111._12_4_ * fStack_984 +
                     auVar146._12_4_ * fStack_9a4 +
                     auVar149._12_4_ * fStack_9b4 + auVar112._12_4_ * fStack_994;
                local_920._0_16_ = auVar116;
                auVar149 = vsubps_avx(auVar189,auVar116);
                _local_a60 = auVar149;
                auVar149 = vdpps_avx(auVar149,auVar149,0x7f);
                local_a40 = auVar149._0_4_;
                auVar349 = auVar353._0_16_;
                fStack_a9c = auVar353._4_4_;
                fStack_a98 = auVar353._8_4_;
                fStack_a94 = auVar353._12_4_;
                local_ac0 = auVar360._0_4_;
                fStack_abc = auVar360._4_4_;
                fStack_ab8 = auVar360._8_4_;
                fStack_ab4 = auVar360._12_4_;
                fStack_a3c = auVar149._4_4_;
                fStack_a38 = auVar149._8_4_;
                fStack_a34 = auVar149._12_4_;
                if (local_a40 < 0.0) {
                  local_8a0._0_16_ = ZEXT416((uint)fVar212);
                  local_9e0._0_4_ = fVar177;
                  local_960._0_4_ = fVar141;
                  fVar175 = sqrtf(local_a40);
                  auVar357._4_4_ = fStack_abc;
                  auVar357._0_4_ = local_ac0;
                  auVar357._8_4_ = fStack_ab8;
                  auVar357._12_4_ = fStack_ab4;
                  auVar349._4_4_ = fStack_a9c;
                  auVar349._0_4_ = local_aa0;
                  auVar349._8_4_ = fStack_a98;
                  auVar349._12_4_ = fStack_a94;
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar141 = (float)local_960._0_4_;
                  fVar177 = (float)local_9e0._0_4_;
                  auVar149 = local_8a0._0_16_;
                }
                else {
                  auVar149 = vsqrtss_avx(auVar149,auVar149);
                  fVar175 = auVar149._0_4_;
                  auVar149 = ZEXT416((uint)fVar212);
                }
                fVar199 = auVar149._0_4_;
                fVar180 = auVar349._0_4_;
                auVar112 = vshufps_avx(ZEXT416((uint)(fVar177 * 0.5)),ZEXT416((uint)(fVar177 * 0.5))
                                       ,0);
                auVar146 = ZEXT416((uint)((fVar141 + (float)local_980._0_4_ * 4.0) * 0.5));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar111 = ZEXT416((uint)((fVar180 * -fVar180 - (float)local_980._0_4_ * 4.0) * 0.5)
                                  );
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar117 = ZEXT416((uint)(fVar199 * -fVar199 * 0.5));
                auVar117 = vshufps_avx(auVar117,auVar117,0);
                auVar342._0_4_ =
                     (float)local_990._0_4_ * auVar117._0_4_ +
                     (float)local_9b0._0_4_ * auVar111._0_4_ +
                     (float)local_9c0._0_4_ * auVar112._0_4_ +
                     (float)local_9a0._0_4_ * auVar146._0_4_;
                auVar342._4_4_ =
                     (float)local_990._4_4_ * auVar117._4_4_ +
                     (float)local_9b0._4_4_ * auVar111._4_4_ +
                     (float)local_9c0._4_4_ * auVar112._4_4_ +
                     (float)local_9a0._4_4_ * auVar146._4_4_;
                auVar342._8_4_ =
                     fStack_988 * auVar117._8_4_ +
                     fStack_9a8 * auVar111._8_4_ +
                     fStack_9b8 * auVar112._8_4_ + fStack_998 * auVar146._8_4_;
                auVar342._12_4_ =
                     fStack_984 * auVar117._12_4_ +
                     fStack_9a4 * auVar111._12_4_ +
                     fStack_9b4 * auVar112._12_4_ + fStack_994 * auVar146._12_4_;
                auVar146 = vshufps_avx(auVar349,auVar349,0);
                auVar112 = ZEXT416((uint)(fVar199 - (fVar180 + fVar180)));
                auVar111 = vshufps_avx(auVar112,auVar112,0);
                auVar112 = ZEXT416((uint)(fVar180 - (fVar199 + fVar199)));
                auVar117 = vshufps_avx(auVar112,auVar112,0);
                auVar149 = vshufps_avx(auVar149,auVar149,0);
                auVar112 = vdpps_avx(auVar342,auVar342,0x7f);
                auVar152._0_4_ =
                     (float)local_990._0_4_ * auVar149._0_4_ +
                     (float)local_9b0._0_4_ * auVar117._0_4_ +
                     (float)local_9c0._0_4_ * auVar146._0_4_ +
                     (float)local_9a0._0_4_ * auVar111._0_4_;
                auVar152._4_4_ =
                     (float)local_990._4_4_ * auVar149._4_4_ +
                     (float)local_9b0._4_4_ * auVar117._4_4_ +
                     (float)local_9c0._4_4_ * auVar146._4_4_ +
                     (float)local_9a0._4_4_ * auVar111._4_4_;
                auVar152._8_4_ =
                     fStack_988 * auVar149._8_4_ +
                     fStack_9a8 * auVar117._8_4_ +
                     fStack_9b8 * auVar146._8_4_ + fStack_998 * auVar111._8_4_;
                auVar152._12_4_ =
                     fStack_984 * auVar149._12_4_ +
                     fStack_9a4 * auVar117._12_4_ +
                     fStack_9b4 * auVar146._12_4_ + fStack_994 * auVar111._12_4_;
                auVar149 = vblendps_avx(auVar112,_DAT_01feba10,0xe);
                auVar146 = vrsqrtss_avx(auVar149,auVar149);
                fVar177 = auVar146._0_4_;
                fVar141 = auVar112._0_4_;
                auVar146 = vdpps_avx(auVar342,auVar152,0x7f);
                auVar111 = vshufps_avx(auVar112,auVar112,0);
                auVar153._0_4_ = auVar152._0_4_ * auVar111._0_4_;
                auVar153._4_4_ = auVar152._4_4_ * auVar111._4_4_;
                auVar153._8_4_ = auVar152._8_4_ * auVar111._8_4_;
                auVar153._12_4_ = auVar152._12_4_ * auVar111._12_4_;
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                auVar225._0_4_ = auVar342._0_4_ * auVar146._0_4_;
                auVar225._4_4_ = auVar342._4_4_ * auVar146._4_4_;
                auVar225._8_4_ = auVar342._8_4_ * auVar146._8_4_;
                auVar225._12_4_ = auVar342._12_4_ * auVar146._12_4_;
                auVar117 = vsubps_avx(auVar153,auVar225);
                auVar146 = vrcpss_avx(auVar149,auVar149);
                auVar149 = vmaxss_avx(ZEXT416((uint)local_880._0_4_),
                                      ZEXT416((uint)(auVar357._0_4_ * (float)local_940._0_4_)));
                auVar374 = ZEXT1664(auVar149);
                auVar146 = ZEXT416((uint)(auVar146._0_4_ * (2.0 - fVar141 * auVar146._0_4_)));
                auVar146 = vshufps_avx(auVar146,auVar146,0);
                uVar103 = CONCAT44(auVar342._4_4_,auVar342._0_4_);
                auVar247._0_8_ = uVar103 ^ 0x8000000080000000;
                auVar247._8_4_ = -auVar342._8_4_;
                auVar247._12_4_ = -auVar342._12_4_;
                auVar111 = ZEXT416((uint)(fVar177 * 1.5 +
                                         fVar141 * -0.5 * fVar177 * fVar177 * fVar177));
                auVar111 = vshufps_avx(auVar111,auVar111,0);
                auVar205._0_4_ = auVar111._0_4_ * auVar117._0_4_ * auVar146._0_4_;
                auVar205._4_4_ = auVar111._4_4_ * auVar117._4_4_ * auVar146._4_4_;
                auVar205._8_4_ = auVar111._8_4_ * auVar117._8_4_ * auVar146._8_4_;
                auVar205._12_4_ = auVar111._12_4_ * auVar117._12_4_ * auVar146._12_4_;
                auVar269._0_4_ = auVar342._0_4_ * auVar111._0_4_;
                auVar269._4_4_ = auVar342._4_4_ * auVar111._4_4_;
                auVar269._8_4_ = auVar342._8_4_ * auVar111._8_4_;
                auVar269._12_4_ = auVar342._12_4_ * auVar111._12_4_;
                local_980._0_16_ = auVar342;
                local_8a0._0_4_ = auVar149._0_4_;
                if (fVar141 < 0.0) {
                  local_9e0._0_4_ = fVar175;
                  local_960._0_16_ = auVar247;
                  local_7c0._0_16_ = auVar269;
                  local_8c0._0_16_ = auVar205;
                  fVar141 = sqrtf(fVar141);
                  auVar374 = ZEXT464((uint)local_8a0._0_4_);
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar205 = local_8c0._0_16_;
                  auVar247 = local_960._0_16_;
                  auVar269 = local_7c0._0_16_;
                  fVar175 = (float)local_9e0._0_4_;
                }
                else {
                  auVar149 = vsqrtss_avx(auVar112,auVar112);
                  fVar141 = auVar149._0_4_;
                }
                auVar321._4_4_ = fStack_a3c;
                auVar321._0_4_ = local_a40;
                auVar321._8_4_ = fStack_a38;
                auVar321._12_4_ = fStack_a34;
                auVar149 = vdpps_avx(_local_a60,auVar269,0x7f);
                fVar141 = ((float)local_880._0_4_ / fVar141) * (fVar175 + 1.0) +
                          auVar374._0_4_ + fVar175 * (float)local_880._0_4_;
                auVar112 = vdpps_avx(auVar247,auVar269,0x7f);
                auVar146 = vdpps_avx(_local_a60,auVar205,0x7f);
                auVar111 = vdpps_avx(_local_860,auVar269,0x7f);
                auVar117 = vdpps_avx(_local_a60,auVar247,0x7f);
                fVar175 = auVar112._0_4_ + auVar146._0_4_;
                fVar177 = auVar149._0_4_;
                auVar118._0_4_ = fVar177 * fVar177;
                auVar118._4_4_ = auVar149._4_4_ * auVar149._4_4_;
                auVar118._8_4_ = auVar149._8_4_ * auVar149._8_4_;
                auVar118._12_4_ = auVar149._12_4_ * auVar149._12_4_;
                auVar146 = vsubps_avx(auVar321,auVar118);
                auVar112 = vdpps_avx(_local_a60,_local_860,0x7f);
                fVar180 = auVar117._0_4_ - fVar177 * fVar175;
                fVar199 = auVar112._0_4_ - fVar177 * auVar111._0_4_;
                auVar112 = vrsqrtss_avx(auVar146,auVar146);
                fVar212 = auVar146._0_4_;
                fVar177 = auVar112._0_4_;
                fVar177 = fVar177 * 1.5 + fVar212 * -0.5 * fVar177 * fVar177 * fVar177;
                if (fVar212 < 0.0) {
                  local_9e0._0_16_ = auVar149;
                  local_960._0_4_ = fVar141;
                  local_7c0._0_16_ = ZEXT416((uint)fVar175);
                  local_8c0._0_16_ = auVar111;
                  local_820._0_4_ = fVar180;
                  local_840._0_4_ = fVar199;
                  local_7e0._0_4_ = fVar177;
                  fVar212 = sqrtf(fVar212);
                  auVar374 = ZEXT464((uint)local_8a0._0_4_);
                  auVar321._4_4_ = fStack_a3c;
                  auVar321._0_4_ = local_a40;
                  auVar321._8_4_ = fStack_a38;
                  auVar321._12_4_ = fStack_a34;
                  auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar177 = (float)local_7e0._0_4_;
                  fVar180 = (float)local_820._0_4_;
                  fVar199 = (float)local_840._0_4_;
                  auVar111 = local_8c0._0_16_;
                  fVar141 = (float)local_960._0_4_;
                  auVar149 = local_9e0._0_16_;
                  auVar112 = local_7c0._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar146,auVar146);
                  fVar212 = auVar112._0_4_;
                  auVar112 = ZEXT416((uint)fVar175);
                }
                auVar344 = ZEXT1664(local_980._0_16_);
                auVar154 = vpermilps_avx(local_920._0_16_,0xff);
                auVar27 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
                fVar175 = fVar180 * fVar177 - auVar27._0_4_;
                auVar226._0_8_ = auVar111._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = auVar111._8_4_ ^ 0x80000000;
                auVar226._12_4_ = auVar111._12_4_ ^ 0x80000000;
                auVar248._0_4_ = -fVar175;
                auVar248._4_4_ = 0x80000000;
                auVar248._8_4_ = 0x80000000;
                auVar248._12_4_ = 0x80000000;
                auVar146 = vinsertps_avx(ZEXT416((uint)(fVar199 * fVar177)),auVar226,0x10);
                auVar117 = vmovsldup_avx(ZEXT416((uint)(auVar112._0_4_ * fVar199 * fVar177 -
                                                       auVar111._0_4_ * fVar175)));
                auVar146 = vdivps_avx(auVar146,auVar117);
                auVar154 = ZEXT416((uint)(fVar212 - auVar154._0_4_));
                auVar111 = vinsertps_avx(auVar149,auVar154,0x10);
                auVar206._0_4_ = auVar111._0_4_ * auVar146._0_4_;
                auVar206._4_4_ = auVar111._4_4_ * auVar146._4_4_;
                auVar206._8_4_ = auVar111._8_4_ * auVar146._8_4_;
                auVar206._12_4_ = auVar111._12_4_ * auVar146._12_4_;
                auVar112 = vinsertps_avx(auVar248,auVar112,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar117);
                auVar190._0_4_ = auVar111._0_4_ * auVar112._0_4_;
                auVar190._4_4_ = auVar111._4_4_ * auVar112._4_4_;
                auVar190._8_4_ = auVar111._8_4_ * auVar112._8_4_;
                auVar190._12_4_ = auVar111._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar206,auVar206);
                auVar146 = vhaddps_avx(auVar190,auVar190);
                local_aa0 = local_aa0 - auVar112._0_4_;
                auVar353 = ZEXT464((uint)local_aa0);
                local_ac0 = local_ac0 - auVar146._0_4_;
                auVar360 = ZEXT464((uint)local_ac0);
                auVar227._8_4_ = 0x7fffffff;
                auVar227._0_8_ = 0x7fffffff7fffffff;
                auVar227._12_4_ = 0x7fffffff;
                auVar233 = ZEXT1664(auVar227);
                auVar149 = vandps_avx(auVar149,auVar227);
                if (fVar141 <= auVar149._0_4_) {
LAB_01008653:
                  bVar80 = false;
                }
                else {
                  auVar149 = vandps_avx(auVar154,auVar227);
                  if ((float)local_6e0._0_4_ * 1.9073486e-06 + auVar374._0_4_ + fVar141 <=
                      auVar149._0_4_) goto LAB_01008653;
                  local_ac0 = local_ac0 + (float)local_780._0_4_;
                  auVar360 = ZEXT464((uint)local_ac0);
                  bVar80 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= local_ac0) &&
                       (fVar141 = (ray->super_RayK<1>).tfar, local_ac0 <= fVar141)) &&
                      (0.0 <= local_aa0)) && (local_aa0 <= 1.0)) {
                    auVar149 = vrsqrtss_avx(auVar321,auVar321);
                    fVar175 = auVar149._0_4_;
                    pGVar14 = (context->scene->geometries).items[local_ac8].ptr;
                    if ((pGVar14->mask & (ray->super_RayK<1>).mask) != 0) {
                      auVar149 = ZEXT416((uint)(fVar175 * 1.5 +
                                               auVar321._0_4_ * -0.5 * fVar175 * fVar175 * fVar175))
                      ;
                      auVar149 = vshufps_avx(auVar149,auVar149,0);
                      auVar155._0_4_ = auVar149._0_4_ * (float)local_a60._0_4_;
                      auVar155._4_4_ = auVar149._4_4_ * (float)local_a60._4_4_;
                      auVar155._8_4_ = auVar149._8_4_ * fStack_a58;
                      auVar155._12_4_ = auVar149._12_4_ * fStack_a54;
                      auVar119._0_4_ = local_980._0_4_ + auVar27._0_4_ * auVar155._0_4_;
                      auVar119._4_4_ = local_980._4_4_ + auVar27._4_4_ * auVar155._4_4_;
                      auVar119._8_4_ = local_980._8_4_ + auVar27._8_4_ * auVar155._8_4_;
                      auVar119._12_4_ = local_980._12_4_ + auVar27._12_4_ * auVar155._12_4_;
                      auVar149 = vshufps_avx(auVar155,auVar155,0xc9);
                      auVar112 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                      auVar156._0_4_ = auVar112._0_4_ * auVar155._0_4_;
                      auVar156._4_4_ = auVar112._4_4_ * auVar155._4_4_;
                      auVar156._8_4_ = auVar112._8_4_ * auVar155._8_4_;
                      auVar156._12_4_ = auVar112._12_4_ * auVar155._12_4_;
                      auVar191._0_4_ = local_980._0_4_ * auVar149._0_4_;
                      auVar191._4_4_ = local_980._4_4_ * auVar149._4_4_;
                      auVar191._8_4_ = local_980._8_4_ * auVar149._8_4_;
                      auVar191._12_4_ = local_980._12_4_ * auVar149._12_4_;
                      auVar146 = vsubps_avx(auVar191,auVar156);
                      auVar149 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar112 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar192._0_4_ = auVar112._0_4_ * auVar149._0_4_;
                      auVar192._4_4_ = auVar112._4_4_ * auVar149._4_4_;
                      auVar192._8_4_ = auVar112._8_4_ * auVar149._8_4_;
                      auVar192._12_4_ = auVar112._12_4_ * auVar149._12_4_;
                      auVar149 = vshufps_avx(auVar146,auVar146,0xd2);
                      auVar120._0_4_ = auVar119._0_4_ * auVar149._0_4_;
                      auVar120._4_4_ = auVar119._4_4_ * auVar149._4_4_;
                      auVar120._8_4_ = auVar119._8_4_ * auVar149._8_4_;
                      auVar120._12_4_ = auVar119._12_4_ * auVar149._12_4_;
                      auVar149 = vsubps_avx(auVar192,auVar120);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = local_ac0;
                        auVar112 = vshufps_avx(auVar149,auVar149,0xe9);
                        uVar9 = vmovlps_avx(auVar112);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                        (ray->Ng).field_0.field_0.z = auVar149._0_4_;
                        ray->u = local_aa0;
                        ray->v = 0.0;
                        ray->primID = (uint)local_a68;
                        ray->geomID = (uint)local_ac8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar112 = vshufps_avx(auVar149,auVar149,0xe9);
                        local_8f0 = vmovlps_avx(auVar112);
                        local_8e8 = auVar149._0_4_;
                        local_8e4 = local_aa0;
                        local_8e0 = 0;
                        local_8dc = (uint)local_a68;
                        local_8d8 = (uint)local_ac8;
                        local_8d4 = context->user->instID[0];
                        local_8d0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = local_ac0;
                        local_acc = -1;
                        local_a10.valid = &local_acc;
                        local_a10.geometryUserPtr = pGVar14->userPtr;
                        local_a10.context = context->user;
                        local_a10.ray = (RTCRayN *)ray;
                        local_a10.hit = (RTCHitN *)&local_8f0;
                        local_a10.N = 1;
                        fStack_a9c = 0.0;
                        fStack_a98 = 0.0;
                        fStack_a94 = 0.0;
                        fStack_abc = 0.0;
                        fStack_ab8 = 0.0;
                        fStack_ab4 = 0.0;
                        local_a40 = fVar141;
                        if (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0100878b:
                          p_Var18 = context->args->filter;
                          if (p_Var18 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                              auVar344 = ZEXT1664(auVar344._0_16_);
                              auVar374 = ZEXT1664(auVar374._0_16_);
                              (*p_Var18)(&local_a10);
                              auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                                            CONCAT48(fStack_ab8,
                                                                     CONCAT44(fStack_abc,local_ac0))
                                                           ));
                              auVar353 = ZEXT1664(CONCAT412(fStack_a94,
                                                            CONCAT48(fStack_a98,
                                                                     CONCAT44(fStack_a9c,local_aa0))
                                                           ));
                              auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar233 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                            }
                            if (*local_a10.valid == 0) goto LAB_01008840;
                          }
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a10.hit;
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a10.hit + 4);
                          (((Vec3f *)((long)local_a10.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a10.hit + 8);
                          *(float *)((long)local_a10.ray + 0x3c) = *(float *)(local_a10.hit + 0xc);
                          *(float *)((long)local_a10.ray + 0x40) = *(float *)(local_a10.hit + 0x10);
                          *(float *)((long)local_a10.ray + 0x44) = *(float *)(local_a10.hit + 0x14);
                          *(float *)((long)local_a10.ray + 0x48) = *(float *)(local_a10.hit + 0x18);
                          *(float *)((long)local_a10.ray + 0x4c) = *(float *)(local_a10.hit + 0x1c);
                          *(float *)((long)local_a10.ray + 0x50) = *(float *)(local_a10.hit + 0x20);
                        }
                        else {
                          auVar344 = ZEXT1664(local_980._0_16_);
                          auVar374 = ZEXT1664(auVar374._0_16_);
                          (*pGVar14->intersectionFilterN)(&local_a10);
                          auVar360 = ZEXT1664(CONCAT412(fStack_ab4,
                                                        CONCAT48(fStack_ab8,
                                                                 CONCAT44(fStack_abc,local_ac0))));
                          auVar353 = ZEXT1664(CONCAT412(fStack_a94,
                                                        CONCAT48(fStack_a98,
                                                                 CONCAT44(fStack_a9c,local_aa0))));
                          auVar308 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar233 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if (*local_a10.valid != 0) goto LAB_0100878b;
LAB_01008840:
                          (ray->super_RayK<1>).tfar = local_a40;
                        }
                      }
                    }
                  }
                }
                auVar124 = local_5e0;
                bVar104 = lVar101 != 0;
                lVar101 = lVar101 + -1;
              } while ((!bVar80) && (bVar104));
              fVar141 = (ray->super_RayK<1>).tfar;
              auVar127._4_4_ = fVar141;
              auVar127._0_4_ = fVar141;
              auVar127._8_4_ = fVar141;
              auVar127._12_4_ = fVar141;
              auVar127._16_4_ = fVar141;
              auVar127._20_4_ = fVar141;
              auVar127._24_4_ = fVar141;
              auVar127._28_4_ = fVar141;
              auVar122 = vcmpps_avx(_local_720,auVar127,2);
              local_5e0 = vandps_avx(auVar122,local_5e0);
              auVar124 = auVar124 & auVar122;
              auVar276 = ZEXT3264(local_800);
              uVar103 = local_620._0_8_;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar124 = vandps_avx(local_560,local_540);
          auVar122 = vandps_avx(_local_760,local_740);
          auVar198._0_4_ = auVar276._0_4_ + local_440._0_4_;
          auVar198._4_4_ = auVar276._4_4_ + local_440._4_4_;
          auVar198._8_4_ = auVar276._8_4_ + local_440._8_4_;
          auVar198._12_4_ = auVar276._12_4_ + local_440._12_4_;
          auVar198._16_4_ = auVar276._16_4_ + local_440._16_4_;
          auVar198._20_4_ = auVar276._20_4_ + local_440._20_4_;
          auVar198._24_4_ = auVar276._24_4_ + local_440._24_4_;
          auVar198._28_4_ = auVar276._28_4_ + local_440._28_4_;
          fVar141 = (ray->super_RayK<1>).tfar;
          auVar232._4_4_ = fVar141;
          auVar232._0_4_ = fVar141;
          auVar232._8_4_ = fVar141;
          auVar232._12_4_ = fVar141;
          auVar232._16_4_ = fVar141;
          auVar232._20_4_ = fVar141;
          auVar232._24_4_ = fVar141;
          auVar232._28_4_ = fVar141;
          auVar33 = vcmpps_avx(auVar198,auVar232,2);
          auVar124 = vandps_avx(auVar33,auVar124);
          auVar257._0_4_ = auVar276._0_4_ + local_480._0_4_;
          auVar257._4_4_ = auVar276._4_4_ + local_480._4_4_;
          auVar257._8_4_ = auVar276._8_4_ + local_480._8_4_;
          auVar257._12_4_ = auVar276._12_4_ + local_480._12_4_;
          auVar257._16_4_ = auVar276._16_4_ + local_480._16_4_;
          auVar257._20_4_ = auVar276._20_4_ + local_480._20_4_;
          auVar257._24_4_ = auVar276._24_4_ + local_480._24_4_;
          auVar257._28_4_ = auVar276._28_4_ + local_480._28_4_;
          auVar33 = vcmpps_avx(auVar257,auVar232,2);
          auVar122 = vandps_avx(auVar33,auVar122);
          auVar122 = vorps_avx(auVar124,auVar122);
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar122;
            auVar124 = vblendvps_avx(_local_480,local_440,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar124;
            auVar94._8_8_ = uStack_788;
            auVar94._0_8_ = local_790;
            uVar9 = vmovlps_avx(auVar94);
            *(undefined8 *)(afStack_140 + uVar98 * 0x18) = uVar9;
            auStack_138[uVar98 * 0x18] = (int)uVar103 + 1;
            uVar98 = (ulong)((int)uVar98 + 1);
          }
        }
        auVar259 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    fVar141 = (ray->super_RayK<1>).tfar;
    auVar128._4_4_ = fVar141;
    auVar128._0_4_ = fVar141;
    auVar128._8_4_ = fVar141;
    auVar128._12_4_ = fVar141;
    auVar128._16_4_ = fVar141;
    auVar128._20_4_ = fVar141;
    auVar128._24_4_ = fVar141;
    auVar128._28_4_ = fVar141;
    do {
      if ((int)uVar98 == 0) {
        fVar141 = (ray->super_RayK<1>).tfar;
        auVar121._4_4_ = fVar141;
        auVar121._0_4_ = fVar141;
        auVar121._8_4_ = fVar141;
        auVar121._12_4_ = fVar141;
        auVar149 = vcmpps_avx(local_490,auVar121,2);
        uVar97 = vmovmskps_avx(auVar149);
        uVar97 = (uint)local_768 - 1 & (uint)local_768 & uVar97;
        if (uVar97 == 0) {
          return;
        }
        goto LAB_01006026;
      }
      uVar99 = (ulong)((int)uVar98 - 1);
      lVar101 = uVar99 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar101);
      auVar173._0_4_ = auVar276._0_4_ + auVar124._0_4_;
      auVar173._4_4_ = auVar276._4_4_ + auVar124._4_4_;
      auVar173._8_4_ = auVar276._8_4_ + auVar124._8_4_;
      auVar173._12_4_ = auVar276._12_4_ + auVar124._12_4_;
      auVar173._16_4_ = auVar276._16_4_ + auVar124._16_4_;
      auVar173._20_4_ = auVar276._20_4_ + auVar124._20_4_;
      auVar173._24_4_ = auVar276._24_4_ + auVar124._24_4_;
      auVar173._28_4_ = auVar276._28_4_ + auVar124._28_4_;
      auVar33 = vcmpps_avx(auVar173,auVar128,2);
      auVar122 = vandps_avx(auVar33,*(undefined1 (*) [32])(auStack_180 + lVar101));
      local_440 = auVar122;
      auVar33 = *(undefined1 (*) [32])(auStack_180 + lVar101) & auVar33;
      bVar86 = (auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar87 = (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar85 = (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar84 = SUB321(auVar33 >> 0x7f,0) == '\0';
      bVar83 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar82 = SUB321(auVar33 >> 0xbf,0) == '\0';
      bVar104 = (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar80 = -1 < auVar33[0x1f];
      if (((((((!bVar86 || !bVar87) || !bVar85) || !bVar84) || !bVar83) || !bVar82) || !bVar104) ||
          !bVar80) {
        auVar211._8_4_ = 0x7f800000;
        auVar211._0_8_ = 0x7f8000007f800000;
        auVar211._12_4_ = 0x7f800000;
        auVar211._16_4_ = 0x7f800000;
        auVar211._20_4_ = 0x7f800000;
        auVar211._24_4_ = 0x7f800000;
        auVar211._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar211,auVar124,auVar122);
        auVar33 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar33 = vminps_avx(auVar124,auVar33);
        auVar34 = vshufpd_avx(auVar33,auVar33,5);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar34 = vperm2f128_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar33,auVar34);
        auVar124 = vcmpps_avx(auVar124,auVar33,0);
        auVar33 = auVar122 & auVar124;
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0x7f,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0xbf,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar33[0x1f] < '\0') {
          auVar122 = vandps_avx(auVar124,auVar122);
        }
        fVar141 = afStack_140[uVar99 * 0x18 + 1];
        uVar103 = (ulong)auStack_138[uVar99 * 0x18];
        uVar102 = vmovmskps_avx(auVar122);
        uVar97 = 0;
        if (uVar102 != 0) {
          for (; (uVar102 >> uVar97 & 1) == 0; uVar97 = uVar97 + 1) {
          }
        }
        fVar175 = afStack_140[uVar99 * 0x18];
        *(undefined4 *)(local_440 + (ulong)uVar97 * 4) = 0;
        if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_440 >> 0x7f,0) != '\0') ||
              (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_440 >> 0xbf,0) != '\0') ||
            (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_440[0x1f] < '\0') {
          uVar99 = uVar98;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar101) = local_440;
        auVar149 = vshufps_avx(ZEXT416((uint)(fVar141 - fVar175)),ZEXT416((uint)(fVar141 - fVar175))
                               ,0);
        local_480._4_4_ = fVar175 + auVar149._4_4_ * 0.14285715;
        local_480._0_4_ = fVar175 + auVar149._0_4_ * 0.0;
        fStack_478 = fVar175 + auVar149._8_4_ * 0.2857143;
        fStack_474 = fVar175 + auVar149._12_4_ * 0.42857146;
        fStack_470 = fVar175 + auVar149._0_4_ * 0.5714286;
        fStack_46c = fVar175 + auVar149._4_4_ * 0.71428573;
        fStack_468 = fVar175 + auVar149._8_4_ * 0.8571429;
        fStack_464 = fVar175 + auVar149._12_4_;
        local_790 = *(undefined8 *)(local_480 + (ulong)uVar97 * 4);
        uStack_788 = 0;
      }
      uVar98 = uVar99;
    } while (((((((bVar86 && bVar87) && bVar85) && bVar84) && bVar83) && bVar82) && bVar104) &&
             bVar80);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }